

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

void ggml_compute_forward(ggml_compute_params *params,ggml_tensor *tensor)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  ggml_type gVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  ggml_tensor *pgVar7;
  ggml_tensor *pgVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  int *piVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  size_t sVar38;
  size_t sVar39;
  size_t sVar40;
  int i_2;
  uint uVar41;
  int iVar42;
  uint uVar43;
  int iVar44;
  int iVar45;
  long lVar46;
  long lVar47;
  undefined4 *puVar48;
  void *pvVar49;
  int k;
  int iVar50;
  int iVar51;
  int iVar52;
  uint uVar53;
  uint uVar54;
  int iVar55;
  ulong uVar56;
  long lVar57;
  ulong uVar58;
  undefined1 (*pauVar59) [32];
  int j_3;
  uint uVar60;
  undefined2 *puVar61;
  long lVar62;
  long lVar63;
  void *pvVar64;
  size_t __n;
  undefined1 *puVar65;
  void *pvVar66;
  int ik1;
  ulong uVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  long lVar71;
  size_t *tensor_00;
  int j;
  int iVar72;
  undefined4 *puVar73;
  ulong uVar74;
  int np_4;
  uint uVar75;
  int iVar76;
  undefined2 *puVar77;
  void *pvVar78;
  void *pvVar79;
  int i00;
  uint uVar80;
  ulong uVar81;
  int iVar82;
  int iVar83;
  uint uVar84;
  long lVar85;
  int np_2;
  uint uVar86;
  long lVar87;
  float *pfVar88;
  undefined1 (*pauVar89) [32];
  int k_1;
  uint uVar90;
  ulong unaff_R13;
  long lVar91;
  uint *puVar92;
  int np;
  undefined4 uVar93;
  int iVar94;
  long lVar95;
  long lVar96;
  void *pvVar97;
  long lVar98;
  long lVar99;
  ulong uVar100;
  bool bVar101;
  float fVar102;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined8 in_XMM0_Qa;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar114 [32];
  undefined1 auVar106 [16];
  double dVar103;
  undefined1 auVar107 [16];
  undefined1 auVar115 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 extraout_var [56];
  undefined1 auVar118 [64];
  undefined1 extraout_var_00 [56];
  double dVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar124 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar125 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  undefined1 auVar139 [32];
  undefined1 auVar126 [16];
  undefined1 auVar144 [64];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar151 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar152 [16];
  undefined1 auVar164 [32];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar169 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar187 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar209 [16];
  undefined1 auVar208 [16];
  undefined1 auVar212 [64];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar213 [64];
  float fVar214;
  undefined1 auVar215 [32];
  undefined1 auVar216 [12];
  undefined1 in_ZMM9 [64];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar222 [32];
  undefined1 in_ZMM11 [64];
  undefined1 auVar223 [64];
  undefined1 auVar219 [32];
  undefined1 auVar224 [64];
  undefined8 uVar226;
  undefined1 in_ZMM12 [64];
  undefined1 auVar225 [64];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  int i1_2;
  int ik3;
  int i1_1;
  int i2;
  int ik2;
  int i3_1;
  int i3_2;
  int i3;
  int i2_2;
  ggml_float sumf [2];
  ggml_fp16_t *x [2];
  int local_390;
  ulong local_388;
  long local_380;
  long local_378;
  long local_370;
  long local_368;
  ulong local_360;
  ulong local_358;
  long local_350;
  ulong local_348;
  long local_340;
  long local_338;
  ulong local_330;
  int local_328;
  int local_320;
  ulong local_318;
  long local_310;
  long local_308;
  ulong local_300;
  ulong local_2f8;
  int local_2f0;
  long local_2e8;
  int local_2e0;
  ulong local_2b8;
  ulong local_2b0;
  ulong local_2a8;
  ulong local_2a0;
  long local_298;
  long local_290;
  undefined1 local_280 [32];
  int local_260;
  undefined1 local_240 [64];
  undefined1 local_200 [4];
  float afStack_1fc [7];
  undefined1 local_1e0 [8];
  float afStack_1d8 [6];
  undefined1 local_1c0 [4];
  float afStack_1bc [7];
  undefined1 local_1a0 [32];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined1 local_100 [16];
  long local_f0;
  ulong local_e8;
  undefined1 local_e0 [16];
  long local_d0;
  long local_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [32];
  
  auVar130 = in_ZMM4._0_32_;
  auVar197 = in_ZMM6._0_32_;
  auVar131 = in_ZMM9._0_32_;
  auVar207 = in_ZMM7._0_32_;
  uVar226 = in_ZMM12._8_8_;
  if (params == (ggml_compute_params *)0x0) {
LAB_0012f123:
    ggml_compute_forward_cold_156();
    tensor_00 = (size_t *)params;
    goto LAB_0012f128;
  }
  tensor_00 = (size_t *)params;
  switch(tensor->op) {
  case GGML_OP_DUP:
  case GGML_OP_CPY:
    ggml_compute_forward_dup(params,tensor->src0,tensor);
    break;
  case GGML_OP_ADD:
    goto switchD_001270fa_caseD_2;
  case GGML_OP_SUB:
    goto switchD_001270fa_caseD_3;
  case GGML_OP_MUL:
    goto switchD_001270fa_caseD_4;
  case GGML_OP_DIV:
    pgVar7 = tensor->src0;
    gVar4 = pgVar7->type;
    if (gVar4 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
        return;
      }
      uVar41 = pgVar7->ne[2] * pgVar7->ne[1] * pgVar7->ne[3];
      if ((int)uVar41 < 1) {
        return;
      }
      uVar43 = pgVar7->ne[0];
      sVar12 = tensor->nb[1];
      pvVar64 = tensor->data;
      pvVar79 = pgVar7->data;
      sVar13 = pgVar7->nb[1];
      sVar14 = tensor->src1->nb[1];
      pvVar78 = tensor->src1->data;
      uVar100 = 0;
      do {
        if (0 < (int)uVar43) {
          uVar67 = 0;
          do {
            *(float *)((long)pvVar64 + uVar67 * 4) =
                 *(float *)((long)pvVar79 + uVar67 * 4) / *(float *)((long)pvVar78 + uVar67 * 4);
            uVar67 = uVar67 + 1;
          } while (uVar43 != uVar67);
        }
        uVar100 = uVar100 + 1;
        pvVar64 = (void *)((long)pvVar64 + sVar12);
        pvVar78 = (void *)((long)pvVar78 + sVar14);
        pvVar79 = (void *)((long)pvVar79 + sVar13);
      } while (uVar100 != uVar41);
      return;
    }
    if ((GGML_TYPE_F16 < gVar4) && (gVar4 != GGML_TYPE_COUNT)) {
      return;
    }
    ggml_compute_forward_cold_149();
  case GGML_OP_ABS:
    pgVar7 = tensor->src0;
    gVar4 = pgVar7->type;
    if (gVar4 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
        return;
      }
      uVar41 = pgVar7->ne[2] * pgVar7->ne[1] * pgVar7->ne[3];
      if ((int)uVar41 < 1) {
        return;
      }
      uVar43 = pgVar7->ne[0];
      sVar12 = tensor->nb[1];
      pvVar64 = tensor->data;
      pvVar79 = pgVar7->data;
      sVar13 = pgVar7->nb[1];
      uVar100 = 0;
      auVar107._8_4_ = 0x7fffffff;
      auVar107._0_8_ = 0x7fffffff7fffffff;
      auVar107._12_4_ = 0x7fffffff;
      do {
        if (0 < (int)uVar43) {
          uVar67 = 0;
          do {
            auVar108 = vpand_avx(ZEXT416(*(uint *)((long)pvVar79 + uVar67 * 4)),auVar107);
            *(int *)((long)pvVar64 + uVar67 * 4) = auVar108._0_4_;
            uVar67 = uVar67 + 1;
          } while (uVar43 != uVar67);
        }
        uVar100 = uVar100 + 1;
        pvVar64 = (void *)((long)pvVar64 + sVar12);
        pvVar79 = (void *)((long)pvVar79 + sVar13);
      } while (uVar100 != uVar41);
      return;
    }
    if ((GGML_TYPE_F16 < gVar4) && (gVar4 != GGML_TYPE_COUNT)) {
      return;
    }
    ggml_compute_forward_cold_143();
switchD_001270fa_caseD_1d:
    tensor_00 = (size_t *)tensor->src0;
    gVar4 = ((ggml_tensor *)tensor_00)->type;
    if (gVar4 != GGML_TYPE_F32) {
      if ((GGML_TYPE_F16 < gVar4) && (gVar4 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_13();
switchD_001270fa_caseD_6:
      pgVar7 = tensor->src0;
      gVar4 = pgVar7->type;
      if (gVar4 == GGML_TYPE_F32) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        uVar41 = pgVar7->ne[2] * pgVar7->ne[1] * pgVar7->ne[3];
        if ((int)uVar41 < 1) {
          return;
        }
        uVar43 = pgVar7->ne[0];
        sVar12 = tensor->nb[1];
        pvVar64 = tensor->data;
        pvVar79 = pgVar7->data;
        sVar13 = pgVar7->nb[1];
        uVar100 = 0;
        do {
          if (0 < (int)uVar43) {
            uVar67 = 0;
            do {
              fVar102 = *(float *)((long)pvVar79 + uVar67 * 4);
              *(float *)((long)pvVar64 + uVar67 * 4) = fVar102 * fVar102;
              uVar67 = uVar67 + 1;
            } while (uVar43 != uVar67);
          }
          uVar100 = uVar100 + 1;
          pvVar64 = (void *)((long)pvVar64 + sVar12);
          pvVar79 = (void *)((long)pvVar79 + sVar13);
        } while (uVar100 != uVar41);
        return;
      }
      if ((GGML_TYPE_F16 < gVar4) && (gVar4 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_148();
switchD_001270fa_caseD_7:
      pgVar7 = tensor->src0;
      gVar4 = pgVar7->type;
      if (gVar4 == GGML_TYPE_F32) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        uVar41 = pgVar7->ne[2] * pgVar7->ne[1] * pgVar7->ne[3];
        if ((int)uVar41 < 1) {
          return;
        }
        uVar43 = pgVar7->ne[0];
        uVar100 = 0;
        do {
          if (0 < (int)uVar43) {
            sVar12 = tensor->nb[1];
            pvVar64 = tensor->data;
            sVar13 = pgVar7->nb[1];
            pvVar79 = pgVar7->data;
            uVar67 = 0;
            do {
              fVar102 = *(float *)((long)pvVar79 + uVar67 * 4 + sVar13 * uVar100);
              if (fVar102 < 0.0) {
                fVar102 = sqrtf(fVar102);
              }
              else {
                auVar108 = vsqrtss_avx(ZEXT416((uint)fVar102),ZEXT416((uint)fVar102));
                fVar102 = auVar108._0_4_;
              }
              *(float *)((long)pvVar64 + uVar67 * 4 + sVar12 * uVar100) = fVar102;
              uVar67 = uVar67 + 1;
            } while (uVar43 != uVar67);
          }
          uVar100 = uVar100 + 1;
        } while (uVar100 != uVar41);
        return;
      }
      if ((GGML_TYPE_F16 < gVar4) && (gVar4 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_147();
switchD_001270fa_caseD_e:
      pgVar7 = tensor->src0;
      gVar4 = pgVar7->type;
      if (gVar4 == GGML_TYPE_F32) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        uVar41 = pgVar7->ne[2] * pgVar7->ne[1] * pgVar7->ne[3];
        if ((int)uVar41 < 1) {
          return;
        }
        uVar43 = pgVar7->ne[0];
        sVar12 = tensor->nb[1];
        pvVar64 = tensor->data;
        pvVar79 = pgVar7->data;
        sVar13 = pgVar7->nb[1];
        uVar100 = 0;
        do {
          if (0 < (int)uVar43) {
            uVar67 = 0;
            do {
              auVar108 = vcmpss_avx(ZEXT816(0) << 0x40,
                                    ZEXT416(*(uint *)((long)pvVar79 + uVar67 * 4)),1);
              auVar108 = vandps_avx(auVar108,SUB6416(ZEXT464(0x3f800000),0));
              *(int *)((long)pvVar64 + uVar67 * 4) = auVar108._0_4_;
              uVar67 = uVar67 + 1;
            } while (uVar43 != uVar67);
          }
          uVar100 = uVar100 + 1;
          pvVar64 = (void *)((long)pvVar64 + sVar12);
          pvVar79 = (void *)((long)pvVar79 + sVar13);
        } while (uVar100 != uVar41);
        return;
      }
      if ((GGML_TYPE_F16 < gVar4) && (gVar4 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_140();
switchD_001270fa_caseD_f:
      pgVar7 = tensor->src0;
      gVar4 = pgVar7->type;
      if (gVar4 == GGML_TYPE_F32) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        uVar41 = pgVar7->ne[2] * pgVar7->ne[1] * pgVar7->ne[3];
        if ((int)uVar41 < 1) {
          return;
        }
        uVar43 = pgVar7->ne[0];
        sVar12 = tensor->nb[1];
        pvVar64 = tensor->data;
        pvVar79 = pgVar7->data;
        sVar13 = pgVar7->nb[1];
        uVar100 = 0;
        do {
          if (0 < (int)uVar43) {
            uVar67 = 0;
            do {
              auVar108 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar79 + uVar67 * 4)),
                                    ZEXT816(0) << 0x40);
              *(int *)((long)pvVar64 + uVar67 * 4) = auVar108._0_4_;
              uVar67 = uVar67 + 1;
            } while (uVar43 != uVar67);
          }
          uVar100 = uVar100 + 1;
          pvVar64 = (void *)((long)pvVar64 + sVar12);
          pvVar79 = (void *)((long)pvVar79 + sVar13);
        } while (uVar100 != uVar41);
        return;
      }
      if ((GGML_TYPE_F16 < gVar4) && (gVar4 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_139();
switchD_001270fa_caseD_3:
      pgVar7 = tensor->src0;
      gVar4 = pgVar7->type;
      if (gVar4 == GGML_TYPE_F32) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        uVar41 = pgVar7->ne[2] * pgVar7->ne[1] * pgVar7->ne[3];
        if ((int)uVar41 < 1) {
          return;
        }
        uVar43 = pgVar7->ne[0];
        sVar12 = tensor->nb[1];
        pvVar64 = tensor->data;
        pvVar79 = pgVar7->data;
        sVar13 = pgVar7->nb[1];
        sVar14 = tensor->src1->nb[1];
        pvVar78 = tensor->src1->data;
        uVar100 = 0;
        do {
          if (0 < (int)uVar43) {
            uVar67 = 0;
            do {
              *(float *)((long)pvVar64 + uVar67 * 4) =
                   *(float *)((long)pvVar79 + uVar67 * 4) - *(float *)((long)pvVar78 + uVar67 * 4);
              uVar67 = uVar67 + 1;
            } while (uVar43 != uVar67);
          }
          uVar100 = uVar100 + 1;
          pvVar64 = (void *)((long)pvVar64 + sVar12);
          pvVar78 = (void *)((long)pvVar78 + sVar14);
          pvVar79 = (void *)((long)pvVar79 + sVar13);
        } while (uVar100 != uVar41);
        return;
      }
      if ((GGML_TYPE_F16 < gVar4) && (gVar4 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_151();
switchD_001270fa_caseD_4:
      tensor_00 = (size_t *)tensor->src0;
      gVar4 = ((ggml_tensor *)tensor_00)->type;
      if (gVar4 == GGML_TYPE_F32) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        uVar41 = ((ggml_tensor *)tensor_00)->ne[2] * ((ggml_tensor *)tensor_00)->ne[1] *
                 ((ggml_tensor *)tensor_00)->ne[3];
        if ((int)uVar41 < 1) {
          return;
        }
        uVar43 = ((ggml_tensor *)tensor_00)->ne[0];
        sVar12 = tensor->nb[1];
        pvVar64 = tensor->data;
        pvVar79 = ((ggml_tensor *)tensor_00)->data;
        sVar13 = ((ggml_tensor *)tensor_00)->nb[1];
        sVar14 = tensor->src1->nb[1];
        pvVar78 = tensor->src1->data;
        uVar100 = 0;
        do {
          if (0 < (int)uVar43) {
            uVar67 = 0;
            do {
              *(float *)((long)pvVar64 + uVar67 * 4) =
                   *(float *)((long)pvVar79 + uVar67 * 4) * *(float *)((long)pvVar78 + uVar67 * 4);
              uVar67 = uVar67 + 1;
            } while (uVar43 != uVar67);
          }
          uVar100 = uVar100 + 1;
          pvVar64 = (void *)((long)pvVar64 + sVar12);
          pvVar78 = (void *)((long)pvVar78 + sVar14);
          pvVar79 = (void *)((long)pvVar79 + sVar13);
        } while (uVar100 != uVar41);
        return;
      }
      if ((GGML_TYPE_F16 < gVar4) && (gVar4 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_150();
switchD_001270fa_caseD_9:
      pgVar7 = tensor->src0;
      gVar4 = pgVar7->type;
      if (gVar4 == GGML_TYPE_F32) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        iVar44 = pgVar7->ne[3];
        if ((long)iVar44 < 1) {
          return;
        }
        sVar12 = pgVar7->nb[1];
        sVar13 = pgVar7->nb[2];
        sVar14 = pgVar7->nb[3];
        sVar9 = tensor->nb[1];
        sVar10 = tensor->nb[2];
        sVar11 = tensor->nb[3];
        uVar41 = pgVar7->ne[0];
        uVar43 = pgVar7->ne[2];
        uVar75 = pgVar7->ne[1];
        local_378 = 0;
        local_368 = 0;
        do {
          if (0 < (int)uVar43) {
            uVar100 = 0;
            lVar98 = local_378;
            do {
              if (0 < (int)uVar75) {
                pvVar64 = tensor->data;
                lVar85 = (long)pgVar7->data + lVar98;
                uVar67 = 0;
                do {
                  if ((int)uVar41 < 1) {
                    fVar102 = 0.0;
                  }
                  else {
                    fVar102 = 0.0;
                    uVar58 = 0;
                    do {
                      fVar102 = fVar102 + *(float *)(lVar85 + uVar58 * 4);
                      uVar58 = uVar58 + 1;
                    } while (uVar41 != uVar58);
                  }
                  *(float *)((long)pvVar64 + uVar67 * sVar9 + local_368 * sVar11 + uVar100 * sVar10)
                       = fVar102 / (float)(int)uVar41;
                  uVar67 = uVar67 + 1;
                  lVar85 = lVar85 + sVar12;
                } while (uVar67 != uVar75);
              }
              uVar100 = uVar100 + 1;
              lVar98 = lVar98 + sVar13;
            } while (uVar100 != uVar43);
          }
          local_368 = local_368 + 1;
          local_378 = local_378 + sVar14;
        } while (local_368 != iVar44);
        return;
      }
      if ((GGML_TYPE_F16 < gVar4) && (gVar4 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_145();
switchD_001270fa_caseD_8:
      pgVar7 = tensor->src0;
      gVar4 = pgVar7->type;
      if (gVar4 == GGML_TYPE_F32) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        iVar44 = pgVar7->ne[3];
        if ((long)iVar44 < 1) {
          return;
        }
        sVar12 = pgVar7->nb[1];
        sVar13 = pgVar7->nb[2];
        sVar14 = pgVar7->nb[3];
        uVar41 = pgVar7->ne[2];
        uVar43 = pgVar7->ne[0];
        uVar75 = pgVar7->ne[1];
        lVar85 = 0;
        lVar98 = 0;
        do {
          if (0 < (int)uVar41) {
            uVar100 = 0;
            lVar96 = lVar85;
            do {
              if (0 < (int)uVar75) {
                pfVar88 = (float *)tensor->data;
                lVar91 = (long)pgVar7->data + lVar96;
                uVar67 = 0;
                do {
                  if ((int)uVar43 < 1) {
                    fVar102 = 0.0;
                  }
                  else {
                    fVar102 = 0.0;
                    uVar58 = 0;
                    do {
                      fVar102 = fVar102 + *(float *)(lVar91 + uVar58 * 4);
                      uVar58 = uVar58 + 1;
                    } while (uVar43 != uVar58);
                  }
                  *pfVar88 = fVar102;
                  uVar67 = uVar67 + 1;
                  lVar91 = lVar91 + sVar12;
                } while (uVar67 != uVar75);
              }
              uVar100 = uVar100 + 1;
              lVar96 = lVar96 + sVar13;
            } while (uVar100 != uVar41);
          }
          lVar98 = lVar98 + 1;
          lVar85 = lVar85 + sVar14;
        } while (lVar98 != iVar44);
        return;
      }
      if ((GGML_TYPE_F16 < gVar4) && (gVar4 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_146();
switchD_001270fa_caseD_11:
      pgVar7 = tensor->src0;
      gVar4 = pgVar7->type;
      if (gVar4 == GGML_TYPE_F32) {
        tensor_00 = GGML_TYPE_SIZE;
        if (pgVar7->nb[0] != 4) goto LAB_0012f169;
        uVar100 = pgVar7->nb[1];
        uVar41 = pgVar7->ne[0];
        if (uVar100 != ((long)(int)uVar41 * 4U) / 1) goto LAB_0012f169;
        iVar44 = pgVar7->ne[1];
        if ((pgVar7->nb[2] != uVar100 * (long)iVar44) ||
           (iVar76 = pgVar7->ne[2], pgVar7->nb[3] != pgVar7->nb[2] * (long)iVar76))
        goto LAB_0012f169;
        if (tensor->nb[0] != GGML_TYPE_SIZE[tensor->type]) goto LAB_0012f16e;
        tensor_00 = (size_t *)tensor->nb[1];
        if ((ggml_tensor *)tensor_00 !=
            (ggml_tensor *)
            ((tensor->nb[0] * (long)tensor->ne[0]) / (ulong)(long)GGML_BLCK_SIZE[tensor->type]))
        goto LAB_0012f16e;
        if ((tensor->nb[2] != (long)tensor_00 * (long)tensor->ne[1]) ||
           (tensor->nb[3] != tensor->nb[2] * (long)tensor->ne[2])) goto LAB_0012f16e;
        if ((uVar41 == tensor->ne[0]) &&
           (((iVar44 == tensor->ne[1] && (iVar76 == tensor->ne[2])) &&
            (pgVar7->ne[3] == tensor->ne[3])))) {
          if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
            return;
          }
          iVar76 = iVar76 * iVar44 * pgVar7->ne[3];
          iVar44 = (iVar76 + params->nth + -1) / params->nth;
          lVar98 = (long)params->ith * (long)iVar44;
          iVar44 = iVar44 + (int)lVar98;
          if (iVar76 <= iVar44) {
            iVar44 = iVar76;
          }
          if (iVar44 <= (int)lVar98) {
            return;
          }
          pvVar64 = (void *)((long)tensor_00 * lVar98 + (long)tensor->data);
          pvVar79 = (void *)(uVar100 * lVar98 + (long)pgVar7->data);
          do {
            if (0 < (int)uVar41) {
              uVar67 = 0;
              do {
                auVar108 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pvVar79 + uVar67 * 4)),0);
                uVar93 = vpextrw_avx(auVar108,0);
                tensor = (ggml_tensor *)
                         (ulong)table_silu_f16[CONCAT44((int)((ulong)tensor >> 0x20),uVar93)];
                *(float *)((long)pvVar64 + uVar67 * 4) = table_f32_f16[(long)tensor];
                uVar67 = uVar67 + 1;
              } while (uVar41 != uVar67);
            }
            lVar98 = lVar98 + 1;
            pvVar64 = (void *)((long)pvVar64 + (long)tensor_00);
            pvVar79 = (void *)((long)pvVar79 + uVar100);
          } while (lVar98 != iVar44);
          return;
        }
        goto LAB_0012f18c;
      }
      if ((GGML_TYPE_F16 < gVar4) && (gVar4 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_131();
switchD_001270fa_caseD_10:
      pgVar7 = tensor->src0;
      gVar4 = pgVar7->type;
      if (gVar4 == GGML_TYPE_F32) {
        tensor_00 = GGML_TYPE_SIZE;
        if (pgVar7->nb[0] != 4) goto LAB_0012f173;
        uVar100 = pgVar7->nb[1];
        uVar41 = pgVar7->ne[0];
        if (uVar100 != ((long)(int)uVar41 * 4U) / 1) goto LAB_0012f173;
        iVar44 = pgVar7->ne[1];
        if ((pgVar7->nb[2] != uVar100 * (long)iVar44) ||
           (iVar76 = pgVar7->ne[2], pgVar7->nb[3] != pgVar7->nb[2] * (long)iVar76))
        goto LAB_0012f173;
        if (tensor->nb[0] != GGML_TYPE_SIZE[tensor->type]) goto LAB_0012f178;
        tensor_00 = (size_t *)tensor->nb[1];
        if ((ggml_tensor *)tensor_00 !=
            (ggml_tensor *)
            ((tensor->nb[0] * (long)tensor->ne[0]) / (ulong)(long)GGML_BLCK_SIZE[tensor->type]))
        goto LAB_0012f178;
        if ((tensor->nb[2] != (long)tensor_00 * (long)tensor->ne[1]) ||
           (tensor->nb[3] != tensor->nb[2] * (long)tensor->ne[2])) goto LAB_0012f178;
        if ((uVar41 == tensor->ne[0]) &&
           (((iVar44 == tensor->ne[1] && (iVar76 == tensor->ne[2])) &&
            (pgVar7->ne[3] == tensor->ne[3])))) {
          if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
            return;
          }
          iVar76 = iVar76 * iVar44 * pgVar7->ne[3];
          iVar44 = (iVar76 + params->nth + -1) / params->nth;
          lVar98 = (long)params->ith * (long)iVar44;
          iVar44 = iVar44 + (int)lVar98;
          if (iVar76 <= iVar44) {
            iVar44 = iVar76;
          }
          if (iVar44 <= (int)lVar98) {
            return;
          }
          pvVar64 = (void *)((long)tensor_00 * lVar98 + (long)tensor->data);
          pvVar79 = (void *)(uVar100 * lVar98 + (long)pgVar7->data);
          do {
            if (0 < (int)uVar41) {
              uVar67 = 0;
              do {
                auVar108 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pvVar79 + uVar67 * 4)),0);
                uVar93 = vpextrw_avx(auVar108,0);
                tensor = (ggml_tensor *)
                         (ulong)table_gelu_f16[CONCAT44((int)((ulong)tensor >> 0x20),uVar93)];
                *(float *)((long)pvVar64 + uVar67 * 4) = table_f32_f16[(long)tensor];
                uVar67 = uVar67 + 1;
              } while (uVar41 != uVar67);
            }
            lVar98 = lVar98 + 1;
            pvVar64 = (void *)((long)pvVar64 + (long)tensor_00);
            pvVar79 = (void *)((long)pvVar79 + uVar100);
          } while (lVar98 != iVar44);
          return;
        }
        goto LAB_0012f191;
      }
      if ((GGML_TYPE_F16 < gVar4) && (gVar4 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_135();
switchD_001270fa_caseD_14:
      pgVar7 = tensor->src0;
      if (GGML_TYPE_COUNT < pgVar7->type) {
        return;
      }
      pgVar5 = tensor->src1;
      switch(pgVar7->type) {
      case GGML_TYPE_Q4_0:
        uVar41 = pgVar7->ne[2];
        uVar43 = pgVar5->ne[2];
        if (uVar41 != uVar43) goto LAB_0012f2e5;
        uVar75 = pgVar7->ne[3];
        uVar86 = pgVar5->ne[3];
        if (uVar75 != uVar86) goto LAB_0012f2ea;
        uVar90 = tensor->ne[2];
        if (uVar90 != uVar43) goto LAB_0012f2ef;
        uVar60 = tensor->ne[3];
        tensor_00 = (size_t *)(ulong)uVar60;
        if (uVar60 != uVar86) goto LAB_0012f2f4;
        iVar44 = (int)pgVar7->nb[1];
        iVar76 = (int)pgVar7->nb[0];
        if (iVar44 != 0x14 && iVar76 != 0x14) goto LAB_0012f2f9;
        if ((int)tensor->nb[0] != 4) goto LAB_0012f2fe;
        iVar50 = (int)tensor->nb[1];
        if (iVar50 < 4) goto LAB_0012f303;
        iVar94 = (int)tensor->nb[2];
        if (iVar94 < iVar50) goto LAB_0012f308;
        iVar50 = (int)tensor->nb[3];
        if (iVar50 < iVar94) goto LAB_0012f30d;
        uVar53 = pgVar7->ne[1];
        uVar80 = tensor->ne[0];
        if (uVar80 != uVar53) goto LAB_0012f312;
        uVar84 = pgVar5->ne[1];
        uVar100 = (ulong)uVar84;
        uVar54 = tensor->ne[1];
        if (uVar54 != uVar84) goto LAB_0012f317;
        if (uVar90 != uVar41) goto LAB_0012f31c;
        if (uVar60 == uVar75) {
          iVar72 = uVar54 * uVar80 * uVar90;
          iVar82 = uVar60 * iVar72;
          iVar42 = params->ith;
          uVar90 = params->nth;
          if (params->type == GGML_TASK_FINALIZE) {
            if (iVar76 <= iVar44) {
              return;
            }
            pvVar64 = params->wdata;
            iVar44 = (int)(uVar90 + iVar82 + -1) / (int)uVar90;
            iVar42 = iVar42 * iVar44;
            iVar44 = iVar44 + iVar42;
            if (iVar82 <= iVar44) {
              iVar44 = iVar82;
            }
            lVar98 = (long)iVar42 * 4;
            pvVar79 = tensor->data;
            uVar41 = iVar44 - iVar42;
            if (uVar41 != 0 && iVar42 <= iVar44) {
              uVar100 = 0;
              do {
                *(undefined4 *)((long)pvVar79 + uVar100 * 4 + lVar98) =
                     *(undefined4 *)((long)pvVar64 + uVar100 * 4 + (long)iVar42 * 4);
                uVar100 = uVar100 + 1;
              } while (uVar41 != uVar100);
            }
            if ((int)uVar90 < 2) {
              return;
            }
            lVar85 = (long)pvVar64 + lVar98 + (long)iVar82 * 4 + 0x40;
            uVar100 = 1;
            do {
              if (0 < (int)uVar41) {
                uVar67 = 0;
                do {
                  *(float *)((long)pvVar79 + uVar67 * 4 + lVar98) =
                       *(float *)(lVar85 + uVar67 * 4) +
                       *(float *)((long)pvVar79 + uVar67 * 4 + lVar98);
                  uVar67 = uVar67 + 1;
                } while (uVar41 != uVar67);
              }
              uVar100 = uVar100 + 1;
              lVar85 = lVar85 + (long)iVar82 * 4 + 0x40;
            } while (uVar100 != uVar90);
            return;
          }
          iVar83 = pgVar5->ne[0];
          iVar51 = (int)pgVar5->nb[1];
          local_2e8._0_4_ = (int)pgVar5->nb[2];
          local_2a0._0_4_ = (int)pgVar5->nb[3];
          if (params->type != GGML_TASK_INIT) {
            local_240._0_4_ = (undefined4)pgVar7->nb[2];
            local_2b8._0_4_ = (int)pgVar7->nb[3];
            if (iVar44 < iVar76) {
              if ((int)uVar86 < 1) {
                return;
              }
              sVar12 = pgVar5->nb[0];
              iVar44 = (int)(uVar90 + iVar83 + -1) / (int)uVar90;
              iVar50 = iVar44 * iVar42;
              iVar44 = iVar44 + iVar50;
              if (iVar83 <= iVar44) {
                iVar44 = iVar83;
              }
              iVar94 = iVar50 * iVar76;
              pvVar64 = params->wdata;
              auVar110[8] = 0xf;
              auVar110._0_8_ = 0xf0f0f0f0f0f0f0f;
              auVar110[9] = 0xf;
              auVar110[10] = 0xf;
              auVar110[0xb] = 0xf;
              auVar110[0xc] = 0xf;
              auVar110[0xd] = 0xf;
              auVar110[0xe] = 0xf;
              auVar110[0xf] = 0xf;
              iVar83 = 0;
              auVar134._8_4_ = 0xfffffff8;
              auVar134._0_8_ = 0xfffffff8fffffff8;
              auVar134._12_4_ = 0xfffffff8;
              auVar134._16_4_ = 0xfffffff8;
              auVar134._20_4_ = 0xfffffff8;
              auVar134._24_4_ = 0xfffffff8;
              auVar134._28_4_ = 0xfffffff8;
              local_2b0 = 0;
              do {
                if (0 < (int)uVar43) {
                  iVar55 = 0;
                  local_300 = 0;
                  iVar70 = iVar94;
                  do {
                    if (0 < (int)uVar84) {
                      lVar98 = (long)pvVar64 +
                               (long)iVar55 * 4 +
                               (long)iVar83 * 4 + (long)((iVar82 + 0x10) * iVar42) * 4;
                      local_380._0_4_ =
                           (int)local_300 * local_240._0_4_ + (int)local_2b0 * (int)local_2b8;
                      local_360 = 0;
                      do {
                        if (iVar50 < iVar44) {
                          pvVar79 = pgVar7->data;
                          pvVar78 = pgVar5->data;
                          lVar85 = (long)iVar50;
                          iVar68 = iVar70;
                          do {
                            if (0x1f < (int)uVar53) {
                              lVar91 = (long)pvVar79 + (long)iVar68 + 4;
                              local_370._0_4_ = (int)sVar12;
                              uVar93 = *(undefined4 *)
                                        ((long)pvVar78 +
                                        (long)((int)lVar85 * (int)local_370 +
                                              (int)local_360 * iVar51 +
                                              (int)local_300 * (int)local_2e8 +
                                              (int)local_2b0 * (int)local_2a0));
                              auVar159._4_4_ = uVar93;
                              auVar159._0_4_ = uVar93;
                              auVar159._8_4_ = uVar93;
                              auVar159._12_4_ = uVar93;
                              auVar159._16_4_ = uVar93;
                              auVar159._20_4_ = uVar93;
                              auVar159._24_4_ = uVar93;
                              auVar159._28_4_ = uVar93;
                              uVar67 = 0;
                              lVar96 = lVar98;
                              do {
                                fVar102 = *(float *)((long)pvVar79 +
                                                    uVar67 * 0x14 +
                                                    (long)((int)lVar85 * iVar76 + (int)local_380));
                                lVar99 = 0;
                                do {
                                  auVar178._8_8_ = 0;
                                  auVar178._0_8_ = *(ulong *)(lVar91 + lVar99);
                                  auVar108 = vpand_avx(auVar178,auVar110);
                                  auVar122 = vpsrlw_avx(auVar178,4);
                                  auVar122 = vpand_avx(auVar122,auVar110);
                                  auVar130 = vpmovzxbd_avx2(auVar108);
                                  auVar130 = vpaddd_avx2(auVar130,auVar134);
                                  auVar130 = vcvtdq2ps_avx(auVar130);
                                  auVar19._4_4_ = fVar102 * auVar130._4_4_;
                                  auVar19._0_4_ = fVar102 * auVar130._0_4_;
                                  auVar19._8_4_ = fVar102 * auVar130._8_4_;
                                  auVar19._12_4_ = fVar102 * auVar130._12_4_;
                                  auVar19._16_4_ = fVar102 * auVar130._16_4_;
                                  auVar19._20_4_ = fVar102 * auVar130._20_4_;
                                  auVar19._24_4_ = fVar102 * auVar130._24_4_;
                                  auVar19._28_4_ = auVar130._28_4_;
                                  auVar130 = vpmovzxbd_avx2(auVar122);
                                  auVar130 = vpaddd_avx2(auVar130,auVar134);
                                  auVar130 = vcvtdq2ps_avx(auVar130);
                                  auVar20._4_4_ = fVar102 * auVar130._4_4_;
                                  auVar20._0_4_ = fVar102 * auVar130._0_4_;
                                  auVar20._8_4_ = fVar102 * auVar130._8_4_;
                                  auVar20._12_4_ = fVar102 * auVar130._12_4_;
                                  auVar20._16_4_ = fVar102 * auVar130._16_4_;
                                  auVar20._20_4_ = fVar102 * auVar130._20_4_;
                                  auVar20._24_4_ = fVar102 * auVar130._24_4_;
                                  auVar20._28_4_ = auVar130._28_4_;
                                  auVar130 = *(undefined1 (*) [32])(lVar96 + lVar99 * 8);
                                  auVar197 = *(undefined1 (*) [32])(lVar96 + lVar99 * 8 + 0x20);
                                  auVar207 = vshufps_avx(auVar130,auVar197,0x88);
                                  auVar207 = vpermpd_avx2(auVar207,0xd8);
                                  auVar130 = vshufps_avx(auVar130,auVar197,0xdd);
                                  auVar130 = vpermpd_avx2(auVar130,0xd8);
                                  auVar108 = vfmadd231ps_fma(auVar207,auVar159,auVar19);
                                  auVar122 = vfmadd231ps_fma(auVar130,auVar159,auVar20);
                                  auVar130 = vunpckhps_avx(ZEXT1632(auVar108),ZEXT1632(auVar122));
                                  auVar197 = vunpcklps_avx(ZEXT1632(auVar108),ZEXT1632(auVar122));
                                  auVar207 = vperm2f128_avx(auVar197,auVar130,0x31);
                                  auVar130 = vperm2f128_avx(auVar197,auVar130,0x20);
                                  *(undefined1 (*) [32])(lVar96 + lVar99 * 8) = auVar130;
                                  *(undefined1 (*) [32])(lVar96 + lVar99 * 8 + 0x20) = auVar207;
                                  lVar99 = lVar99 + 8;
                                } while (lVar99 != 0x10);
                                uVar67 = uVar67 + 1;
                                lVar91 = lVar91 + 0x14;
                                lVar96 = lVar96 + 0x80;
                              } while (uVar67 != uVar53 >> 5);
                            }
                            lVar85 = lVar85 + 1;
                            iVar68 = iVar68 + iVar76;
                          } while (lVar85 != iVar44);
                        }
                        local_360 = local_360 + 1;
                        lVar98 = lVar98 + (long)(int)uVar80 * 4;
                      } while (local_360 != uVar100);
                    }
                    local_300 = local_300 + 1;
                    iVar70 = iVar70 + local_240._0_4_;
                    iVar55 = iVar55 + uVar54 * uVar80;
                  } while (local_300 != uVar43);
                }
                local_2b0 = local_2b0 + 1;
                iVar94 = iVar94 + (int)local_2b8;
                iVar83 = iVar83 + iVar72;
              } while (local_2b0 != uVar86);
              return;
            }
            iVar82 = uVar41 * uVar53;
            iVar72 = uVar75 * iVar82;
            iVar76 = (int)(iVar72 + uVar90 + -1) / (int)uVar90;
            iVar42 = iVar42 * iVar76;
            iVar76 = iVar76 + iVar42;
            if (iVar72 <= iVar76) {
              iVar76 = iVar72;
            }
            if (iVar76 <= iVar42) {
              return;
            }
            uVar41 = pgVar7->ne[0];
            pvVar64 = params->wdata;
            pvVar79 = pgVar7->data;
            pvVar78 = tensor->data;
            auVar117._8_8_ = 0xf000f000f000f;
            auVar117._0_8_ = 0xf000f000f000f;
            auVar117._16_8_ = 0xf000f000f000f;
            auVar117._24_8_ = 0xf000f000f000f;
            auVar142._8_8_ = 0xf000f000f000f00;
            auVar142._0_8_ = 0xf000f000f000f00;
            auVar142._16_8_ = 0xf000f000f000f00;
            auVar142._24_8_ = 0xf000f000f000f00;
            auVar166[8] = 0xf8;
            auVar166._0_8_ = 0xf8f8f8f8f8f8f8f8;
            auVar166[9] = 0xf8;
            auVar166[10] = 0xf8;
            auVar166[0xb] = 0xf8;
            auVar166[0xc] = 0xf8;
            auVar166[0xd] = 0xf8;
            auVar166[0xe] = 0xf8;
            auVar166[0xf] = 0xf8;
            auVar166[0x10] = 0xf8;
            auVar166[0x11] = 0xf8;
            auVar166[0x12] = 0xf8;
            auVar166[0x13] = 0xf8;
            auVar166[0x14] = 0xf8;
            auVar166[0x15] = 0xf8;
            auVar166[0x16] = 0xf8;
            auVar166[0x17] = 0xf8;
            auVar166[0x18] = 0xf8;
            auVar166[0x19] = 0xf8;
            auVar166[0x1a] = 0xf8;
            auVar166[0x1b] = 0xf8;
            auVar166[0x1c] = 0xf8;
            auVar166[0x1d] = 0xf8;
            auVar166[0x1e] = 0xf8;
            auVar166[0x1f] = 0xf8;
            do {
              iVar72 = iVar42 / iVar82;
              uVar67 = (ulong)(uint)((int)((long)iVar42 % (long)iVar82) >> 0x1f) << 0x20 |
                       (long)iVar42 % (long)iVar82 & 0xffffffffU;
              if (0 < (int)uVar84) {
                iVar51 = (int)((long)uVar67 % (long)(int)uVar53);
                iVar83 = (int)((long)uVar67 / (long)(int)uVar53);
                lVar98 = (long)(iVar72 * (int)local_2b8 + iVar51 * iVar44 + iVar83 * local_240._0_4_
                               );
                uVar67 = 0;
                uVar58 = 0;
                do {
                  auVar108 = ZEXT816(0) << 0x40;
                  if (0x1f < (int)uVar41) {
                    lVar85 = (uVar67 >> 5) +
                             ((ulong)((long)(int)((iVar72 * uVar43 + iVar83) * uVar41 * uVar84) *
                                     0x14) >> 5) + 4;
                    lVar96 = 0;
                    do {
                      fVar102 = *(float *)((long)pvVar79 + lVar96 + lVar98) *
                                *(float *)((long)pvVar64 + lVar96 + lVar85 + -4);
                      auVar190._4_4_ = fVar102;
                      auVar190._0_4_ = fVar102;
                      auVar190._8_4_ = fVar102;
                      auVar190._12_4_ = fVar102;
                      auVar190._16_4_ = fVar102;
                      auVar190._20_4_ = fVar102;
                      auVar190._24_4_ = fVar102;
                      auVar190._28_4_ = fVar102;
                      auVar197 = vpmovzxbw_avx2(*(undefined1 (*) [16])
                                                 ((long)pvVar79 + lVar96 + lVar98 + 4));
                      auVar130 = vpand_avx2(auVar197,auVar117);
                      auVar197 = vpsllw_avx2(auVar197,4);
                      auVar197 = vpand_avx2(auVar197,auVar142);
                      auVar207 = vpmovzxbw_avx2(*(undefined1 (*) [16])
                                                 ((long)pvVar64 + lVar96 + lVar85));
                      auVar131 = vpor_avx2(auVar197,auVar130);
                      auVar130 = vpand_avx2(auVar207,auVar117);
                      auVar197 = vpsllw_avx2(auVar207,4);
                      auVar197 = vpand_avx2(auVar197,auVar142);
                      auVar197 = vpor_avx2(auVar197,auVar130);
                      auVar130 = vpaddb_avx2(auVar131,auVar166);
                      auVar197 = vpaddb_avx2(auVar197,auVar166);
                      auVar207 = vpmovsxbw_avx2(auVar130._0_16_);
                      auVar131 = vpmovsxbw_avx2(auVar197._0_16_);
                      auVar207 = vpmaddwd_avx2(auVar131,auVar207);
                      auVar130 = vpmovsxbw_avx2(auVar130._16_16_);
                      auVar197 = vpmovsxbw_avx2(auVar197._16_16_);
                      auVar130 = vpmaddwd_avx2(auVar130,auVar197);
                      auVar130 = vpaddd_avx2(auVar130,auVar207);
                      auVar130 = vcvtdq2ps_avx(auVar130);
                      auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar190,auVar130);
                      lVar96 = lVar96 + 0x14;
                    } while ((ulong)(uVar41 >> 3 & 0xfffffffc) * 5 != lVar96);
                  }
                  auVar170._0_4_ = auVar108._0_4_ + 0.0;
                  auVar170._4_4_ = auVar108._4_4_ + 0.0;
                  auVar170._8_4_ = auVar108._8_4_ + 0.0;
                  auVar170._12_4_ = auVar108._12_4_ + 0.0;
                  auVar108 = vshufpd_avx(auVar170,auVar170,1);
                  auVar171._0_4_ = auVar170._0_4_ + auVar108._0_4_;
                  auVar171._4_4_ = auVar170._4_4_ + auVar108._4_4_;
                  auVar171._8_4_ = auVar170._8_4_ + auVar108._8_4_;
                  auVar171._12_4_ = auVar170._12_4_ + auVar108._12_4_;
                  auVar108 = vhaddps_avx(auVar171,auVar171);
                  *(int *)((long)pvVar78 +
                          uVar58 * (long)(int)uVar80 * 4 +
                          (long)(iVar72 * iVar50 + iVar51 * 4 + iVar83 * iVar94)) = auVar108._0_4_;
                  uVar58 = uVar58 + 1;
                  uVar67 = uVar67 + (long)(int)uVar41 * 0x14;
                } while (uVar58 != uVar100);
              }
              iVar42 = iVar42 + 1;
            } while (iVar42 != iVar76);
            return;
          }
          if (iVar76 <= iVar44) {
            if ((int)uVar86 < 1) {
              return;
            }
            pvVar64 = params->wdata;
            local_358 = 0;
            local_348 = 0;
            do {
              if (0 < (int)uVar43) {
                uVar58 = 0;
                uVar67 = local_358;
                do {
                  lVar98 = uVar67;
                  uVar56 = uVar100;
                  if (0 < (int)uVar84) {
                    do {
                      quantize_row_q4_0((float *)((long)pgVar5->data + lVar98),pvVar64,iVar83);
                      pvVar64 = (void *)((long)pvVar64 + ((ulong)((long)iVar83 * 0x14) >> 5));
                      lVar98 = lVar98 + iVar51;
                      uVar56 = uVar56 - 1;
                    } while (uVar56 != 0);
                  }
                  uVar58 = uVar58 + 1;
                  uVar67 = uVar67 + (long)(int)local_2e8;
                } while (uVar58 != uVar43);
              }
              local_348 = local_348 + 1;
              local_358 = local_358 + (long)(int)local_2a0;
            } while (local_348 != uVar86);
            return;
          }
          __n = params->wsize;
          pvVar64 = params->wdata;
          goto LAB_0012b121;
        }
        goto LAB_0012f321;
      case GGML_TYPE_Q4_1:
        goto switchD_001280eb_caseD_1;
      default:
        goto switchD_001280eb_caseD_2;
      case GGML_TYPE_F16:
        uVar41 = pgVar7->ne[2];
        uVar43 = pgVar5->ne[2];
        if (uVar41 != uVar43) goto LAB_0012f326;
        uVar75 = pgVar7->ne[3];
        uVar86 = pgVar5->ne[3];
        if (uVar75 != uVar86) goto LAB_0012f32b;
        uVar90 = tensor->ne[2];
        if (uVar90 != uVar43) goto LAB_0012f330;
        uVar60 = tensor->ne[3];
        if (uVar60 != uVar86) goto LAB_0012f335;
        iVar44 = (int)pgVar7->nb[0];
        if ((pgVar7->nb[1] & 0xffffffff) != 2 && iVar44 != 2) goto LAB_0012f33a;
        if ((int)tensor->nb[0] != 4) goto LAB_0012f33f;
        iVar76 = (int)tensor->nb[1];
        if (iVar76 < 4) goto LAB_0012f344;
        local_280._0_4_ = (undefined4)tensor->nb[2];
        if ((int)local_280._0_4_ < iVar76) goto LAB_0012f349;
        iVar76 = (int)tensor->nb[3];
        local_348 = CONCAT44(local_348._4_4_,iVar76);
        if (iVar76 < (int)local_280._0_4_) goto LAB_0012f34e;
        uVar53 = pgVar7->ne[1];
        uVar80 = tensor->ne[0];
        if (uVar80 != uVar53) goto LAB_0012f353;
        uVar84 = pgVar5->ne[1];
        uVar100 = (ulong)uVar84;
        uVar54 = tensor->ne[1];
        if (uVar54 != uVar84) goto LAB_0012f358;
        if (uVar90 != uVar41) goto LAB_0012f35d;
        if (uVar60 == uVar75) {
          iVar94 = uVar54 * uVar80 * uVar90;
          iVar42 = uVar60 * iVar94;
          iVar50 = params->ith;
          uVar90 = params->nth;
          local_360._0_4_ = (int)pgVar7->nb[1];
          if (params->type == GGML_TASK_FINALIZE) {
            if (iVar44 <= (int)local_360) {
              return;
            }
            pvVar64 = params->wdata;
            iVar44 = (int)(uVar90 + iVar42 + -1) / (int)uVar90;
            iVar50 = iVar50 * iVar44;
            iVar44 = iVar44 + iVar50;
            if (iVar42 <= iVar44) {
              iVar44 = iVar42;
            }
            if (iVar50 < iVar44) {
              pvVar79 = tensor->data;
              lVar98 = (long)iVar50;
              do {
                *(float *)((long)pvVar79 + lVar98 * 4) =
                     table_f32_f16[*(ushort *)((long)pvVar64 + lVar98 * 2)];
                lVar98 = lVar98 + 1;
              } while (iVar44 != lVar98);
            }
            if ((int)uVar90 < 2) {
              return;
            }
            lVar98 = (long)pvVar64 + (long)iVar42 * 2 + 0x20;
            uVar100 = 1;
            do {
              if (iVar50 < iVar44) {
                pvVar64 = tensor->data;
                lVar85 = (long)iVar50;
                do {
                  *(float *)((long)pvVar64 + lVar85 * 4) =
                       table_f32_f16[*(ushort *)(lVar98 + lVar85 * 2)] +
                       *(float *)((long)pvVar64 + lVar85 * 4);
                  lVar85 = lVar85 + 1;
                } while (iVar44 != lVar85);
              }
              uVar100 = uVar100 + 1;
              lVar98 = lVar98 + (long)iVar42 * 2 + 0x20;
            } while (uVar100 != uVar90);
            return;
          }
          uVar60 = pgVar5->ne[0];
          sVar12 = pgVar5->nb[1];
          sVar13 = pgVar5->nb[2];
          sVar14 = pgVar5->nb[3];
          iVar72 = (int)pgVar5->nb[0];
          if (params->type != GGML_TASK_INIT) {
            local_308._0_4_ = (int)pgVar7->nb[3];
            local_320 = (int)pgVar7->nb[2];
            if (iVar44 <= (int)local_360) {
              iVar42 = uVar41 * uVar53;
              iVar94 = uVar75 * iVar42;
              iVar44 = (int)(iVar94 + uVar90 + -1) / (int)uVar90;
              iVar50 = iVar50 * iVar44;
              iVar44 = iVar44 + iVar50;
              if (iVar94 <= iVar44) {
                iVar44 = iVar94;
              }
              if (iVar44 <= iVar50) {
                return;
              }
              uVar41 = pgVar7->ne[0];
              pvVar64 = params->wdata;
              pvVar79 = pgVar7->data;
              pvVar78 = tensor->data;
              uVar75 = uVar41 & 0xffffffe0;
              auVar108 = ZEXT816(0);
              do {
                iVar94 = iVar50 / iVar42;
                uVar67 = (ulong)(uint)((int)((long)iVar50 % (long)iVar42) >> 0x1f) << 0x20 |
                         (long)iVar50 % (long)iVar42 & 0xffffffffU;
                if (0 < (int)uVar84) {
                  iVar82 = (int)((long)uVar67 % (long)(int)uVar53);
                  iVar72 = (int)((long)uVar67 / (long)(int)uVar53);
                  lVar98 = (long)(iVar94 * (int)local_308 + iVar82 * (int)local_360 +
                                 iVar72 * local_320) + (long)pvVar79;
                  pvVar97 = (void *)((long)pvVar64 +
                                    (long)(int)((iVar94 * uVar43 + iVar72) * uVar84 * uVar41) * 2);
                  uVar67 = 0;
                  do {
                    local_1a0 = ZEXT1632(auVar108);
                    _local_1c0 = ZEXT1632(auVar108);
                    _local_1e0 = ZEXT1632(auVar108);
                    _local_200 = ZEXT1632(auVar108);
                    if (0 < (int)uVar75) {
                      uVar58 = 0;
                      lVar85 = lVar98;
                      pvVar49 = pvVar97;
                      do {
                        lVar96 = 0;
                        do {
                          auVar130 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar85 + lVar96));
                          auVar197 = vcvtph2ps_f16c(*(undefined1 (*) [16])((long)pvVar49 + lVar96));
                          auVar122 = vfmadd213ps_fma(auVar197,auVar130,
                                                     *(undefined1 (*) [32])(local_200 + lVar96 * 2))
                          ;
                          *(undefined1 (*) [32])(local_200 + lVar96 * 2) = ZEXT1632(auVar122);
                          lVar96 = lVar96 + 0x10;
                        } while (lVar96 != 0x40);
                        uVar58 = uVar58 + 0x20;
                        pvVar49 = (void *)((long)pvVar49 + 0x40);
                        lVar85 = lVar85 + 0x40;
                      } while (uVar58 < uVar75);
                    }
                    lVar85 = 0;
                    do {
                      fVar102 = *(float *)(local_1e0 + lVar85 + 4);
                      fVar3 = *(float *)(local_1e0 + lVar85 + 8);
                      fVar214 = *(float *)(local_1e0 + lVar85 + 0xc);
                      fVar25 = *(float *)(local_1e0 + lVar85 + 0x10);
                      fVar26 = *(float *)(local_1e0 + lVar85 + 0x14);
                      fVar27 = *(float *)(local_1e0 + lVar85 + 0x18);
                      fVar28 = *(float *)(local_1e0 + lVar85 + 0x1c);
                      *(float *)(local_200 + lVar85) =
                           *(float *)(local_200 + lVar85) + *(float *)(local_1e0 + lVar85);
                      *(float *)(local_200 + lVar85 + 4) =
                           *(float *)(local_200 + lVar85 + 4) + fVar102;
                      *(float *)(local_200 + lVar85 + 8) =
                           *(float *)(local_200 + lVar85 + 8) + fVar3;
                      *(float *)(local_200 + lVar85 + 0xc) =
                           *(float *)(local_200 + lVar85 + 0xc) + fVar214;
                      *(float *)(local_200 + lVar85 + 0x10) =
                           *(float *)(local_200 + lVar85 + 0x10) + fVar25;
                      *(float *)(local_200 + lVar85 + 0x14) =
                           *(float *)(local_200 + lVar85 + 0x14) + fVar26;
                      *(float *)(local_200 + lVar85 + 0x18) =
                           *(float *)(local_200 + lVar85 + 0x18) + fVar27;
                      *(float *)(local_200 + lVar85 + 0x1c) =
                           *(float *)(local_200 + lVar85 + 0x1c) + fVar28;
                      lVar85 = lVar85 + 0x40;
                    } while (lVar85 == 0x40);
                    auVar129._0_4_ =
                         (float)local_200 + (float)local_1c0 + afStack_1fc[3] + afStack_1bc[3];
                    auVar129._4_4_ =
                         afStack_1fc[0] + afStack_1bc[0] + afStack_1fc[0] + afStack_1bc[0];
                    auVar129._8_4_ =
                         afStack_1fc[1] + afStack_1bc[1] + afStack_1fc[5] + afStack_1bc[5];
                    auVar129._12_4_ =
                         afStack_1fc[2] + afStack_1bc[2] + afStack_1fc[6] + afStack_1bc[6];
                    auVar122 = vhaddps_avx(auVar129,auVar129);
                    auVar122 = vhaddps_avx(auVar122,auVar122);
                    fVar102 = auVar122._0_4_;
                    lVar85 = (long)(int)uVar75;
                    if (uVar75 != uVar41) {
                      do {
                        fVar102 = fVar102 + table_f32_f16[*(ushort *)(lVar98 + lVar85 * 2)] *
                                            table_f32_f16[*(ushort *)((long)pvVar97 + lVar85 * 2)];
                        lVar85 = lVar85 + 1;
                      } while (lVar85 < (int)uVar41);
                    }
                    *(float *)((long)pvVar78 +
                              uVar67 * (long)(int)uVar80 * 4 +
                              (long)(iVar94 * iVar76 + iVar82 * 4 + iVar72 * local_280._0_4_)) =
                         fVar102;
                    uVar67 = uVar67 + 1;
                    pvVar97 = (void *)((long)pvVar97 + (long)(int)uVar41 * 2);
                  } while (uVar67 != uVar100);
                }
                iVar50 = iVar50 + 1;
              } while (iVar50 != iVar44);
              return;
            }
            if ((int)uVar86 < 1) {
              return;
            }
            iVar76 = (int)(uVar90 + uVar60 + -1) / (int)uVar90;
            iVar82 = iVar76 * iVar50;
            uVar41 = iVar76 + iVar82;
            if ((int)uVar60 <= (int)uVar41) {
              uVar41 = uVar60;
            }
            uVar75 = uVar53 & 0xffffffe0;
            pvVar64 = params->wdata;
            local_2e0 = iVar82 * iVar44;
            iVar76 = 0;
            local_2f8 = 0;
            do {
              if (0 < (int)uVar43) {
                auVar36._24_8_ = 0;
                auVar36._0_24_ = local_280._8_24_;
                local_280 = auVar36 << 0x40;
                local_330 = 0;
                iVar83 = local_2e0;
                do {
                  auVar130 = local_280;
                  if (0 < (int)uVar84) {
                    lVar98 = (long)pvVar64 +
                             (long)(int)local_280._0_4_ * 2 +
                             (long)iVar76 * 2 + (long)((iVar42 + 0x10) * iVar50) * 2;
                    uVar67 = 0;
                    do {
                      if (iVar82 < (int)uVar41) {
                        params = (ggml_compute_params *)
                                 (uVar67 * sVar12 + local_330 * sVar13 + local_2f8 * sVar14);
                        lVar85 = (long)iVar82;
                        iVar51 = iVar83;
                        do {
                          if (0 < (int)uVar75) {
                            uVar93 = *(undefined4 *)
                                      ((long)pgVar5->data +
                                      (long)((int)lVar85 * iVar72 + (int)params));
                            auVar116._4_4_ = uVar93;
                            auVar116._0_4_ = uVar93;
                            auVar116._8_4_ = uVar93;
                            auVar116._12_4_ = uVar93;
                            auVar116._16_4_ = uVar93;
                            auVar116._20_4_ = uVar93;
                            auVar116._24_4_ = uVar93;
                            auVar116._28_4_ = uVar93;
                            lVar91 = (long)iVar51 + (long)pgVar7->data;
                            uVar58 = 0;
                            lVar96 = lVar98;
                            do {
                              lVar99 = 0;
                              do {
                                auVar197 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar91 + lVar99));
                                auVar207 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar96 + lVar99));
                                auVar108 = vfmadd231ps_fma(auVar207,auVar116,auVar197);
                                auVar108 = vcvtps2ph_f16c(ZEXT1632(auVar108),0);
                                *(undefined1 (*) [16])(lVar96 + lVar99) = auVar108;
                                lVar99 = lVar99 + 0x10;
                              } while (lVar99 != 0x40);
                              uVar58 = uVar58 + 0x20;
                              lVar96 = lVar96 + 0x40;
                              lVar91 = lVar91 + 0x40;
                            } while (uVar58 < uVar75);
                          }
                          if (uVar75 != uVar53) {
                            ggml_compute_forward_cold_95();
                            goto LAB_0012f123;
                          }
                          lVar85 = lVar85 + 1;
                          iVar51 = iVar51 + iVar44;
                        } while (lVar85 != (int)uVar41);
                      }
                      uVar67 = uVar67 + 1;
                      lVar98 = lVar98 + (long)(int)uVar80 * 2;
                    } while (uVar67 != uVar100);
                  }
                  local_330 = local_330 + 1;
                  local_280._4_4_ = 0;
                  local_280._0_4_ = local_280._0_4_ + uVar54 * uVar80;
                  local_280._8_24_ = auVar130._8_24_;
                  iVar83 = iVar83 + local_320;
                } while (local_330 != uVar43);
              }
              local_2f8 = local_2f8 + 1;
              iVar76 = iVar76 + iVar94;
              local_2e0 = local_2e0 + (int)local_308;
              if (local_2f8 == uVar86) {
                return;
              }
            } while( true );
          }
          pvVar64 = params->wdata;
          if (iVar44 <= (int)local_360) {
            uVar67 = 0;
            if (0 < (int)uVar86) {
              local_358._0_4_ = (int)sVar12;
              local_310._0_4_ = (int)sVar13;
              local_2f0 = (int)sVar14;
              lVar98 = 0;
              uVar58 = 0;
              do {
                if (0 < (int)uVar43) {
                  uVar56 = 0;
                  lVar85 = lVar98;
                  do {
                    if (0 < (int)uVar84) {
                      uVar81 = 0;
                      lVar96 = lVar85;
                      do {
                        if (0 < (int)uVar60) {
                          puVar92 = (uint *)((long)pgVar5->data + lVar96);
                          uVar74 = 0;
                          do {
                            auVar108 = vcvtps2ph_f16c(ZEXT416(*puVar92),0);
                            vpextrw_avx(auVar108,0);
                            uVar74 = uVar74 + 1;
                            puVar92 = (uint *)((long)puVar92 + (long)iVar72);
                          } while (uVar60 != uVar74);
                          uVar67 = (ulong)(uint)((int)uVar67 + (int)uVar74);
                        }
                        uVar81 = uVar81 + 1;
                        lVar96 = lVar96 + (int)local_358;
                      } while (uVar81 != uVar100);
                    }
                    uVar56 = uVar56 + 1;
                    lVar85 = lVar85 + (int)local_310;
                  } while (uVar56 != uVar43);
                }
                uVar58 = uVar58 + 1;
                lVar98 = lVar98 + local_2f0;
              } while (uVar58 != uVar86);
              uVar67 = (long)(int)uVar67 * 2;
            }
            if (uVar67 <= params->wsize) {
              return;
            }
            ggml_compute_forward_cold_94();
            goto LAB_0012e8c2;
          }
          __n = params->wsize;
          goto LAB_0012b121;
        }
        goto LAB_0012f362;
      case GGML_TYPE_F32:
        iVar44 = tensor->ne[0];
        iVar76 = tensor->ne[1];
        iVar50 = tensor->ne[2];
        iVar82 = iVar76 * iVar44;
        iVar83 = iVar82 * iVar50 * tensor->ne[3];
        iVar94 = (int)pgVar7->nb[0];
        iVar42 = (int)pgVar7->nb[1];
        iVar72 = params->ith;
        uVar41 = params->nth;
        if (params->type == GGML_TASK_FINALIZE) {
          if (iVar94 <= iVar42) {
            return;
          }
          pvVar64 = params->wdata;
          iVar44 = (int)(uVar41 + iVar83 + -1) / (int)uVar41;
          iVar72 = iVar72 * iVar44;
          iVar44 = iVar44 + iVar72;
          if (iVar83 <= iVar44) {
            iVar44 = iVar83;
          }
          lVar98 = (long)iVar72 * 4;
          pvVar79 = tensor->data;
          uVar43 = iVar44 - iVar72;
          if (uVar43 != 0 && iVar72 <= iVar44) {
            uVar100 = 0;
            do {
              *(undefined4 *)((long)pvVar79 + uVar100 * 4 + lVar98) =
                   *(undefined4 *)((long)pvVar64 + uVar100 * 4 + (long)iVar72 * 4);
              uVar100 = uVar100 + 1;
            } while (uVar43 != uVar100);
          }
          if ((int)uVar41 < 2) {
            return;
          }
          lVar85 = (long)pvVar64 + lVar98 + (long)iVar83 * 4 + 0x40;
          uVar100 = 1;
          do {
            if (0 < (int)uVar43) {
              uVar67 = 0;
              do {
                *(float *)((long)pvVar79 + uVar67 * 4 + lVar98) =
                     *(float *)(lVar85 + uVar67 * 4) +
                     *(float *)((long)pvVar79 + uVar67 * 4 + lVar98);
                uVar67 = uVar67 + 1;
              } while (uVar43 != uVar67);
            }
            uVar100 = uVar100 + 1;
            lVar85 = lVar85 + (long)iVar83 * 4 + 0x40;
          } while (uVar100 != uVar41);
          return;
        }
        if (params->type != GGML_TASK_INIT) {
          uVar43 = pgVar7->ne[1];
          uVar75 = pgVar5->ne[1];
          local_2b0._0_4_ = (int)pgVar7->nb[3];
          iVar51 = (int)pgVar5->nb[1];
          local_240._0_4_ = (undefined4)pgVar7->nb[2];
          iVar55 = (int)pgVar5->nb[2];
          iVar70 = (int)pgVar5->nb[3];
          if (iVar42 < iVar94) {
            uVar86 = pgVar5->ne[3];
            if ((int)uVar86 < 1) {
              return;
            }
            iVar42 = pgVar5->ne[0];
            uVar90 = pgVar5->ne[2];
            sVar12 = pgVar5->nb[0];
            iVar68 = (int)(uVar41 + iVar42 + -1) / (int)uVar41;
            iVar69 = iVar68 * iVar72;
            iVar68 = iVar68 + iVar69;
            if (iVar42 <= iVar68) {
              iVar68 = iVar42;
            }
            pvVar64 = params->wdata;
            lVar85 = (long)((iVar83 + 0x10) * iVar72);
            uVar41 = uVar43 & 0xffffffe0;
            lVar96 = (long)(int)uVar41;
            lVar98 = (long)(int)uVar43;
            if ((long)(int)uVar43 < lVar96 + 1) {
              lVar98 = lVar96 + 1;
            }
            lVar91 = (lVar98 - lVar96) + -1;
            auVar172._8_8_ = lVar91;
            auVar172._0_8_ = lVar91;
            auVar172._16_8_ = lVar91;
            auVar172._24_8_ = lVar91;
            iVar42 = iVar69 * iVar94;
            iVar72 = 0;
            auVar197 = vpmovsxbq_avx2(ZEXT416(0x3020100));
            auVar207 = vpmovsxbq_avx2(ZEXT416(0x7060504));
            auVar158._8_8_ = 0x8000000000000000;
            auVar158._0_8_ = 0x8000000000000000;
            auVar158._16_8_ = 0x8000000000000000;
            auVar158._24_8_ = 0x8000000000000000;
            auVar130 = vpcmpeqd_avx2(auVar130,auVar130);
            local_2a8 = 0;
            do {
              if (0 < (int)uVar90) {
                iVar83 = 0;
                local_300 = 0;
                iVar45 = iVar42;
                do {
                  if (0 < (int)uVar75) {
                    lVar91 = (long)pvVar64 +
                             (long)iVar83 * 4 + (long)iVar72 * 4 + lVar96 * 4 + lVar85 * 4;
                    lVar99 = (long)pvVar64 + (long)iVar83 * 4 + (long)iVar72 * 4 + lVar85 * 4;
                    local_360 = 0;
                    do {
                      if (iVar69 < iVar68) {
                        lVar57 = (long)iVar69;
                        iVar52 = iVar45;
                        do {
                          local_390 = (int)sVar12;
                          pvVar79 = pgVar7->data;
                          uVar93 = *(undefined4 *)
                                    ((long)pgVar5->data +
                                    (long)((int)lVar57 * local_390 +
                                          (int)local_360 * iVar51 +
                                          (int)local_300 * iVar55 + (int)local_2a8 * iVar70));
                          auVar193._4_4_ = uVar93;
                          auVar193._0_4_ = uVar93;
                          auVar193._8_4_ = uVar93;
                          auVar193._12_4_ = uVar93;
                          auVar193._16_4_ = uVar93;
                          auVar193._20_4_ = uVar93;
                          auVar193._24_4_ = uVar93;
                          auVar193._28_4_ = uVar93;
                          if (0 < (int)uVar41) {
                            lVar71 = (long)pvVar79 + (long)iVar52;
                            uVar100 = 0;
                            lVar95 = lVar99;
                            do {
                              lVar47 = 0;
                              do {
                                auVar108 = vfmadd213ps_fma(*(undefined1 (*) [32])(lVar71 + lVar47),
                                                           auVar193,*(undefined1 (*) [32])
                                                                     (lVar95 + lVar47));
                                *(undefined1 (*) [32])(lVar95 + lVar47) = ZEXT1632(auVar108);
                                lVar47 = lVar47 + 0x20;
                              } while (lVar47 != 0x80);
                              uVar100 = uVar100 + 0x20;
                              lVar95 = lVar95 + 0x80;
                              lVar71 = lVar71 + 0x80;
                            } while (uVar100 < uVar41);
                          }
                          if (uVar41 != uVar43) {
                            auVar194._4_4_ = uVar93;
                            auVar194._0_4_ = uVar93;
                            auVar194._8_4_ = uVar93;
                            auVar194._12_4_ = uVar93;
                            auVar194._16_4_ = uVar93;
                            auVar194._20_4_ = uVar93;
                            auVar194._24_4_ = uVar93;
                            auVar194._28_4_ = uVar93;
                            uVar100 = 0;
                            do {
                              auVar202._8_8_ = uVar100;
                              auVar202._0_8_ = uVar100;
                              auVar202._16_8_ = uVar100;
                              auVar202._24_8_ = uVar100;
                              auVar211 = vpor_avx2(auVar202,auVar197);
                              auVar131 = vpor_avx2(auVar202,auVar207);
                              auVar131 = vpcmpgtq_avx2(auVar131 ^ auVar158,auVar172 ^ auVar158);
                              auVar211 = vpcmpgtq_avx2(auVar211 ^ auVar158,auVar172 ^ auVar158);
                              auVar131 = vpackssdw_avx2(auVar211,auVar131);
                              auVar108 = vpackssdw_avx(SUB3216(auVar131 ^ auVar130,0),
                                                       SUB3216(auVar131 ^ auVar130,0x10));
                              auVar108 = vpshufd_avx(auVar108,0xd8);
                              auVar131 = vpmovzxwd_avx2(auVar108);
                              auVar221 = vpslld_avx2(auVar131,0x1f);
                              auVar131 = vmaskmovps_avx(auVar221,*(undefined1 (*) [32])
                                                                  ((long)pvVar79 +
                                                                  uVar100 * 4 +
                                                                  (long)iVar52 + lVar96 * 4));
                              auVar211 = vmaskmovps_avx(auVar221,*(undefined1 (*) [32])
                                                                  (lVar91 + uVar100 * 4));
                              auVar108 = vfmadd231ps_fma(auVar211,auVar194,auVar131);
                              auVar131 = vmaskmovps_avx(auVar221,ZEXT1632(auVar108));
                              *(undefined1 (*) [32])(lVar91 + uVar100 * 4) = auVar131;
                              uVar100 = uVar100 + 8;
                            } while (((lVar98 - lVar96) + 7U & 0xfffffffffffffff8) != uVar100);
                          }
                          lVar57 = lVar57 + 1;
                          iVar52 = iVar52 + iVar94;
                        } while (lVar57 != iVar68);
                      }
                      local_360 = local_360 + 1;
                      lVar99 = lVar99 + (long)iVar44 * 4;
                      lVar91 = lVar91 + (long)iVar44 * 4;
                    } while (local_360 != uVar75);
                  }
                  local_300 = local_300 + 1;
                  iVar83 = iVar83 + iVar82;
                  iVar45 = iVar45 + local_240._0_4_;
                } while (local_300 != uVar90);
              }
              local_2a8 = local_2a8 + 1;
              iVar72 = iVar72 + iVar76 * iVar50 * iVar44;
              iVar42 = iVar42 + (int)local_2b0;
            } while (local_2a8 != uVar86);
            return;
          }
          iVar50 = pgVar7->ne[2] * uVar43;
          iVar76 = pgVar7->ne[3] * iVar50;
          iVar44 = (int)(iVar76 + uVar41 + -1) / (int)uVar41;
          iVar72 = iVar72 * iVar44;
          iVar44 = iVar44 + iVar72;
          if (iVar76 <= iVar44) {
            iVar44 = iVar76;
          }
          if (iVar44 <= iVar72) {
            return;
          }
          uVar41 = pgVar7->ne[0];
          sVar13 = tensor->nb[0];
          sVar12 = tensor->nb[1];
          sVar14 = tensor->nb[2];
          sVar9 = tensor->nb[3];
          uVar86 = uVar41 & 0xffffffe0;
          auVar108 = ZEXT816(0);
          do {
            if (0 < (int)uVar75) {
              iVar82 = iVar72 / iVar50;
              uVar100 = (ulong)(uint)((int)((long)iVar72 % (long)iVar50) >> 0x1f) << 0x20 |
                        (long)iVar72 % (long)iVar50 & 0xffffffffU;
              pvVar64 = tensor->data;
              iVar94 = (int)((long)uVar100 % (long)(int)uVar43);
              iVar76 = (int)((long)uVar100 / (long)(int)uVar43);
              lVar98 = (long)(iVar82 * (int)local_2b0 + iVar94 * iVar42 + iVar76 * local_240._0_4_)
                       + (long)pgVar7->data;
              pvVar79 = pgVar5->data;
              iVar83 = iVar82 * iVar70 + iVar76 * iVar55;
              uVar100 = 0;
              do {
                lVar85 = (long)iVar83 + (long)pvVar79;
                local_1a0 = ZEXT1632(auVar108);
                _local_1c0 = ZEXT1632(auVar108);
                _local_1e0 = ZEXT1632(auVar108);
                _local_200 = ZEXT1632(auVar108);
                if (0 < (int)uVar86) {
                  uVar67 = 0;
                  lVar96 = lVar98;
                  lVar91 = lVar85;
                  do {
                    lVar99 = 0;
                    do {
                      auVar122 = vfmadd213ps_fma(*(undefined1 (*) [32])(lVar91 + lVar99),
                                                 *(undefined1 (*) [32])(lVar96 + lVar99),
                                                 *(undefined1 (*) [32])(local_200 + lVar99));
                      *(undefined1 (*) [32])(local_200 + lVar99) = ZEXT1632(auVar122);
                      lVar99 = lVar99 + 0x20;
                    } while (lVar99 != 0x80);
                    uVar67 = uVar67 + 0x20;
                    lVar91 = lVar91 + 0x80;
                    lVar96 = lVar96 + 0x80;
                  } while (uVar67 < uVar86);
                }
                local_370._0_4_ = (int)sVar12;
                lVar96 = 0;
                do {
                  fVar102 = *(float *)(local_1e0 + lVar96 + 4);
                  fVar3 = *(float *)(local_1e0 + lVar96 + 8);
                  fVar214 = *(float *)(local_1e0 + lVar96 + 0xc);
                  fVar25 = *(float *)(local_1e0 + lVar96 + 0x10);
                  fVar26 = *(float *)(local_1e0 + lVar96 + 0x14);
                  fVar27 = *(float *)(local_1e0 + lVar96 + 0x18);
                  fVar28 = *(float *)(local_1e0 + lVar96 + 0x1c);
                  *(float *)(local_200 + lVar96) =
                       *(float *)(local_200 + lVar96) + *(float *)(local_1e0 + lVar96);
                  *(float *)(local_200 + lVar96 + 4) = *(float *)(local_200 + lVar96 + 4) + fVar102;
                  *(float *)(local_200 + lVar96 + 8) = *(float *)(local_200 + lVar96 + 8) + fVar3;
                  *(float *)(local_200 + lVar96 + 0xc) =
                       *(float *)(local_200 + lVar96 + 0xc) + fVar214;
                  *(float *)(local_200 + lVar96 + 0x10) =
                       *(float *)(local_200 + lVar96 + 0x10) + fVar25;
                  *(float *)(local_200 + lVar96 + 0x14) =
                       *(float *)(local_200 + lVar96 + 0x14) + fVar26;
                  *(float *)(local_200 + lVar96 + 0x18) =
                       *(float *)(local_200 + lVar96 + 0x18) + fVar27;
                  *(float *)(local_200 + lVar96 + 0x1c) =
                       *(float *)(local_200 + lVar96 + 0x1c) + fVar28;
                  lVar96 = lVar96 + 0x40;
                } while (lVar96 == 0x40);
                auVar128._0_4_ =
                     (float)local_200 + (float)local_1c0 + afStack_1fc[3] + afStack_1bc[3];
                auVar128._4_4_ = afStack_1fc[0] + afStack_1bc[0] + afStack_1fc[0] + afStack_1bc[0];
                auVar128._8_4_ = afStack_1fc[1] + afStack_1bc[1] + afStack_1fc[5] + afStack_1bc[5];
                auVar128._12_4_ = afStack_1fc[2] + afStack_1bc[2] + afStack_1fc[6] + afStack_1bc[6];
                auVar122 = vhaddps_avx(auVar128,auVar128);
                auVar122 = vhaddps_avx(auVar122,auVar122);
                fVar102 = auVar122._0_4_;
                lVar96 = (long)(int)uVar86;
                if (uVar86 != uVar41) {
                  do {
                    fVar102 = fVar102 + *(float *)(lVar98 + lVar96 * 4) *
                                        *(float *)(lVar85 + lVar96 * 4);
                    lVar96 = lVar96 + 1;
                  } while (lVar96 < (int)uVar41);
                }
                *(float *)((long)pvVar64 +
                          (long)((int)uVar100 * (int)local_370 +
                                iVar82 * (int)sVar9 + iVar94 * (int)sVar13 + iVar76 * (int)sVar14))
                     = fVar102;
                uVar100 = uVar100 + 1;
                iVar83 = iVar83 + iVar51;
              } while (uVar100 != uVar75);
            }
            iVar72 = iVar72 + 1;
          } while (iVar72 != iVar44);
          return;
        }
        if (iVar94 <= iVar42) {
          return;
        }
        __n = params->wsize;
        pvVar64 = params->wdata;
LAB_0012b121:
        memset(pvVar64,0,__n);
        return;
      }
    }
    if (((ggml_tensor *)tensor_00)->nb[0] == 4) {
      uVar41 = ((ggml_tensor *)tensor_00)->ne[0];
      lVar98 = (long)(int)uVar41;
      if (((ggml_tensor *)tensor_00)->nb[1] != (lVar98 * 4U) / 1) goto LAB_0012f15f;
      iVar44 = ((ggml_tensor *)tensor_00)->ne[1];
      if ((((ggml_tensor *)tensor_00)->nb[2] != ((ggml_tensor *)tensor_00)->nb[1] * (long)iVar44) ||
         (iVar76 = ((ggml_tensor *)tensor_00)->ne[2],
         ((ggml_tensor *)tensor_00)->nb[3] != ((ggml_tensor *)tensor_00)->nb[2] * (long)iVar76))
      goto LAB_0012f15f;
      if (tensor->nb[0] != GGML_TYPE_SIZE[tensor->type]) goto LAB_0012f164;
      if (tensor->nb[1] !=
          (tensor->nb[0] * (long)tensor->ne[0]) / (ulong)(long)GGML_BLCK_SIZE[tensor->type])
      goto LAB_0012f164;
      if ((tensor->nb[2] != tensor->nb[1] * (long)tensor->ne[1]) ||
         (tensor->nb[3] != tensor->nb[2] * (long)tensor->ne[2])) goto LAB_0012f164;
      if ((uVar41 == tensor->ne[0]) &&
         (((iVar44 == tensor->ne[1] && (iVar76 == tensor->ne[2])) &&
          (((ggml_tensor *)tensor_00)->ne[3] == tensor->ne[3])))) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        iVar76 = iVar76 * iVar44 * ((ggml_tensor *)tensor_00)->ne[3];
        iVar44 = (iVar76 + params->nth + -1) / params->nth;
        lVar85 = (long)params->ith * (long)iVar44;
        iVar44 = iVar44 + (int)lVar85;
        if (iVar76 <= iVar44) {
          iVar44 = iVar76;
        }
        if (iVar44 <= (int)lVar85) {
          return;
        }
        uVar43 = uVar41 & 0xffffffe0;
        lVar96 = (long)(int)uVar43;
        if (lVar98 < lVar96 + 1) {
          lVar98 = lVar96 + 1;
        }
        lVar91 = (lVar98 - lVar96) + -1;
        auVar115._8_8_ = lVar91;
        auVar115._0_8_ = lVar91;
        auVar115._16_8_ = lVar91;
        auVar115._24_8_ = lVar91;
        auVar207 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar131 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar130 = vpcmpeqd_avx2(auVar197,auVar197);
        do {
          sVar12 = tensor->nb[1];
          pvVar64 = tensor->data;
          fVar102 = -INFINITY;
          if (0 < (int)uVar41) {
            uVar100 = 0;
            auVar108 = ZEXT816(0xfff0000000000000);
            do {
              auVar208._0_8_ = (double)*(float *)((long)pvVar64 + uVar100 * 4 + sVar12 * lVar85);
              auVar208._8_8_ = uVar226;
              auVar108 = vmaxsd_avx(auVar108,auVar208);
              uVar100 = uVar100 + 1;
            } while (uVar41 != uVar100);
            fVar102 = (float)auVar108._0_8_;
          }
          if ((int)uVar41 < 1) {
            auVar212 = ZEXT1664(ZEXT816(0));
          }
          else {
            auVar212 = ZEXT1664(ZEXT816(0));
            uVar100 = 0;
            do {
              fVar3 = *(float *)((long)pvVar64 + uVar100 * 4 + sVar12 * lVar85);
              fVar214 = 0.0;
              if (-INFINITY < fVar3) {
                auVar108 = vcvtps2ph_f16c(ZEXT416((uint)(fVar3 - fVar102)),0);
                uVar93 = vpextrw_avx(auVar108,0);
                unaff_R13 = (ulong)table_exp_f16[CONCAT44((int)(unaff_R13 >> 0x20),uVar93)];
                fVar214 = table_f32_f16[unaff_R13];
                auVar212 = ZEXT864((ulong)(auVar212._0_8_ + (double)fVar214));
              }
              *(float *)((long)pvVar64 + uVar100 * 4 + sVar12 * lVar85) = fVar214;
              uVar100 = uVar100 + 1;
            } while (uVar41 != uVar100);
          }
          fVar102 = (float)(1.0 / auVar212._0_8_);
          if (0 < (int)uVar43) {
            pvVar79 = (void *)(sVar12 * lVar85 + (long)pvVar64);
            uVar100 = 0;
            do {
              lVar91 = 0;
              do {
                pfVar88 = (float *)((long)pvVar79 + lVar91);
                auVar213._0_4_ = fVar102 * *pfVar88;
                auVar213._4_4_ = fVar102 * pfVar88[1];
                auVar213._8_4_ = fVar102 * pfVar88[2];
                auVar213._12_4_ = fVar102 * pfVar88[3];
                auVar213._16_4_ = fVar102 * pfVar88[4];
                auVar213._20_4_ = fVar102 * pfVar88[5];
                auVar213._28_36_ = auVar212._28_36_;
                auVar213._24_4_ = fVar102 * pfVar88[6];
                auVar212 = ZEXT3264(auVar213._0_32_);
                *(undefined1 (*) [32])((long)pvVar79 + lVar91) = auVar213._0_32_;
                lVar91 = lVar91 + 0x20;
              } while (lVar91 != 0x80);
              uVar100 = uVar100 + 0x20;
              pvVar79 = (void *)((long)pvVar79 + 0x80);
              unaff_R13 = 0;
            } while (uVar100 < uVar43);
          }
          if (uVar43 != uVar41) {
            lVar91 = sVar12 * lVar85 + lVar96 * 4;
            uVar100 = 0;
            do {
              auVar210._8_8_ = uVar100;
              auVar210._0_8_ = uVar100;
              auVar210._16_8_ = uVar100;
              auVar210._24_8_ = uVar100;
              auVar211 = vpor_avx2(auVar210,auVar207);
              auVar197 = vpor_avx2(auVar210,auVar131);
              auVar217._8_8_ = 0x8000000000000000;
              auVar217._0_8_ = 0x8000000000000000;
              auVar217._16_8_ = 0x8000000000000000;
              auVar217._24_8_ = 0x8000000000000000;
              auVar197 = vpcmpgtq_avx2(auVar197 ^ auVar217,auVar217 ^ auVar115);
              auVar211 = vpcmpgtq_avx2(auVar211 ^ auVar217,auVar217 ^ auVar115);
              auVar197 = vpackssdw_avx2(auVar211,auVar197);
              auVar108 = vpackssdw_avx(SUB3216(auVar197 ^ auVar130,0),
                                       SUB3216(auVar197 ^ auVar130,0x10));
              auVar108 = vpshufd_avx(auVar108,0xd8);
              auVar197 = vpmovzxwd_avx2(auVar108);
              auVar211 = vpslld_avx2(auVar197,0x1f);
              auVar197 = vmaskmovps_avx(auVar211,*(undefined1 (*) [32])
                                                  ((long)pvVar64 + uVar100 * 4 + lVar91));
              auVar18._4_4_ = auVar197._4_4_ * fVar102;
              auVar18._0_4_ = auVar197._0_4_ * fVar102;
              auVar18._8_4_ = auVar197._8_4_ * fVar102;
              auVar18._12_4_ = auVar197._12_4_ * fVar102;
              auVar18._16_4_ = auVar197._16_4_ * fVar102;
              auVar18._20_4_ = auVar197._20_4_ * fVar102;
              auVar18._24_4_ = auVar197._24_4_ * fVar102;
              auVar18._28_4_ = auVar197._28_4_;
              auVar197 = vmaskmovps_avx(auVar211,auVar18);
              *(undefined1 (*) [32])((long)pvVar64 + uVar100 * 4 + lVar91) = auVar197;
              uVar100 = uVar100 + 8;
            } while (((lVar98 - lVar96) + 7U & 0xfffffffffffffff8) != uVar100);
          }
          lVar85 = lVar85 + 1;
        } while (lVar85 != iVar44);
        return;
      }
    }
    else {
LAB_0012f15f:
      ggml_compute_forward_cold_14();
LAB_0012f164:
      ggml_compute_forward_cold_15();
LAB_0012f169:
      ggml_compute_forward_cold_132();
LAB_0012f16e:
      ggml_compute_forward_cold_133();
LAB_0012f173:
      ggml_compute_forward_cold_136();
LAB_0012f178:
      ggml_compute_forward_cold_137();
LAB_0012f17d:
      ggml_compute_forward_cold_30();
LAB_0012f182:
      ggml_compute_forward_cold_81();
    }
    ggml_compute_forward_cold_16();
LAB_0012f18c:
    ggml_compute_forward_cold_134();
LAB_0012f191:
    ggml_compute_forward_cold_138();
switchD_001270fa_caseD_23:
    ggml_compute_forward_cold_77();
switchD_001276f1_caseD_2:
    ggml_compute_forward_cold_18();
switchD_001280eb_caseD_2:
    ggml_compute_forward_cold_83();
switchD_00127800_caseD_6:
    ggml_compute_forward_cold_57();
LAB_0012f1aa:
    ggml_compute_forward_cold_58();
LAB_0012f1af:
    ggml_compute_forward_cold_59();
LAB_0012f1b4:
    ggml_compute_forward_cold_60();
LAB_0012f1b9:
    ggml_compute_forward_cold_61();
LAB_0012f1be:
    ggml_compute_forward_cold_62();
LAB_0012f1c3:
    ggml_compute_forward_cold_63();
LAB_0012f1c8:
    ggml_compute_forward_cold_64();
LAB_0012f1cd:
    ggml_compute_forward_cold_65();
LAB_0012f1d2:
    ggml_compute_forward_cold_66();
LAB_0012f1d7:
    ggml_compute_forward_cold_67();
LAB_0012f1dc:
    ggml_compute_forward_cold_68();
LAB_0012f1e1:
    ggml_compute_forward_cold_69();
LAB_0012f1e6:
    ggml_compute_forward_cold_70();
LAB_0012f1eb:
    ggml_compute_forward_cold_71();
LAB_0012f1f0:
    ggml_compute_forward_cold_72();
LAB_0012f1f5:
    ggml_compute_forward_cold_73();
LAB_0012f1fa:
    ggml_compute_forward_cold_76();
LAB_0012f1ff:
    ggml_compute_forward_cold_75();
LAB_0012f204:
    ggml_compute_forward_cold_74();
LAB_0012f209:
    ggml_compute_forward_cold_44();
LAB_0012f20e:
    ggml_compute_forward_cold_45();
LAB_0012f213:
    ggml_compute_forward_cold_46();
LAB_0012f218:
    ggml_compute_forward_cold_47();
LAB_0012f21d:
    ggml_compute_forward_cold_48();
LAB_0012f222:
    ggml_compute_forward_cold_49();
LAB_0012f227:
    ggml_compute_forward_cold_50();
LAB_0012f22c:
    ggml_compute_forward_cold_51();
LAB_0012f231:
    ggml_compute_forward_cold_52();
LAB_0012f236:
    ggml_compute_forward_cold_55();
LAB_0012f23b:
    ggml_compute_forward_cold_54();
LAB_0012f240:
    ggml_compute_forward_cold_53();
LAB_0012f245:
    ggml_compute_forward_cold_25();
LAB_0012f24a:
    ggml_compute_forward_cold_26();
LAB_0012f24f:
    ggml_compute_forward_cold_27();
LAB_0012f254:
    ggml_compute_forward_cold_28();
LAB_0012f259:
    ggml_compute_forward_cold_29();
LAB_0012f25e:
    ggml_compute_forward_cold_7();
LAB_0012f263:
    ggml_compute_forward_cold_8();
LAB_0012f268:
    ggml_compute_forward_cold_9();
LAB_0012f26d:
    ggml_compute_forward_cold_10();
LAB_0012f272:
    ggml_compute_forward_cold_11();
LAB_0012f277:
    ggml_compute_forward_cold_20();
LAB_0012f27c:
    ggml_compute_forward_cold_21();
LAB_0012f281:
    ggml_compute_forward_cold_22();
LAB_0012f286:
    ggml_compute_forward_cold_23();
LAB_0012f28b:
    ggml_compute_forward_cold_24();
LAB_0012f290:
    ggml_compute_forward_cold_2();
LAB_0012f295:
    ggml_compute_forward_cold_3();
LAB_0012f29a:
    ggml_compute_forward_cold_4();
LAB_0012f29f:
    ggml_compute_forward_cold_5();
LAB_0012f2a4:
    ggml_compute_forward_cold_6();
LAB_0012f2a9:
    ggml_compute_forward_cold_32();
LAB_0012f2ae:
    ggml_compute_forward_cold_33();
LAB_0012f2b3:
    ggml_compute_forward_cold_34();
LAB_0012f2b8:
    ggml_compute_forward_cold_35();
LAB_0012f2bd:
    ggml_compute_forward_cold_36();
LAB_0012f2c2:
    ggml_compute_forward_cold_37();
LAB_0012f2c7:
    ggml_compute_forward_cold_38();
LAB_0012f2cc:
    ggml_compute_forward_cold_39();
LAB_0012f2d1:
    ggml_compute_forward_cold_40();
LAB_0012f2d6:
    ggml_compute_forward_cold_43();
LAB_0012f2db:
    ggml_compute_forward_cold_42();
LAB_0012f2e0:
    ggml_compute_forward_cold_41();
LAB_0012f2e5:
    ggml_compute_forward_cold_112();
LAB_0012f2ea:
    ggml_compute_forward_cold_113();
LAB_0012f2ef:
    ggml_compute_forward_cold_114();
LAB_0012f2f4:
    ggml_compute_forward_cold_115();
LAB_0012f2f9:
    ggml_compute_forward_cold_116();
LAB_0012f2fe:
    ggml_compute_forward_cold_117();
LAB_0012f303:
    ggml_compute_forward_cold_124();
LAB_0012f308:
    ggml_compute_forward_cold_123();
LAB_0012f30d:
    ggml_compute_forward_cold_122();
LAB_0012f312:
    ggml_compute_forward_cold_118();
LAB_0012f317:
    ggml_compute_forward_cold_119();
LAB_0012f31c:
    ggml_compute_forward_cold_120();
LAB_0012f321:
    ggml_compute_forward_cold_121();
    params = (ggml_compute_params *)tensor_00;
LAB_0012f326:
    ggml_compute_forward_cold_84();
LAB_0012f32b:
    ggml_compute_forward_cold_85();
LAB_0012f330:
    ggml_compute_forward_cold_86();
LAB_0012f335:
    ggml_compute_forward_cold_87();
LAB_0012f33a:
    ggml_compute_forward_cold_88();
LAB_0012f33f:
    ggml_compute_forward_cold_89();
LAB_0012f344:
    ggml_compute_forward_cold_98();
LAB_0012f349:
    ggml_compute_forward_cold_97();
LAB_0012f34e:
    ggml_compute_forward_cold_96();
LAB_0012f353:
    ggml_compute_forward_cold_90();
LAB_0012f358:
    ggml_compute_forward_cold_91();
LAB_0012f35d:
    ggml_compute_forward_cold_92();
LAB_0012f362:
    ggml_compute_forward_cold_93();
    tensor_00 = (size_t *)params;
LAB_0012f367:
    ggml_compute_forward_cold_99();
LAB_0012f36c:
    ggml_compute_forward_cold_100();
LAB_0012f371:
    ggml_compute_forward_cold_101();
LAB_0012f376:
    ggml_compute_forward_cold_102();
LAB_0012f37b:
    ggml_compute_forward_cold_103();
LAB_0012f380:
    ggml_compute_forward_cold_104();
LAB_0012f385:
    ggml_compute_forward_cold_111();
LAB_0012f38a:
    ggml_compute_forward_cold_110();
LAB_0012f38f:
    ggml_compute_forward_cold_109();
LAB_0012f394:
    ggml_compute_forward_cold_105();
LAB_0012f399:
    ggml_compute_forward_cold_106();
LAB_0012f39e:
    ggml_compute_forward_cold_107();
    goto LAB_0012f3a3;
  case GGML_OP_SQR:
    goto switchD_001270fa_caseD_6;
  case GGML_OP_SQRT:
    goto switchD_001270fa_caseD_7;
  case GGML_OP_SUM:
    goto switchD_001270fa_caseD_8;
  case GGML_OP_MEAN:
    goto switchD_001270fa_caseD_9;
  case GGML_OP_REPEAT:
    goto switchD_001270fa_caseD_a;
  case GGML_OP_SGN:
    tensor_00 = (size_t *)tensor->src0;
    gVar4 = ((ggml_tensor *)tensor_00)->type;
    if (gVar4 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
        return;
      }
      uVar41 = ((ggml_tensor *)tensor_00)->ne[2] * ((ggml_tensor *)tensor_00)->ne[1] *
               ((ggml_tensor *)tensor_00)->ne[3];
      if ((int)uVar41 < 1) {
        return;
      }
      uVar43 = ((ggml_tensor *)tensor_00)->ne[0];
      sVar12 = tensor->nb[1];
      pvVar64 = tensor->data;
      pvVar79 = ((ggml_tensor *)tensor_00)->data;
      sVar13 = ((ggml_tensor *)tensor_00)->nb[1];
      uVar100 = 0;
      auVar148._8_4_ = 0x3f800000;
      auVar148._0_8_ = 0x3f8000003f800000;
      auVar148._12_4_ = 0x3f800000;
      do {
        if (0 < (int)uVar43) {
          uVar67 = 0;
          do {
            auVar122 = ZEXT416(*(uint *)((long)pvVar79 + uVar67 * 4));
            auVar108 = vcmpss_avx(auVar122,ZEXT816(0) << 0x40,1);
            auVar108 = vandps_avx(auVar108,SUB6416(ZEXT464(0xbf800000),0));
            auVar122 = vcmpss_avx(ZEXT816(0) << 0x40,auVar122,1);
            auVar108 = vblendvps_avx(auVar108,auVar148,auVar122);
            *(int *)((long)pvVar64 + uVar67 * 4) = auVar108._0_4_;
            uVar67 = uVar67 + 1;
          } while (uVar43 != uVar67);
        }
        uVar100 = uVar100 + 1;
        pvVar64 = (void *)((long)pvVar64 + sVar12);
        pvVar79 = (void *)((long)pvVar79 + sVar13);
      } while (uVar100 != uVar41);
      return;
    }
    if ((GGML_TYPE_F16 < gVar4) && (gVar4 != GGML_TYPE_COUNT)) {
      return;
    }
    ggml_compute_forward_cold_142();
  case GGML_OP_RMS_NORM:
    pgVar7 = tensor->src0;
    gVar4 = pgVar7->type;
    if (gVar4 == GGML_TYPE_F32) {
      uVar41 = pgVar7->ne[0];
      if (uVar41 != tensor->ne[0]) goto LAB_0012f15a;
      iVar44 = pgVar7->ne[1];
      if (iVar44 != tensor->ne[1]) goto LAB_0012f15a;
      uVar43 = pgVar7->ne[2];
      if (uVar43 != tensor->ne[2]) goto LAB_0012f15a;
      uVar75 = pgVar7->ne[3];
      if (uVar75 != tensor->ne[3]) goto LAB_0012f15a;
      if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
        return;
      }
      if (pgVar7->nb[0] == 4) {
        if ((int)uVar75 < 1) {
          return;
        }
        lVar99 = (long)(int)uVar41;
        sVar12 = pgVar7->nb[1];
        sVar13 = pgVar7->nb[2];
        sVar14 = tensor->nb[1];
        lVar96 = (long)params->nth;
        iVar76 = params->ith;
        lVar91 = (long)iVar76;
        uVar86 = uVar41 & 0xffffffe0;
        lVar85 = (long)(int)uVar86;
        lVar98 = lVar99;
        if (lVar99 < lVar85 + 1) {
          lVar98 = lVar85 + 1;
        }
        lVar57 = (lVar98 - lVar85) + -1;
        auVar114._8_8_ = lVar57;
        auVar114._0_8_ = lVar57;
        auVar114._16_8_ = lVar57;
        auVar114._24_8_ = lVar57;
        local_290 = sVar12 * lVar91;
        local_2a0 = sVar14 * lVar91;
        local_298 = local_2a0 + lVar85 * 4;
        auVar132._8_8_ = 0x8000000000000000;
        auVar132._0_8_ = 0x8000000000000000;
        auVar132._16_8_ = 0x8000000000000000;
        auVar132._24_8_ = 0x8000000000000000;
        sVar9 = pgVar7->nb[3];
        sVar10 = tensor->nb[2];
        sVar11 = tensor->nb[3];
        local_2b8 = 0;
        do {
          if (0 < (int)uVar43) {
            local_308 = local_298;
            local_2e8 = local_2a0;
            local_318 = local_290;
            local_2f8 = 0;
            do {
              if (iVar76 < iVar44) {
                lVar57 = local_308;
                uVar100 = local_318;
                lVar71 = local_2e8;
                lVar95 = lVar91;
                do {
                  if ((int)uVar41 < 1) {
                    dVar103 = 0.0;
                  }
                  else {
                    dVar103 = 0.0;
                    uVar67 = 0;
                    do {
                      fVar102 = *(float *)((long)pgVar7->data + uVar67 * 4 + uVar100);
                      dVar103 = dVar103 + (double)(fVar102 * fVar102);
                      uVar67 = uVar67 + 1;
                    } while (uVar41 != uVar67);
                  }
                  pvVar64 = tensor->data;
                  auVar130 = ZEXT1632(in_ZMM7._0_16_);
                  memcpy((void *)(lVar95 * sVar14 + local_2f8 * sVar10 + local_2b8 * sVar11 +
                                 (long)pvVar64),
                         (void *)((long)pgVar7->data +
                                 lVar95 * sVar12 + local_2f8 * sVar13 + local_2b8 * sVar9),
                         lVar99 * 4);
                  dVar103 = dVar103 / (double)(int)uVar41 + 9.999999747378752e-06;
                  if (dVar103 < 0.0) {
                    dVar103 = sqrt(dVar103);
                  }
                  else {
                    auVar106._8_8_ = 0;
                    auVar106._0_8_ = dVar103;
                    auVar108 = vsqrtsd_avx(auVar106,auVar106);
                    dVar103 = auVar108._0_8_;
                  }
                  auVar197 = vpmovsxbq_avx2(ZEXT416(0x3020100));
                  auVar207 = vpmovsxbq_avx2(ZEXT416(0x7060504));
                  auVar130 = vpcmpeqd_avx2(auVar130,auVar130);
                  in_ZMM7 = ZEXT3264(auVar130);
                  auVar212 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                  fVar102 = (float)(1.0 / dVar103);
                  if (0 < (int)uVar86) {
                    lVar47 = (long)pvVar64 + lVar71;
                    uVar67 = 0;
                    do {
                      lVar63 = 0;
                      do {
                        pfVar88 = (float *)(lVar47 + lVar63);
                        auVar143._0_4_ = fVar102 * *pfVar88;
                        auVar143._4_4_ = fVar102 * pfVar88[1];
                        auVar143._8_4_ = fVar102 * pfVar88[2];
                        auVar143._12_4_ = fVar102 * pfVar88[3];
                        auVar143._16_4_ = fVar102 * pfVar88[4];
                        auVar143._20_4_ = fVar102 * pfVar88[5];
                        auVar143._28_36_ = auVar212._28_36_;
                        auVar143._24_4_ = fVar102 * pfVar88[6];
                        auVar212 = ZEXT3264(auVar143._0_32_);
                        *(undefined1 (*) [32])(lVar47 + lVar63) = auVar143._0_32_;
                        lVar63 = lVar63 + 0x20;
                      } while (lVar63 != 0x80);
                      uVar67 = uVar67 + 0x20;
                      lVar47 = lVar47 + 0x80;
                    } while (uVar67 < uVar86);
                  }
                  if (uVar86 != uVar41) {
                    uVar67 = 0;
                    do {
                      auVar133._8_8_ = uVar67;
                      auVar133._0_8_ = uVar67;
                      auVar133._16_8_ = uVar67;
                      auVar133._24_8_ = uVar67;
                      auVar211 = vpor_avx2(auVar133,auVar197);
                      auVar131 = vpor_avx2(auVar133,auVar207);
                      auVar131 = vpcmpgtq_avx2(auVar131 ^ auVar132,auVar114 ^ auVar132);
                      auVar211 = vpcmpgtq_avx2(auVar211 ^ auVar132,auVar114 ^ auVar132);
                      auVar131 = vpackssdw_avx2(auVar211,auVar131);
                      auVar108 = vpackssdw_avx(SUB3216(auVar131 ^ auVar130,0),
                                               SUB3216(auVar131 ^ auVar130,0x10));
                      auVar108 = vpshufd_avx(auVar108,0xd8);
                      auVar131 = vpmovzxwd_avx2(auVar108);
                      auVar211 = vpslld_avx2(auVar131,0x1f);
                      auVar131 = vmaskmovps_avx(auVar211,*(undefined1 (*) [32])
                                                          ((long)pvVar64 + uVar67 * 4 + lVar57));
                      auVar17._4_4_ = auVar131._4_4_ * fVar102;
                      auVar17._0_4_ = auVar131._0_4_ * fVar102;
                      auVar17._8_4_ = auVar131._8_4_ * fVar102;
                      auVar17._12_4_ = auVar131._12_4_ * fVar102;
                      auVar17._16_4_ = auVar131._16_4_ * fVar102;
                      auVar17._20_4_ = auVar131._20_4_ * fVar102;
                      auVar17._24_4_ = auVar131._24_4_ * fVar102;
                      auVar17._28_4_ = auVar131._28_4_;
                      auVar131 = vmaskmovps_avx(auVar211,auVar17);
                      *(undefined1 (*) [32])((long)pvVar64 + uVar67 * 4 + lVar57) = auVar131;
                      uVar67 = uVar67 + 8;
                    } while (((lVar98 - lVar85) + 7U & 0xfffffffffffffff8) != uVar67);
                  }
                  lVar95 = lVar95 + lVar96;
                  uVar100 = uVar100 + sVar12 * lVar96;
                  lVar71 = lVar71 + sVar14 * lVar96;
                  lVar57 = lVar57 + sVar14 * lVar96;
                } while (lVar95 < iVar44);
              }
              local_2f8 = local_2f8 + 1;
              local_318 = local_318 + sVar13;
              local_2e8 = local_2e8 + sVar10;
              local_308 = local_308 + sVar10;
            } while (local_2f8 != uVar43);
          }
          local_2b8 = local_2b8 + 1;
          local_290 = local_290 + sVar9;
          local_2a0 = local_2a0 + sVar11;
          local_298 = local_298 + sVar11;
        } while (local_2b8 != uVar75);
        return;
      }
      goto LAB_0012f3ad;
    }
    if ((GGML_TYPE_F16 < gVar4) && (gVar4 != GGML_TYPE_COUNT)) {
      return;
    }
    ggml_compute_forward_cold_125();
switchD_001270fa_caseD_2:
    pgVar7 = tensor->src0;
    gVar4 = pgVar7->type;
    if (gVar4 != GGML_TYPE_F32) {
      if ((GGML_TYPE_F16 < gVar4) && (gVar4 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_152();
switchD_001270fa_caseD_22:
      pgVar7 = tensor->src1;
      switch(pgVar7->type) {
      case GGML_TYPE_Q4_0:
      case GGML_TYPE_Q4_1:
      case GGML_TYPE_I8:
      case GGML_TYPE_I16:
      case GGML_TYPE_I32:
      case GGML_TYPE_COUNT:
        goto switchD_00127800_caseD_0;
      case GGML_TYPE_F16:
        pgVar5 = tensor->src0;
        uVar41 = pgVar5->ne[0];
        if (tensor->ne[0] != uVar41) goto LAB_0012f1aa;
        iVar44 = pgVar5->ne[1];
        if (tensor->ne[1] != iVar44) goto LAB_0012f1af;
        if (tensor->ne[2] != pgVar5->ne[2]) goto LAB_0012f1b4;
        if ((int)pgVar5->nb[0] != 2) goto LAB_0012f1b9;
        if ((int)pgVar7->nb[0] != 2) goto LAB_0012f1be;
        pgVar6 = tensor->opt[0];
        if ((int)pgVar6->nb[0] != 4) goto LAB_0012f1c3;
        pgVar8 = tensor->opt[1];
        if ((int)pgVar8->nb[0] != 2) goto LAB_0012f1c8;
        tensor_00 = (size_t *)tensor->opt[2];
        if ((int)((ggml_tensor *)tensor_00)->nb[0] != 4) goto LAB_0012f1cd;
        if (pgVar7->ne[0] != uVar41) goto LAB_0012f1d2;
        uVar43 = pgVar7->ne[1];
        if (pgVar6->ne[0] != uVar43) goto LAB_0012f1d7;
        if (pgVar6->ne[1] != 1) goto LAB_0012f1dc;
        uVar100 = (ulong)uVar43;
        if (pgVar8->ne[0] != uVar43) goto LAB_0012f1e1;
        uVar75 = pgVar8->ne[1];
        if (uVar75 != uVar41) goto LAB_0012f1e6;
        if (((ggml_tensor *)tensor_00)->ne[0] != uVar41) goto LAB_0012f1eb;
        if (((ggml_tensor *)tensor_00)->ne[1] != 1) goto LAB_0012f1f0;
        if ((int)tensor->nb[0] != 4) goto LAB_0012f1f5;
        iVar76 = (int)tensor->nb[1];
        if (iVar76 < 4) goto LAB_0012f1fa;
        iVar50 = (int)tensor->nb[2];
        if (iVar50 < iVar76) goto LAB_0012f1ff;
        iVar94 = (int)tensor->nb[3];
        if (iVar50 <= iVar94) {
          if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
            return;
          }
          iVar82 = pgVar5->ne[2] * iVar44;
          iVar72 = pgVar5->ne[3] * iVar82;
          iVar42 = (iVar72 + params->nth + -1) / params->nth;
          iVar83 = iVar42 * params->ith;
          iVar42 = iVar42 + iVar83;
          if (iVar72 <= iVar42) {
            iVar42 = iVar72;
          }
          if (iVar42 <= iVar83) {
            return;
          }
          sVar14 = pgVar5->nb[1];
          sVar9 = pgVar5->nb[2];
          sVar10 = pgVar5->nb[3];
          sVar12 = pgVar7->nb[1];
          sVar11 = pgVar7->nb[2];
          sVar38 = pgVar7->nb[3];
          sVar13 = pgVar8->nb[1];
          lVar85 = ((long)(int)(uVar43 * 2) + 0x10) * (long)params->ith;
          pvVar64 = params->wdata;
          uVar86 = uVar41 & 0xffffffe0;
          pvVar79 = pgVar6->data;
          uVar90 = uVar43 & 0xffffffe0;
          pvVar78 = tensor->data;
          pvVar97 = ((ggml_tensor *)tensor_00)->data;
          auVar108 = ZEXT816(0) << 0x40;
          sVar39 = pgVar8->nb[2];
          sVar40 = pgVar8->nb[3];
          lVar98 = (long)pvVar64 + (long)(int)uVar43 * 4 + lVar85 * 4;
          do {
            iVar72 = iVar83 / iVar82;
            uVar67 = (ulong)(uint)((int)((long)iVar83 % (long)iVar82) >> 0x1f) << 0x20 |
                     (long)iVar83 % (long)iVar82 & 0xffffffffU;
            iVar55 = (int)((long)uVar67 % (long)iVar44);
            iVar51 = (int)((long)uVar67 / (long)iVar44);
            auVar130 = ZEXT1632(auVar108);
            if (0 < (int)uVar43) {
              pvVar49 = pgVar7->data;
              iVar70 = iVar72 * (int)sVar38 + iVar51 * (int)sVar11;
              lVar96 = (long)(iVar72 * (int)sVar10 + iVar55 * (int)sVar14 + iVar51 * (int)sVar9) +
                       (long)pgVar5->data;
              uVar67 = 0;
              do {
                lVar91 = (long)iVar70 + (long)pvVar49;
                local_1a0 = ZEXT1632(auVar108);
                _local_1c0 = ZEXT1632(auVar108);
                _local_1e0 = auVar130;
                _local_200 = auVar130;
                if (0 < (int)uVar86) {
                  uVar58 = 0;
                  lVar99 = lVar91;
                  lVar57 = lVar96;
                  do {
                    lVar71 = 0;
                    do {
                      auVar197 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar99 + lVar71));
                      auVar207 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar57 + lVar71));
                      auVar122 = vfmadd213ps_fma(auVar207,auVar197,
                                                 *(undefined1 (*) [32])(local_200 + lVar71 * 2));
                      *(undefined1 (*) [32])(local_200 + lVar71 * 2) = ZEXT1632(auVar122);
                      lVar71 = lVar71 + 0x10;
                    } while (lVar71 != 0x40);
                    uVar58 = uVar58 + 0x20;
                    lVar57 = lVar57 + 0x40;
                    lVar99 = lVar99 + 0x40;
                  } while (uVar58 < uVar86);
                }
                lVar99 = 0;
                do {
                  fVar102 = *(float *)(local_1e0 + lVar99 + 4);
                  fVar3 = *(float *)(local_1e0 + lVar99 + 8);
                  fVar214 = *(float *)(local_1e0 + lVar99 + 0xc);
                  fVar25 = *(float *)(local_1e0 + lVar99 + 0x10);
                  fVar26 = *(float *)(local_1e0 + lVar99 + 0x14);
                  fVar27 = *(float *)(local_1e0 + lVar99 + 0x18);
                  fVar28 = *(float *)(local_1e0 + lVar99 + 0x1c);
                  *(float *)(local_200 + lVar99) =
                       *(float *)(local_200 + lVar99) + *(float *)(local_1e0 + lVar99);
                  *(float *)(local_200 + lVar99 + 4) = *(float *)(local_200 + lVar99 + 4) + fVar102;
                  *(float *)(local_200 + lVar99 + 8) = *(float *)(local_200 + lVar99 + 8) + fVar3;
                  *(float *)(local_200 + lVar99 + 0xc) =
                       *(float *)(local_200 + lVar99 + 0xc) + fVar214;
                  *(float *)(local_200 + lVar99 + 0x10) =
                       *(float *)(local_200 + lVar99 + 0x10) + fVar25;
                  *(float *)(local_200 + lVar99 + 0x14) =
                       *(float *)(local_200 + lVar99 + 0x14) + fVar26;
                  *(float *)(local_200 + lVar99 + 0x18) =
                       *(float *)(local_200 + lVar99 + 0x18) + fVar27;
                  *(float *)(local_200 + lVar99 + 0x1c) =
                       *(float *)(local_200 + lVar99 + 0x1c) + fVar28;
                  lVar99 = lVar99 + 0x40;
                } while (lVar99 == 0x40);
                auVar121._0_4_ =
                     (float)local_200 + (float)local_1c0 + afStack_1fc[3] + afStack_1bc[3];
                auVar121._4_4_ = afStack_1fc[0] + afStack_1bc[0] + afStack_1fc[0] + afStack_1bc[0];
                auVar121._8_4_ = afStack_1fc[1] + afStack_1bc[1] + afStack_1fc[5] + afStack_1bc[5];
                auVar121._12_4_ = afStack_1fc[2] + afStack_1bc[2] + afStack_1fc[6] + afStack_1bc[6];
                auVar122 = vhaddps_avx(auVar121,auVar121);
                auVar122 = vhaddps_avx(auVar122,auVar122);
                fVar102 = auVar122._0_4_;
                lVar99 = (long)(int)uVar86;
                if (uVar86 != uVar41) {
                  do {
                    fVar102 = fVar102 + table_f32_f16[*(ushort *)(lVar91 + lVar99 * 2)] *
                                        table_f32_f16[*(ushort *)(lVar96 + lVar99 * 2)];
                    lVar99 = lVar99 + 1;
                  } while (lVar99 < (int)uVar41);
                }
                *(float *)((long)pvVar64 + uVar67 * 4 + lVar85 * 4) = fVar102;
                uVar67 = uVar67 + 1;
                local_360._0_4_ = (int)sVar12;
                iVar70 = iVar70 + (int)local_360;
              } while (uVar67 != uVar100);
              uVar67 = 0;
              do {
                *(float *)((long)pvVar64 + uVar67 * 4 + lVar85 * 4) =
                     *(float *)((long)pvVar64 + uVar67 * 4 + lVar85 * 4) +
                     *(float *)((long)pvVar79 + uVar67 * 4);
                uVar67 = uVar67 + 1;
              } while (uVar100 != uVar67);
              uVar67 = 0;
              do {
                auVar122 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pvVar64 + uVar67 * 4 + lVar85 * 4)
                                                 ),0);
                vpextrw_avx(auVar122,0);
                uVar67 = uVar67 + 1;
              } while (uVar100 != uVar67);
              uVar67 = 0;
              do {
                *(ggml_fp16_t *)(lVar98 + uVar67 * 2) =
                     table_gelu_f16[*(ushort *)(lVar98 + uVar67 * 2)];
                uVar67 = uVar67 + 1;
              } while (uVar100 != uVar67);
            }
            if (0 < (int)uVar75) {
              pvVar49 = pgVar8->data;
              iVar70 = iVar72 * (int)sVar40 + iVar51 * (int)sVar39;
              uVar67 = 0;
              do {
                lVar96 = (long)iVar70 + (long)pvVar49;
                local_1a0 = auVar130;
                _local_1c0 = auVar130;
                _local_1e0 = auVar130;
                _local_200 = auVar130;
                if (0 < (int)uVar90) {
                  uVar58 = 0;
                  lVar91 = lVar98;
                  lVar99 = lVar96;
                  do {
                    lVar57 = 0;
                    do {
                      auVar197 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar99 + lVar57));
                      auVar207 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar91 + lVar57));
                      auVar122 = vfmadd213ps_fma(auVar207,auVar197,
                                                 *(undefined1 (*) [32])(local_200 + lVar57 * 2));
                      *(undefined1 (*) [32])(local_200 + lVar57 * 2) = ZEXT1632(auVar122);
                      lVar57 = lVar57 + 0x10;
                    } while (lVar57 != 0x40);
                    uVar58 = uVar58 + 0x20;
                    lVar91 = lVar91 + 0x40;
                    lVar99 = lVar99 + 0x40;
                  } while (uVar58 < uVar90);
                }
                lVar91 = 0;
                do {
                  fVar102 = *(float *)(local_1e0 + lVar91 + 4);
                  fVar3 = *(float *)(local_1e0 + lVar91 + 8);
                  fVar214 = *(float *)(local_1e0 + lVar91 + 0xc);
                  fVar25 = *(float *)(local_1e0 + lVar91 + 0x10);
                  fVar26 = *(float *)(local_1e0 + lVar91 + 0x14);
                  fVar27 = *(float *)(local_1e0 + lVar91 + 0x18);
                  fVar28 = *(float *)(local_1e0 + lVar91 + 0x1c);
                  *(float *)(local_200 + lVar91) =
                       *(float *)(local_200 + lVar91) + *(float *)(local_1e0 + lVar91);
                  *(float *)(local_200 + lVar91 + 4) = *(float *)(local_200 + lVar91 + 4) + fVar102;
                  *(float *)(local_200 + lVar91 + 8) = *(float *)(local_200 + lVar91 + 8) + fVar3;
                  *(float *)(local_200 + lVar91 + 0xc) =
                       *(float *)(local_200 + lVar91 + 0xc) + fVar214;
                  *(float *)(local_200 + lVar91 + 0x10) =
                       *(float *)(local_200 + lVar91 + 0x10) + fVar25;
                  *(float *)(local_200 + lVar91 + 0x14) =
                       *(float *)(local_200 + lVar91 + 0x14) + fVar26;
                  *(float *)(local_200 + lVar91 + 0x18) =
                       *(float *)(local_200 + lVar91 + 0x18) + fVar27;
                  *(float *)(local_200 + lVar91 + 0x1c) =
                       *(float *)(local_200 + lVar91 + 0x1c) + fVar28;
                  lVar91 = lVar91 + 0x40;
                } while (lVar91 == 0x40);
                auVar123._0_4_ =
                     (float)local_200 + (float)local_1c0 + afStack_1fc[3] + afStack_1bc[3];
                auVar123._4_4_ = afStack_1fc[0] + afStack_1bc[0] + afStack_1fc[0] + afStack_1bc[0];
                auVar123._8_4_ = afStack_1fc[1] + afStack_1bc[1] + afStack_1fc[5] + afStack_1bc[5];
                auVar123._12_4_ = afStack_1fc[2] + afStack_1bc[2] + afStack_1fc[6] + afStack_1bc[6];
                auVar122 = vhaddps_avx(auVar123,auVar123);
                auVar122 = vhaddps_avx(auVar122,auVar122);
                fVar102 = auVar122._0_4_;
                lVar91 = (long)(int)uVar90;
                if (uVar90 != uVar43) {
                  do {
                    fVar102 = fVar102 + table_f32_f16[*(ushort *)(lVar96 + lVar91 * 2)] *
                                        table_f32_f16[*(ushort *)(lVar98 + lVar91 * 2)];
                    lVar91 = lVar91 + 1;
                  } while (lVar91 < (int)uVar43);
                }
                *(float *)((long)pvVar78 +
                          (long)(iVar72 * iVar94 + iVar55 * iVar76 + iVar51 * iVar50 +
                                (int)uVar67 * 4)) = fVar102;
                uVar67 = uVar67 + 1;
                local_350._0_4_ = (int)sVar13;
                iVar70 = iVar70 + (int)local_350;
              } while (uVar67 != uVar75);
            }
            if (0 < (int)uVar75) {
              iVar72 = iVar72 * iVar94 + iVar55 * iVar76 + iVar51 * iVar50;
              uVar67 = 0;
              do {
                *(float *)((long)pvVar78 + uVar67 * 4 + (long)iVar72) =
                     *(float *)((long)pvVar78 + uVar67 * 4 + (long)iVar72) +
                     *(float *)((long)pvVar97 + uVar67 * 4);
                uVar67 = uVar67 + 1;
              } while (uVar75 != uVar67);
            }
            iVar83 = iVar83 + 1;
          } while (iVar83 != iVar42);
          return;
        }
        break;
      case GGML_TYPE_F32:
        goto switchD_00127800_caseD_6;
      default:
        goto switchD_001270fa_caseD_17;
      }
      goto LAB_0012f204;
    }
    tensor_00 = (size_t *)tensor->src1;
    uVar41 = pgVar7->ne[0];
    if (((((uVar41 != ((ggml_tensor *)tensor_00)->ne[0]) ||
          (iVar44 = pgVar7->ne[1], iVar44 != ((ggml_tensor *)tensor_00)->ne[1])) ||
         (iVar76 = pgVar7->ne[2], iVar76 != ((ggml_tensor *)tensor_00)->ne[2])) ||
        ((iVar50 = pgVar7->ne[3], iVar50 != ((ggml_tensor *)tensor_00)->ne[3] ||
         (uVar41 != tensor->ne[0])))) ||
       ((iVar44 != tensor->ne[1] || ((iVar76 != tensor->ne[2] || (iVar50 != tensor->ne[3])))))) {
LAB_0012f128:
      ggml_compute_forward_cold_153();
switchD_00127800_caseD_0:
      ggml_compute_forward_cold_56();
switchD_001271b9_caseD_0:
      ggml_compute_forward_cold_12();
      goto switchD_001274fb_caseD_0;
    }
    if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
      return;
    }
    if (tensor->nb[0] == 4) {
      if (pgVar7->nb[0] == 4) {
        iVar94 = params->ith;
        lVar98 = (long)iVar94;
        iVar42 = params->nth;
        lVar85 = (long)iVar42;
        iVar50 = iVar76 * iVar44 * iVar50;
        sVar12 = pgVar7->nb[1];
        sVar13 = ((ggml_tensor *)tensor_00)->nb[0];
        sVar14 = ((ggml_tensor *)tensor_00)->nb[1];
        sVar9 = tensor->nb[1];
        if (sVar13 != 4) {
          if (iVar50 <= iVar94) {
            return;
          }
          pvVar64 = (void *)(sVar9 * lVar98 + (long)tensor->data);
          pvVar79 = (void *)(sVar12 * lVar98 + (long)pgVar7->data);
          lVar96 = sVar14 * lVar98;
          do {
            if (0 < (int)uVar41) {
              pfVar88 = (float *)((long)((ggml_tensor *)tensor_00)->data + lVar96);
              uVar100 = 0;
              do {
                *(float *)((long)pvVar64 + uVar100 * 4) =
                     *(float *)((long)pvVar79 + uVar100 * 4) + *pfVar88;
                uVar100 = uVar100 + 1;
                pfVar88 = (float *)((long)pfVar88 + sVar13);
              } while (uVar41 != uVar100);
            }
            lVar98 = lVar98 + lVar85;
            pvVar64 = (void *)((long)pvVar64 + sVar9 * lVar85);
            pvVar79 = (void *)((long)pvVar79 + sVar12 * lVar85);
            lVar96 = lVar96 + sVar14 * lVar85;
          } while (lVar98 < iVar50);
          return;
        }
        iVar76 = (iVar50 / iVar42) * iVar94;
        iVar44 = (iVar94 + 1) * (iVar50 / iVar42);
        if (iVar94 == iVar42 + -1) {
          iVar44 = iVar50;
        }
        if (iVar44 <= iVar76) {
          return;
        }
        lVar98 = (long)iVar76;
        pvVar64 = (void *)(sVar9 * lVar98 + (long)tensor->data);
        pvVar79 = (void *)(sVar14 * lVar98 + (long)((ggml_tensor *)tensor_00)->data);
        pvVar78 = (void *)(sVar12 * lVar98 + (long)pgVar7->data);
        do {
          if (0 < (int)uVar41) {
            uVar100 = 0;
            do {
              *(float *)((long)pvVar64 + uVar100 * 4) =
                   *(float *)((long)pvVar78 + uVar100 * 4) + *(float *)((long)pvVar79 + uVar100 * 4)
              ;
              uVar100 = uVar100 + 1;
            } while (uVar41 != uVar100);
          }
          lVar98 = lVar98 + 1;
          pvVar64 = (void *)((long)pvVar64 + sVar9);
          pvVar79 = (void *)((long)pvVar79 + sVar14);
          pvVar78 = (void *)((long)pvVar78 + sVar12);
        } while (lVar98 != iVar44);
        return;
      }
      goto LAB_0012f3b7;
    }
    goto LAB_0012f3b2;
  case GGML_OP_NEG:
switchD_001270fa_caseD_d:
    tensor_00 = (size_t *)tensor->src0;
    gVar4 = ((ggml_tensor *)tensor_00)->type;
    if (gVar4 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
        return;
      }
      uVar41 = ((ggml_tensor *)tensor_00)->ne[2] * ((ggml_tensor *)tensor_00)->ne[1] *
               ((ggml_tensor *)tensor_00)->ne[3];
      if ((int)uVar41 < 1) {
        return;
      }
      uVar43 = ((ggml_tensor *)tensor_00)->ne[0];
      sVar12 = tensor->nb[1];
      pvVar64 = tensor->data;
      pvVar79 = ((ggml_tensor *)tensor_00)->data;
      sVar13 = ((ggml_tensor *)tensor_00)->nb[1];
      uVar100 = 0;
      do {
        if (0 < (int)uVar43) {
          uVar67 = 0;
          do {
            *(uint *)((long)pvVar64 + uVar67 * 4) =
                 *(uint *)((long)pvVar79 + uVar67 * 4) ^ 0x80000000;
            uVar67 = uVar67 + 1;
          } while (uVar43 != uVar67);
        }
        uVar100 = uVar100 + 1;
        pvVar64 = (void *)((long)pvVar64 + sVar12);
        pvVar79 = (void *)((long)pvVar79 + sVar13);
      } while (uVar100 != uVar41);
      return;
    }
    if ((GGML_TYPE_F16 < gVar4) && (gVar4 != GGML_TYPE_COUNT)) {
      return;
    }
    ggml_compute_forward_cold_141();
  case GGML_OP_ROPE:
    pgVar7 = tensor->src0;
    if (GGML_TYPE_COUNT < pgVar7->type) {
      return;
    }
    switch(pgVar7->type) {
    default:
      goto switchD_001271b9_caseD_0;
    case GGML_TYPE_F16:
      if (((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) &&
         (iVar44 = pgVar7->ne[3], 0 < (long)iVar44)) {
        iVar76 = pgVar7->ne[2];
        uVar41 = pgVar7->ne[1];
        sVar12 = pgVar7->nb[3];
        lVar98 = (long)(int)pgVar7->nb[2];
        sVar13 = pgVar7->nb[1];
        piVar15 = (int *)tensor->src1->data;
        iVar50 = piVar15[1];
        iVar94 = piVar15[2];
        iVar42 = iVar94;
        if (iVar94 != 0) {
          iVar42 = *piVar15;
        }
        local_310 = 0;
        iVar72 = *piVar15;
        if (iVar94 != 0) {
          iVar72 = 0;
        }
        sVar14 = pgVar7->nb[0];
        lVar85 = iVar42 * lVar98 + 2;
        do {
          local_340 = lVar85;
          local_338 = (long)iVar42;
          if (iVar42 < iVar76) {
            do {
              if (0 < (int)uVar41) {
                local_350 = local_340;
                uVar100 = 0;
                do {
                  if (0 < iVar50) {
                    iVar94 = 0;
                    lVar91 = 0;
                    lVar96 = local_350;
                    do {
                      dVar103 = pow(10000.0,(double)iVar94 / (double)iVar50);
                      dVar103 = dVar103 * (double)(iVar72 + (int)local_338);
                      dVar119 = cos(dVar103);
                      auVar225._0_8_ = sin(dVar103);
                      auVar225._8_56_ = extraout_var;
                      auVar120._0_8_ =
                           (double)table_f32_f16[*(ushort *)((long)pgVar7->data + lVar96 + -2)];
                      auVar120._8_8_ = in_ZMM5._8_8_;
                      auVar176._8_8_ = 0;
                      auVar176._0_8_ = dVar119;
                      auVar167._8_8_ = 0;
                      auVar167._0_8_ =
                           auVar225._0_8_ *
                           (double)table_f32_f16[*(ushort *)((long)pgVar7->data + lVar96)];
                      auVar108 = vfmsub231sd_fma(auVar167,auVar120,auVar176);
                      auVar168._0_4_ = (float)auVar108._0_8_;
                      auVar168._4_12_ = auVar108._4_12_;
                      auVar108 = vcvtps2ph_f16c(auVar168,0);
                      vpextrw_avx(auVar108,0);
                      auVar145._8_8_ = 0;
                      auVar145._0_8_ =
                           dVar119 * (double)table_f32_f16[*(ushort *)((long)pgVar7->data + lVar96)]
                      ;
                      auVar108 = vfmadd231sd_fma(auVar145,auVar120,auVar225._0_16_);
                      auVar146._0_4_ = (float)auVar108._0_8_;
                      auVar146._4_12_ = auVar108._4_12_;
                      auVar108 = vcvtps2ph_f16c(auVar146,0);
                      vpextrw_avx(auVar108,0);
                      lVar91 = lVar91 + 2;
                      lVar96 = lVar96 + (long)(int)sVar14 * 2;
                      iVar94 = iVar94 + -2;
                    } while (lVar91 < iVar50);
                  }
                  uVar100 = uVar100 + 1;
                  local_350 = local_350 + (int)sVar13;
                } while (uVar100 != uVar41);
              }
              local_338 = local_338 + 1;
              local_340 = local_340 + lVar98;
            } while (local_338 != iVar76);
          }
          local_310 = local_310 + 1;
          lVar85 = lVar85 + (int)sVar12;
        } while (local_310 != iVar44);
      }
      break;
    case GGML_TYPE_F32:
      if (((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) &&
         (iVar44 = pgVar7->ne[3], 0 < (long)iVar44)) {
        iVar76 = pgVar7->ne[2];
        uVar41 = pgVar7->ne[1];
        sVar12 = pgVar7->nb[3];
        lVar98 = (long)(int)pgVar7->nb[2];
        sVar13 = pgVar7->nb[1];
        sVar14 = pgVar7->nb[0];
        piVar15 = (int *)tensor->src1->data;
        iVar50 = piVar15[1];
        iVar94 = piVar15[2];
        iVar42 = iVar94;
        if (iVar94 != 0) {
          iVar42 = *piVar15;
        }
        local_310 = 0;
        iVar72 = *piVar15;
        if (iVar94 != 0) {
          iVar72 = 0;
        }
        lVar85 = iVar42 * lVar98 + 4;
        do {
          local_340 = lVar85;
          local_338 = (long)iVar42;
          if (iVar42 < iVar76) {
            do {
              if (0 < (int)uVar41) {
                local_350 = local_340;
                uVar100 = 0;
                do {
                  if (0 < iVar50) {
                    iVar94 = 0;
                    lVar91 = 0;
                    lVar96 = local_350;
                    do {
                      dVar103 = pow(10000.0,(double)iVar94 / (double)iVar50);
                      dVar103 = dVar103 * (double)(iVar72 + (int)local_338);
                      dVar119 = cos(dVar103);
                      auVar223._0_8_ = sin(dVar103);
                      auVar223._8_56_ = extraout_var_00;
                      pvVar64 = tensor->data;
                      auVar124._0_8_ = (double)*(float *)((long)pgVar7->data + lVar96 + -4);
                      auVar124._8_8_ = in_ZMM5._8_8_;
                      dVar103 = (double)*(float *)((long)pgVar7->data + lVar96);
                      auVar177._8_8_ = 0;
                      auVar177._0_8_ = dVar119;
                      auVar169._8_8_ = 0;
                      auVar169._0_8_ = auVar223._0_8_ * dVar103;
                      auVar108 = vfmsub231sd_fma(auVar169,auVar124,auVar177);
                      *(float *)((long)pvVar64 + lVar96 + -4) = (float)auVar108._0_8_;
                      auVar149._8_8_ = 0;
                      auVar149._0_8_ = dVar119 * dVar103;
                      auVar108 = vfmadd231sd_fma(auVar149,auVar124,auVar223._0_16_);
                      *(float *)((long)pvVar64 + lVar96) = (float)auVar108._0_8_;
                      lVar91 = lVar91 + 2;
                      lVar96 = lVar96 + (long)(int)sVar14 * 2;
                      iVar94 = iVar94 + -2;
                    } while (lVar91 < iVar50);
                  }
                  uVar100 = uVar100 + 1;
                  local_350 = local_350 + (int)sVar13;
                } while (uVar100 != uVar41);
              }
              local_338 = local_338 + 1;
              local_340 = local_340 + lVar98;
            } while (local_338 != iVar76);
          }
          local_310 = local_310 + 1;
          lVar85 = lVar85 + (int)sVar12;
        } while (local_310 != iVar44);
      }
    }
    break;
  case GGML_OP_STEP:
    goto switchD_001270fa_caseD_e;
  case GGML_OP_RELU:
    goto switchD_001270fa_caseD_f;
  case GGML_OP_GELU:
    goto switchD_001270fa_caseD_10;
  case GGML_OP_SILU:
    goto switchD_001270fa_caseD_11;
  case GGML_OP_NORM:
    pgVar7 = tensor->src0;
    gVar4 = pgVar7->type;
    if (gVar4 != GGML_TYPE_F32) {
      if ((GGML_TYPE_F16 < gVar4) && (gVar4 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_128();
      goto switchD_001270fa_caseD_15;
    }
    uVar41 = pgVar7->ne[0];
    if (uVar41 != tensor->ne[0]) goto LAB_0012f146;
    iVar44 = pgVar7->ne[1];
    tensor_00 = (size_t *)(long)iVar44;
    if (iVar44 != tensor->ne[1]) goto LAB_0012f146;
    uVar43 = pgVar7->ne[2];
    if (uVar43 != tensor->ne[2]) goto LAB_0012f146;
    uVar75 = pgVar7->ne[3];
    if (uVar75 != tensor->ne[3]) goto LAB_0012f146;
    if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
      return;
    }
    if (pgVar7->nb[0] == 4) {
      if ((int)uVar75 < 1) {
        return;
      }
      sVar12 = pgVar7->nb[1];
      sVar13 = pgVar7->nb[2];
      sVar14 = pgVar7->nb[3];
      sVar9 = tensor->nb[2];
      sVar10 = tensor->nb[3];
      lVar91 = (long)params->nth;
      iVar76 = params->ith;
      lVar96 = (long)iVar76;
      uVar86 = uVar41 & 0xffffffe0;
      lVar85 = (long)(int)uVar86;
      lVar98 = (long)(int)uVar41;
      if ((long)(int)uVar41 < lVar85 + 1) {
        lVar98 = lVar85 + 1;
      }
      lVar99 = (lVar98 - lVar85) + -1;
      auVar197._8_8_ = lVar99;
      auVar197._0_8_ = lVar99;
      auVar197._16_8_ = lVar99;
      auVar197._24_8_ = lVar99;
      local_240._0_8_ = sVar12 * lVar96;
      local_2f8 = tensor->nb[1] * lVar96;
      lVar99 = tensor->nb[1] * lVar91;
      local_308 = local_2f8 + lVar85 * 4;
      auVar130 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar212 = ZEXT3264(auVar130);
      auVar130 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar223 = ZEXT3264(auVar130);
      auVar130 = vpcmpeqd_avx2(in_ZMM12._0_32_,in_ZMM12._0_32_);
      auVar225 = ZEXT3264(auVar130);
      local_318 = 0;
      do {
        if (0 < (int)uVar43) {
          uVar67 = 0;
          lVar57 = local_308;
          uVar100 = local_2f8;
          lVar71 = local_240._0_8_;
          do {
            lVar95 = lVar96;
            lVar47 = lVar57;
            lVar63 = uVar100;
            lVar87 = lVar71;
            if (iVar76 < iVar44) {
              do {
                pvVar64 = pgVar7->data;
                dVar103 = 0.0;
                auVar143 = ZEXT864(0) << 0x40;
                if (0 < (int)uVar41) {
                  uVar58 = 0;
                  do {
                    auVar143 = ZEXT864((ulong)(auVar143._0_8_ +
                                              (double)*(float *)((long)pvVar64 + uVar58 * 4 + lVar87
                                                                )));
                    uVar58 = uVar58 + 1;
                  } while (uVar41 != uVar58);
                }
                pvVar79 = tensor->data;
                if (0 < (int)uVar41) {
                  dVar119 = auVar143._0_8_ / (double)(int)uVar41;
                  auVar143 = ZEXT1664(CONCAT88(auVar143._8_8_,dVar119));
                  auVar118 = ZEXT1664((undefined1  [16])0x0);
                  uVar58 = 0;
                  do {
                    dVar103 = (double)*(float *)((long)pvVar64 + uVar58 * 4 + lVar87) - dVar119;
                    *(float *)((long)pvVar79 + uVar58 * 4 + lVar63) = (float)dVar103;
                    auVar147._8_8_ = 0;
                    auVar147._0_8_ = dVar103;
                    auVar108 = vfmadd231sd_fma(auVar118._0_16_,auVar147,auVar147);
                    auVar118 = ZEXT1664(auVar108);
                    dVar103 = auVar108._0_8_;
                    uVar58 = uVar58 + 1;
                  } while (uVar41 != uVar58);
                }
                dVar103 = dVar103 / (double)(int)uVar41 + 9.999999747378752e-06;
                auVar105._8_8_ = 0;
                auVar105._0_8_ = dVar103;
                if (dVar103 < 0.0) {
                  auVar143 = ZEXT1664(auVar143._0_16_);
                  auVar130 = ZEXT1632(auVar225._0_16_);
                  dVar103 = sqrt(dVar103);
                  auVar130 = vpcmpeqd_avx2(auVar130,auVar130);
                  auVar225 = ZEXT3264(auVar130);
                  auVar130 = vpmovsxbq_avx2(ZEXT416(0x7060504));
                  auVar223 = ZEXT3264(auVar130);
                  auVar130 = vpmovsxbq_avx2(ZEXT416(0x3020100));
                  auVar212 = ZEXT3264(auVar130);
                }
                else {
                  auVar108 = vsqrtsd_avx(auVar105,auVar105);
                  dVar103 = auVar108._0_8_;
                }
                fVar102 = (float)(1.0 / dVar103);
                if (0 < (int)uVar86) {
                  lVar46 = (long)pvVar79 + lVar63;
                  uVar58 = 0;
                  do {
                    lVar62 = 0;
                    do {
                      pfVar88 = (float *)(lVar46 + lVar62);
                      auVar118._0_4_ = fVar102 * *pfVar88;
                      auVar118._4_4_ = fVar102 * pfVar88[1];
                      auVar118._8_4_ = fVar102 * pfVar88[2];
                      auVar118._12_4_ = fVar102 * pfVar88[3];
                      auVar118._16_4_ = fVar102 * pfVar88[4];
                      auVar118._20_4_ = fVar102 * pfVar88[5];
                      auVar118._28_36_ = auVar143._28_36_;
                      auVar118._24_4_ = fVar102 * pfVar88[6];
                      auVar143 = ZEXT3264(auVar118._0_32_);
                      *(undefined1 (*) [32])(lVar46 + lVar62) = auVar118._0_32_;
                      lVar62 = lVar62 + 0x20;
                    } while (lVar62 != 0x80);
                    uVar58 = uVar58 + 0x20;
                    lVar46 = lVar46 + 0x80;
                  } while (uVar58 < uVar86);
                }
                if (uVar86 != uVar41) {
                  uVar58 = 0;
                  do {
                    auVar130._8_8_ = uVar58;
                    auVar130._0_8_ = uVar58;
                    auVar130._16_8_ = uVar58;
                    auVar130._24_8_ = uVar58;
                    auVar207 = vpor_avx2(auVar212._0_32_,auVar130);
                    auVar130 = vpor_avx2(auVar223._0_32_,auVar130);
                    auVar201._8_8_ = 0x8000000000000000;
                    auVar201._0_8_ = 0x8000000000000000;
                    auVar201._16_8_ = 0x8000000000000000;
                    auVar201._24_8_ = 0x8000000000000000;
                    auVar130 = vpcmpgtq_avx2(auVar130 ^ auVar201,auVar197 ^ auVar201);
                    auVar207 = vpcmpgtq_avx2(auVar207 ^ auVar201,auVar197 ^ auVar201);
                    auVar130 = vpackssdw_avx2(auVar207,auVar130);
                    auVar130 = auVar225._0_32_ ^ auVar130;
                    auVar108 = vpackssdw_avx(auVar130._0_16_,auVar130._16_16_);
                    auVar108 = vpshufd_avx(auVar108,0xd8);
                    auVar130 = vpmovzxwd_avx2(auVar108);
                    auVar131 = vpslld_avx2(auVar130,0x1f);
                    auVar130 = vmaskmovps_avx(auVar131,*(undefined1 (*) [32])
                                                        ((long)pvVar79 + uVar58 * 4 + lVar47));
                    auVar207._4_4_ = auVar130._4_4_ * fVar102;
                    auVar207._0_4_ = auVar130._0_4_ * fVar102;
                    auVar207._8_4_ = auVar130._8_4_ * fVar102;
                    auVar207._12_4_ = auVar130._12_4_ * fVar102;
                    auVar207._16_4_ = auVar130._16_4_ * fVar102;
                    auVar207._20_4_ = auVar130._20_4_ * fVar102;
                    auVar207._24_4_ = auVar130._24_4_ * fVar102;
                    auVar207._28_4_ = auVar130._28_4_;
                    auVar130 = vmaskmovps_avx(auVar131,auVar207);
                    *(undefined1 (*) [32])((long)pvVar79 + uVar58 * 4 + lVar47) = auVar130;
                    uVar58 = uVar58 + 8;
                  } while (((lVar98 - lVar85) + 7U & 0xfffffffffffffff8) != uVar58);
                }
                lVar95 = lVar95 + lVar91;
                lVar87 = lVar87 + sVar12 * lVar91;
                lVar63 = lVar63 + lVar99;
                lVar47 = lVar47 + lVar99;
              } while (lVar95 < (long)tensor_00);
            }
            uVar67 = uVar67 + 1;
            lVar71 = lVar71 + sVar13;
            uVar100 = uVar100 + sVar9;
            lVar57 = lVar57 + sVar9;
          } while (uVar67 != uVar43);
        }
        local_318 = local_318 + 1;
        local_240._0_8_ = local_240._0_8_ + sVar14;
        local_2f8 = local_2f8 + sVar10;
        local_308 = local_308 + sVar10;
      } while (local_318 != uVar75);
      return;
    }
    goto LAB_0012f3a8;
  case GGML_OP_MUL_MAT:
    goto switchD_001270fa_caseD_14;
  case GGML_OP_SCALE:
switchD_001270fa_caseD_15:
    tensor_00 = (size_t *)tensor->src0;
    gVar4 = ((ggml_tensor *)tensor_00)->type;
    if (gVar4 != GGML_TYPE_F32) {
      if ((GGML_TYPE_F16 < gVar4) && (gVar4 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_78();
      goto switchD_001270fa_caseD_d;
    }
    if (((ggml_tensor *)tensor_00)->nb[0] != 4) goto LAB_0012f14b;
    uVar41 = ((ggml_tensor *)tensor_00)->ne[0];
    lVar98 = (long)(int)uVar41;
    if (((ggml_tensor *)tensor_00)->nb[1] != (lVar98 * 4U) / 1) goto LAB_0012f14b;
    iVar44 = ((ggml_tensor *)tensor_00)->ne[1];
    if ((((ggml_tensor *)tensor_00)->nb[2] != ((ggml_tensor *)tensor_00)->nb[1] * (long)iVar44) ||
       (iVar76 = ((ggml_tensor *)tensor_00)->ne[2],
       ((ggml_tensor *)tensor_00)->nb[3] != ((ggml_tensor *)tensor_00)->nb[2] * (long)iVar76))
    goto LAB_0012f14b;
    if (tensor->nb[0] != GGML_TYPE_SIZE[tensor->type]) goto LAB_0012f150;
    if (tensor->nb[1] !=
        (tensor->nb[0] * (long)tensor->ne[0]) / (ulong)(long)GGML_BLCK_SIZE[tensor->type])
    goto LAB_0012f150;
    if ((tensor->nb[2] != tensor->nb[1] * (long)tensor->ne[1]) ||
       (tensor->nb[3] != tensor->nb[2] * (long)tensor->ne[2])) goto LAB_0012f150;
    if ((uVar41 == tensor->ne[0]) &&
       (((iVar44 == tensor->ne[1] && (iVar76 == tensor->ne[2])) &&
        (((ggml_tensor *)tensor_00)->ne[3] == tensor->ne[3])))) {
      pgVar7 = tensor->src1;
      if ((((pgVar7->ne[0] == 1) && (pgVar7->ne[1] == 1)) && (pgVar7->ne[2] == 1)) &&
         (pgVar7->ne[3] == 1)) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        iVar76 = iVar76 * iVar44 * ((ggml_tensor *)tensor_00)->ne[3];
        iVar44 = (iVar76 + params->nth + -1) / params->nth;
        lVar85 = (long)params->ith * (long)iVar44;
        iVar44 = iVar44 + (int)lVar85;
        if (iVar76 <= iVar44) {
          iVar44 = iVar76;
        }
        if (iVar44 <= (int)lVar85) {
          return;
        }
        fVar102 = *pgVar7->data;
        uVar43 = uVar41 & 0xffffffe0;
        lVar96 = (long)(int)uVar43;
        if (lVar98 < lVar96 + 1) {
          lVar98 = lVar96 + 1;
        }
        lVar91 = (lVar98 - lVar96) + -1;
        auVar211._8_8_ = lVar91;
        auVar211._0_8_ = lVar91;
        auVar211._16_8_ = lVar91;
        auVar211._24_8_ = lVar91;
        auVar197 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar207 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar131._8_8_ = 0x8000000000000000;
        auVar131._0_8_ = 0x8000000000000000;
        auVar131._16_8_ = 0x8000000000000000;
        auVar131._24_8_ = 0x8000000000000000;
        auVar130 = vpcmpeqd_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
        do {
          sVar12 = tensor->nb[1];
          pvVar64 = tensor->data;
          if (0 < (int)uVar43) {
            pvVar79 = (void *)(sVar12 * lVar85 + (long)pvVar64);
            uVar100 = 0;
            do {
              lVar91 = 0;
              do {
                pfVar88 = (float *)((long)pvVar79 + lVar91);
                auVar212._0_4_ = fVar102 * *pfVar88;
                auVar212._4_4_ = fVar102 * pfVar88[1];
                auVar212._8_4_ = fVar102 * pfVar88[2];
                auVar212._12_4_ = fVar102 * pfVar88[3];
                auVar212._16_4_ = fVar102 * pfVar88[4];
                auVar212._20_4_ = fVar102 * pfVar88[5];
                auVar212._28_36_ = in_ZMM6._28_36_;
                auVar212._24_4_ = fVar102 * pfVar88[6];
                in_ZMM6 = ZEXT3264(auVar212._0_32_);
                *(undefined1 (*) [32])((long)pvVar79 + lVar91) = auVar212._0_32_;
                lVar91 = lVar91 + 0x20;
              } while (lVar91 != 0x80);
              uVar100 = uVar100 + 0x20;
              pvVar79 = (void *)((long)pvVar79 + 0x80);
            } while (uVar100 < uVar43);
          }
          if (uVar43 != uVar41) {
            lVar91 = sVar12 * lVar85 + lVar96 * 4;
            uVar100 = 0;
            do {
              auVar221._8_8_ = uVar100;
              auVar221._0_8_ = uVar100;
              auVar221._16_8_ = uVar100;
              auVar221._24_8_ = uVar100;
              auVar16 = vpor_avx2(auVar221,auVar197);
              auVar221 = vpor_avx2(auVar221,auVar207);
              auVar221 = vpcmpgtq_avx2(auVar221 ^ auVar131,auVar211 ^ auVar131);
              auVar16 = vpcmpgtq_avx2(auVar16 ^ auVar131,auVar211 ^ auVar131);
              auVar221 = vpackssdw_avx2(auVar16,auVar221);
              auVar108 = vpackssdw_avx(SUB3216(auVar221 ^ auVar130,0),
                                       SUB3216(auVar221 ^ auVar130,0x10));
              auVar108 = vpshufd_avx(auVar108,0xd8);
              auVar221 = vpmovzxwd_avx2(auVar108);
              auVar201 = vpslld_avx2(auVar221,0x1f);
              in_ZMM6 = ZEXT3264(auVar201);
              auVar221 = vmaskmovps_avx(auVar201,*(undefined1 (*) [32])
                                                  ((long)pvVar64 + uVar100 * 4 + lVar91));
              auVar16._4_4_ = fVar102 * auVar221._4_4_;
              auVar16._0_4_ = fVar102 * auVar221._0_4_;
              auVar16._8_4_ = fVar102 * auVar221._8_4_;
              auVar16._12_4_ = fVar102 * auVar221._12_4_;
              auVar16._16_4_ = fVar102 * auVar221._16_4_;
              auVar16._20_4_ = fVar102 * auVar221._20_4_;
              auVar16._24_4_ = fVar102 * auVar221._24_4_;
              auVar16._28_4_ = auVar221._28_4_;
              auVar221 = vmaskmovps_avx(auVar201,auVar16);
              *(undefined1 (*) [32])((long)pvVar64 + uVar100 * 4 + lVar91) = auVar221;
              uVar100 = uVar100 + 8;
            } while (((lVar98 - lVar96) + 7U & 0xfffffffffffffff8) != uVar100);
          }
          lVar85 = lVar85 + 1;
        } while (lVar85 != iVar44);
        return;
      }
      goto LAB_0012f155;
    }
    goto LAB_0012f182;
  case GGML_OP_GET_ROWS:
    pgVar7 = tensor->src0;
    if (GGML_TYPE_COUNT < pgVar7->type) {
      return;
    }
    pgVar5 = tensor->src1;
    switch(pgVar7->type) {
    case GGML_TYPE_Q4_0:
      if (((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) &&
         (uVar41 = pgVar5->ne[1] * pgVar5->ne[0] * pgVar5->ne[2] * pgVar5->ne[3], 0 < (int)uVar41))
      {
        iVar44 = pgVar7->ne[0];
        uVar100 = 0;
        do {
          dequantize_row_q4_0((void *)((long)*(int *)((long)pgVar5->data + uVar100 * 4) *
                                       pgVar7->nb[1] + (long)pgVar7->data),
                              (float *)(tensor->nb[1] * uVar100 + (long)tensor->data),iVar44);
          uVar100 = uVar100 + 1;
        } while (uVar41 != uVar100);
      }
      break;
    case GGML_TYPE_Q4_1:
      if (((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) &&
         (uVar41 = pgVar5->ne[1] * pgVar5->ne[0] * pgVar5->ne[2] * pgVar5->ne[3], 0 < (int)uVar41))
      {
        iVar44 = pgVar7->ne[0];
        uVar100 = 0;
        do {
          dequantize_row_q4_1((void *)((long)*(int *)((long)pgVar5->data + uVar100 * 4) *
                                       pgVar7->nb[1] + (long)pgVar7->data),
                              (float *)(tensor->nb[1] * uVar100 + (long)tensor->data),iVar44);
          uVar100 = uVar100 + 1;
        } while (uVar41 != uVar100);
      }
      break;
    default:
      goto switchD_001276f1_caseD_2;
    case GGML_TYPE_F16:
      if (((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) &&
         (uVar41 = pgVar5->ne[1] * pgVar5->ne[0] * pgVar5->ne[2] * pgVar5->ne[3], 0 < (int)uVar41))
      {
        uVar43 = pgVar7->ne[0];
        pvVar64 = pgVar5->data;
        uVar100 = 0;
        do {
          if (0 < (int)uVar43) {
            iVar44 = *(int *)((long)pvVar64 + uVar100 * 4);
            sVar12 = pgVar7->nb[1];
            pvVar79 = pgVar7->data;
            sVar13 = tensor->nb[1];
            pvVar78 = tensor->data;
            uVar67 = 0;
            do {
              *(float *)((long)pvVar78 + uVar67 * 4 + sVar13 * uVar100) =
                   table_f32_f16[*(ushort *)((long)pvVar79 + uVar67 * 2 + (long)iVar44 * sVar12)];
              uVar67 = uVar67 + 1;
            } while (uVar43 != uVar67);
          }
          uVar100 = uVar100 + 1;
        } while (uVar100 != uVar41);
      }
      break;
    case GGML_TYPE_F32:
      if (((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) &&
         (uVar41 = pgVar5->ne[1] * pgVar5->ne[0] * pgVar5->ne[2] * pgVar5->ne[3], 0 < (int)uVar41))
      {
        uVar43 = pgVar7->ne[0];
        pvVar64 = pgVar5->data;
        sVar12 = tensor->nb[1];
        pvVar79 = tensor->data;
        pvVar78 = pgVar7->data;
        sVar13 = pgVar7->nb[1];
        uVar100 = 0;
        do {
          if (0 < (int)uVar43) {
            iVar44 = *(int *)((long)pvVar64 + uVar100 * 4);
            uVar67 = 0;
            do {
              *(undefined4 *)((long)pvVar79 + uVar67 * 4) =
                   *(undefined4 *)((long)pvVar78 + uVar67 * 4 + (long)iVar44 * sVar13);
              uVar67 = uVar67 + 1;
            } while (uVar43 != uVar67);
          }
          uVar100 = uVar100 + 1;
          pvVar79 = (void *)((long)pvVar79 + sVar12);
        } while (uVar100 != uVar41);
      }
    }
    break;
  case GGML_OP_DIAG_MASK_INF:
    pgVar7 = tensor->src0;
    gVar4 = pgVar7->type;
    if (gVar4 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
        return;
      }
      uVar41 = pgVar7->ne[1];
      uVar100 = (long)(int)(pgVar7->ne[2] * uVar41 * pgVar7->ne[3]) / (long)(int)uVar41;
      if ((int)uVar100 < 1) {
        return;
      }
      iVar44 = pgVar7->ne[0];
      iVar76 = *tensor->src1->data;
      uVar67 = 0;
      do {
        if (0 < (int)uVar41) {
          uVar58 = 0;
          do {
            if (iVar76 < iVar44) {
              lVar98 = (long)iVar76;
              do {
                if ((long)(uVar58 + (long)iVar76) < lVar98) {
                  *(undefined4 *)
                   ((long)tensor->data +
                   tensor->nb[0] * lVar98 + tensor->nb[1] * uVar58 + tensor->nb[2] * uVar67) =
                       0xff800000;
                }
                lVar98 = lVar98 + 1;
              } while (iVar44 != lVar98);
            }
            uVar58 = uVar58 + 1;
          } while (uVar58 != uVar41);
        }
        uVar67 = uVar67 + 1;
      } while (uVar67 != (uVar100 & 0xffffffff));
      return;
    }
    if ((GGML_TYPE_F16 < gVar4) && (gVar4 != GGML_TYPE_COUNT)) {
      return;
    }
    ggml_compute_forward_cold_17();
switchD_001270fa_caseD_a:
    pgVar7 = tensor->src0;
    gVar4 = pgVar7->type;
    if (gVar4 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
        return;
      }
      uVar41 = pgVar7->ne[1];
      uVar100 = (long)tensor->ne[1] / (long)(int)uVar41;
      if ((int)uVar100 < 1) {
        return;
      }
      uVar43 = pgVar7->ne[0];
      uVar67 = (long)tensor->ne[0] / (long)(int)uVar43;
      uVar75 = 0;
      local_388 = 0;
      do {
        if (0 < (int)uVar67) {
          lVar98 = 0;
          uVar58 = 0;
          do {
            if (0 < (int)uVar41) {
              sVar12 = tensor->nb[1];
              sVar13 = pgVar7->nb[1];
              pvVar64 = pgVar7->data;
              lVar85 = uVar75 * sVar12 + tensor->nb[0] * lVar98 + (long)tensor->data;
              uVar56 = 0;
              do {
                if (0 < (int)uVar43) {
                  uVar81 = 0;
                  do {
                    *(undefined4 *)(lVar85 + uVar81 * 4) =
                         *(undefined4 *)((long)pvVar64 + uVar81 * 4);
                    uVar81 = uVar81 + 1;
                  } while (uVar43 != uVar81);
                }
                uVar56 = uVar56 + 1;
                lVar85 = lVar85 + sVar12;
                pvVar64 = (void *)((long)pvVar64 + sVar13);
              } while (uVar56 != uVar41);
            }
            uVar58 = uVar58 + 1;
            lVar98 = lVar98 + (int)uVar43;
          } while (uVar58 != (uVar67 & 0xffffffff));
        }
        local_388 = local_388 + 1;
        uVar75 = uVar75 + uVar41;
      } while (local_388 != (uVar100 & 0xffffffff));
      return;
    }
    if ((GGML_TYPE_F16 < gVar4) && (gVar4 != GGML_TYPE_COUNT)) {
      return;
    }
    ggml_compute_forward_cold_144();
switchD_001270fa_caseD_21:
    tensor_00 = (size_t *)tensor->opt[1];
    uVar41 = ggml_get_i32_1d((ggml_tensor *)tensor_00,0);
    if (1 < uVar41) goto LAB_0012f17d;
    pgVar7 = tensor->src0;
    if (GGML_TYPE_COUNT < pgVar7->type) {
      return;
    }
    pgVar5 = tensor->src1;
    pgVar6 = tensor->opt[0];
    switch(pgVar7->type) {
    default:
switchD_001274fb_caseD_0:
      ggml_compute_forward_cold_31();
      params = (ggml_compute_params *)tensor_00;
switchD_00128299_caseD_0:
      ggml_compute_forward_cold_19();
switchD_001284f7_caseD_0:
      ggml_compute_forward_cold_1();
      tensor_00 = (size_t *)params;
LAB_0012f146:
      ggml_compute_forward_cold_129();
LAB_0012f14b:
      ggml_compute_forward_cold_79();
LAB_0012f150:
      ggml_compute_forward_cold_80();
LAB_0012f155:
      ggml_compute_forward_cold_82();
LAB_0012f15a:
      ggml_compute_forward_cold_126();
      goto LAB_0012f15f;
    case GGML_TYPE_F16:
      uVar43 = pgVar7->ne[0];
      if (tensor->ne[0] != uVar43) goto LAB_0012f209;
      uVar75 = pgVar7->ne[1];
      tensor_00 = (size_t *)(ulong)uVar75;
      if (tensor->ne[1] != uVar75) goto LAB_0012f20e;
      uVar86 = pgVar5->ne[1];
      lVar98 = (long)(int)uVar86;
      local_e8 = (ulong)(uVar86 - uVar75);
      if ((int)(uVar86 - uVar75) < 0) goto LAB_0012f213;
      if ((int)pgVar7->nb[0] != 2) goto LAB_0012f218;
      if ((int)pgVar5->nb[0] != 2) goto LAB_0012f21d;
      if ((int)pgVar6->nb[0] != 2) goto LAB_0012f222;
      if (pgVar5->ne[0] != uVar43) goto LAB_0012f227;
      uVar90 = pgVar6->ne[1];
      uVar100 = (ulong)(int)uVar90;
      if (uVar90 != uVar43) goto LAB_0012f22c;
      if ((int)tensor->nb[0] != 4) goto LAB_0012f231;
      iVar44 = (int)tensor->nb[1];
      if (iVar44 < 4) goto LAB_0012f236;
      iVar76 = (int)tensor->nb[2];
      if (iVar76 < iVar44) goto LAB_0012f23b;
      iVar50 = (int)tensor->nb[3];
      if (iVar76 <= iVar50) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        sVar12 = pgVar5->nb[1];
        iVar94 = (int)pgVar5->nb[2];
        iVar42 = (int)pgVar5->nb[3];
        iVar72 = (int)pgVar7->nb[1];
        local_c0._0_4_ = (int)pgVar7->nb[2];
        local_f0 = CONCAT44(local_f0._4_4_,(int)pgVar7->nb[3]);
        sVar13 = pgVar6->nb[1];
        iVar82 = (int)pgVar6->nb[2];
        iVar70 = pgVar7->ne[2] * uVar75;
        iVar68 = pgVar7->ne[3] * iVar70;
        iVar83 = (int)pgVar6->nb[3];
        iVar51 = params->ith;
        iVar55 = (iVar68 + params->nth + -1) / params->nth;
        iVar69 = iVar55 * iVar51;
        iVar55 = iVar55 + iVar69;
        if (iVar68 <= iVar55) {
          iVar55 = iVar68;
        }
        auVar104._0_8_ = (double)(int)uVar43;
        auVar104._8_8_ = in_XMM0_Qa;
        if (auVar104._0_8_ < 0.0) {
          dVar103 = sqrt(auVar104._0_8_);
        }
        else {
          auVar108 = vsqrtsd_avx(auVar104,auVar104);
          dVar103 = auVar108._0_8_;
        }
        if (iVar55 <= iVar69) {
          return;
        }
        pvVar64 = (void *)(ulong)uVar86;
        uVar60 = uVar86 + 3 & 0xfffffffc;
        auVar112._0_4_ = (float)(1.0 / dVar103);
        lVar99 = ((long)(int)(uVar60 * 2) + 0x10) * (long)iVar51;
        uVar53 = uVar43 & 0xffffffe0;
        local_368._0_4_ = (int)sVar12;
        uVar80 = uVar86 & 0xffffffe0;
        uVar67 = (ulong)uVar80;
        auVar112._4_4_ = auVar112._0_4_;
        auVar112._8_4_ = auVar112._0_4_;
        auVar112._12_4_ = auVar112._0_4_;
        lVar96 = (long)(int)uVar80;
        lVar91 = (long)(int)uVar60;
        lVar85 = lVar96 + 1;
        if (lVar96 + 1 <= lVar98) {
          lVar85 = lVar98;
        }
        uVar84 = (uVar86 - uVar75) + 1;
        if ((int)uVar84 < (int)uVar86) {
          uVar84 = uVar86;
        }
        uVar84 = ~uVar86 + uVar75 + uVar84;
        lVar57 = (lVar91 - lVar98) + -1;
        local_380._0_4_ = (int)sVar13;
        auVar136._8_8_ = lVar57;
        auVar136._0_8_ = lVar57;
        auVar136._16_8_ = lVar57;
        auVar136._24_8_ = lVar57;
        auVar151._8_8_ = 0;
        auVar151._0_8_ = (long)(int)local_368;
        local_90 = vpslldq_avx(auVar151,8);
        lVar57 = (lVar85 - lVar96) + -1;
        auVar174._8_8_ = lVar57;
        auVar174._0_8_ = lVar57;
        auVar174._16_8_ = lVar57;
        auVar174._24_8_ = lVar57;
        uVar93 = (undefined4)local_e8;
        auVar161._4_4_ = uVar93;
        auVar161._0_4_ = uVar93;
        auVar161._8_4_ = uVar93;
        auVar161._12_4_ = uVar93;
        auVar161._16_4_ = uVar93;
        auVar161._20_4_ = uVar93;
        auVar161._24_4_ = uVar93;
        auVar161._28_4_ = uVar93;
        local_80 = vpaddd_avx2(auVar161,_DAT_00135260);
        auVar195._8_4_ = uVar84;
        auVar195._0_8_ = CONCAT44(0,uVar84);
        auVar195._12_4_ = 0;
        auVar195._16_4_ = uVar84;
        auVar195._20_4_ = 0;
        auVar195._24_4_ = uVar84;
        auVar195._28_4_ = 0;
        auVar212 = ZEXT864((ulong)(long)(int)local_380);
        auVar180._8_8_ = 0;
        auVar180._0_8_ = (long)(int)local_380;
        local_a0 = vpslldq_avx(auVar180,8);
        local_c8 = lVar98 * 4 + lVar99 * 4;
        lVar57 = lVar96 * 4 + lVar99 * 4;
        uVar58 = (lVar85 - lVar96) + 7U & 0xfffffffffffffff8;
        local_d0 = (local_e8 & 0xffffffff) * 4 + lVar99 * 4;
        lVar85 = lVar91 * 4 + lVar99 * 4;
        auVar197 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar207 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar130 = vpcmpeqd_avx2(auVar131,auVar131);
        auVar218._8_4_ = 0xff800000;
        auVar218._0_8_ = 0xff800000ff800000;
        auVar218._12_4_ = 0xff800000;
        auVar218._16_4_ = 0xff800000;
        auVar218._20_4_ = 0xff800000;
        auVar218._24_4_ = 0xff800000;
        auVar218._28_4_ = 0xff800000;
        do {
          iVar68 = iVar69 / iVar70;
          uVar56 = (ulong)(uint)((int)((long)iVar69 % (long)iVar70) >> 0x1f) << 0x20 |
                   (long)iVar69 % (long)iVar70 & 0xffffffffU;
          iVar51 = (int)((long)uVar56 / (long)(int)uVar75);
          pvVar79 = params->wdata;
          if ((int)uVar86 < (int)uVar60) {
            uVar81 = 0;
            do {
              auVar187._8_8_ = uVar81;
              auVar187._0_8_ = uVar81;
              auVar187._16_8_ = uVar81;
              auVar187._24_8_ = uVar81;
              auVar211 = vpor_avx2(auVar187,auVar197);
              auVar131 = vpor_avx2(auVar207,auVar187);
              auVar228._8_8_ = 0x8000000000000000;
              auVar228._0_8_ = 0x8000000000000000;
              auVar228._16_8_ = 0x8000000000000000;
              auVar228._24_8_ = 0x8000000000000000;
              auVar131 = vpcmpgtq_avx2(auVar228 ^ auVar131,auVar228 ^ auVar136);
              auVar211 = vpcmpgtq_avx2(auVar228 ^ auVar211,auVar228 ^ auVar136);
              auVar131 = vpackssdw_avx2(auVar211,auVar131);
              auVar108 = vpackssdw_avx(SUB3216(auVar130 ^ auVar131,0),
                                       SUB3216(auVar130 ^ auVar131,0x10));
              auVar108 = vpshufd_avx(auVar108,0xd8);
              auVar131 = vpmovzxwd_avx2(auVar108);
              auVar131 = vpslld_avx2(auVar131,0x1f);
              auVar212 = ZEXT3264(auVar131);
              auVar131 = vmaskmovps_avx(auVar131,auVar218);
              *(undefined1 (*) [32])((long)pvVar79 + uVar81 * 4 + local_c8) = auVar131;
              uVar81 = uVar81 + 8;
            } while (((lVar91 - lVar98) + 7U & 0xfffffffffffffff8) != uVar81);
          }
          pvVar78 = (void *)((long)pvVar79 + lVar99 * 4);
          iVar45 = (int)((long)uVar56 % (long)(int)uVar75);
          pvVar97 = pvVar64;
          if ((uVar86 & 1) == 0) {
            if (0 < (int)uVar86) {
              iVar52 = iVar68 * (int)local_f0 + iVar45 * iVar72 + iVar51 * local_c0._0_4_;
              pvVar49 = pgVar7->data;
              auVar181._8_8_ = pgVar5->data;
              auVar181._0_8_ = pgVar5->data;
              auVar108 = vpaddq_avx(auVar181,local_90);
              lVar71 = 0;
              do {
                lVar95 = (long)((int)lVar71 * (int)local_368 + iVar68 * iVar42 + iVar51 * iVar94);
                local_100 = (undefined1  [16])0x0;
                auVar182._8_8_ = lVar95;
                auVar182._0_8_ = lVar95;
                local_e0 = vpaddq_avx(auVar108,auVar182);
                local_120 = 0;
                uStack_118 = 0;
                uStack_110 = 0;
                uStack_108 = 0;
                local_140 = 0;
                uStack_138 = 0;
                uStack_130 = 0;
                uStack_128 = 0;
                local_160 = 0;
                uStack_158 = 0;
                uStack_150 = 0;
                uStack_148 = 0;
                local_180 = 0;
                uStack_178 = 0;
                uStack_170 = 0;
                uStack_168 = 0;
                local_1a0._0_16_ = ZEXT816(0);
                local_1a0 = ZEXT1632(local_1a0._0_16_);
                _local_1c0 = ZEXT816(0);
                _local_1c0 = ZEXT1632(_local_1c0);
                _local_1e0 = ZEXT816(0);
                _local_1e0 = ZEXT1632(_local_1e0);
                _local_200 = ZEXT816(0);
                _local_200 = ZEXT1632(_local_200);
                if (0 < (int)uVar53) {
                  uVar56 = 0;
                  do {
                    pauVar59 = (undefined1 (*) [32])local_200;
                    lVar95 = 0;
                    do {
                      auVar131 = vcvtph2ps_f16c(*(undefined1 (*) [16])
                                                 ((long)pvVar49 +
                                                 lVar95 * 0x10 + uVar56 * 2 + (long)iVar52));
                      lVar47 = 0;
                      pauVar89 = pauVar59;
                      do {
                        auVar211 = vcvtph2ps_f16c(*(undefined1 (*) [16])
                                                   (uVar56 * 2 + *(long *)(local_e0 + lVar47 * 8) +
                                                   lVar95 * 0x10));
                        auVar122 = vfmadd213ps_fma(auVar211,auVar131,*pauVar89);
                        *pauVar89 = ZEXT1632(auVar122);
                        lVar47 = lVar47 + 1;
                        pauVar89 = pauVar89 + 4;
                      } while (lVar47 == 1);
                      lVar95 = lVar95 + 1;
                      pauVar59 = pauVar59 + 1;
                    } while (lVar95 != 4);
                    uVar56 = uVar56 + 0x20;
                  } while (uVar56 < uVar53);
                }
                puVar65 = local_200;
                lVar95 = 0;
                do {
                  lVar47 = 0;
                  do {
                    pfVar88 = (float *)(puVar65 + lVar47);
                    fVar102 = pfVar88[1];
                    fVar3 = pfVar88[2];
                    fVar214 = pfVar88[3];
                    fVar25 = pfVar88[4];
                    fVar26 = pfVar88[5];
                    fVar27 = pfVar88[6];
                    fVar28 = pfVar88[7];
                    pfVar2 = (float *)(puVar65 + lVar47 + 0x20);
                    fVar29 = pfVar2[1];
                    fVar30 = pfVar2[2];
                    fVar31 = pfVar2[3];
                    fVar32 = pfVar2[4];
                    fVar33 = pfVar2[5];
                    fVar34 = pfVar2[6];
                    fVar35 = pfVar2[7];
                    pfVar1 = (float *)(puVar65 + lVar47);
                    *pfVar1 = *pfVar88 + *pfVar2;
                    pfVar1[1] = fVar102 + fVar29;
                    pfVar1[2] = fVar3 + fVar30;
                    pfVar1[3] = fVar214 + fVar31;
                    pfVar1[4] = fVar25 + fVar32;
                    pfVar1[5] = fVar26 + fVar33;
                    pfVar1[6] = fVar27 + fVar34;
                    pfVar1[7] = fVar28 + fVar35;
                    lVar47 = lVar47 + 0x40;
                  } while (lVar47 == 0x40);
                  lVar47 = lVar95 * 0x80;
                  auVar188._0_4_ = *(float *)(local_200 + lVar47) + *(float *)(local_1c0 + lVar47);
                  auVar188._4_4_ =
                       *(float *)(local_200 + lVar47 + 4) + *(float *)(local_1c0 + lVar47 + 4);
                  auVar188._8_4_ =
                       *(float *)(local_200 + lVar47 + 8) + *(float *)(local_1c0 + lVar47 + 8);
                  auVar188._12_4_ =
                       *(float *)(local_200 + lVar47 + 0xc) + *(float *)(local_1c0 + lVar47 + 0xc);
                  auVar188._16_4_ =
                       *(float *)(local_200 + lVar47 + 0x10) + *(float *)(local_1c0 + lVar47 + 0x10)
                  ;
                  auVar188._20_4_ =
                       *(float *)(local_1e0 + lVar47 + -0xc) + *(float *)(local_1a0 + lVar47 + -0xc)
                  ;
                  auVar188._24_4_ =
                       *(float *)(local_1e0 + lVar47 + -8) + *(float *)(local_1a0 + lVar47 + -8);
                  auVar188._28_4_ =
                       *(float *)(local_1e0 + lVar47 + -4) + *(float *)(local_1a0 + lVar47 + -4);
                  auVar198._0_4_ = auVar188._0_4_ + auVar188._16_4_;
                  auVar198._4_4_ = auVar188._4_4_ + auVar188._20_4_;
                  auVar198._8_4_ = auVar188._8_4_ + auVar188._24_4_;
                  auVar198._12_4_ = auVar188._12_4_ + auVar188._28_4_;
                  auVar122 = vhaddps_avx(auVar198,auVar198);
                  auVar122 = vhaddps_avx(auVar122,auVar122);
                  *(undefined1 (*) [32])(local_200 + lVar47) = auVar188;
                  *(double *)(local_100 + lVar95 * 8) = (double)auVar122._0_4_;
                  puVar65 = puVar65 + 0x80;
                  bVar101 = lVar95 == 0;
                  lVar95 = lVar95 + 1;
                } while (bVar101);
                if (uVar53 != uVar43) {
                  lVar95 = (long)(int)uVar53;
                  do {
                    auVar122 = vinsertps_avx(ZEXT416((uint)table_f32_f16
                                                           [*(ushort *)(local_e0._0_8_ + lVar95 * 2)
                                                           ]),
                                             ZEXT416((uint)table_f32_f16
                                                           [*(ushort *)(local_e0._8_8_ + lVar95 * 2)
                                                           ]),0x10);
                    fVar102 = table_f32_f16[*(ushort *)((long)pvVar49 + lVar95 * 2 + (long)iVar52)];
                    auVar199._0_4_ = fVar102 * auVar122._0_4_;
                    auVar199._4_4_ = fVar102 * auVar122._4_4_;
                    auVar199._8_4_ = fVar102 * auVar122._8_4_;
                    auVar199._12_4_ = fVar102 * auVar122._12_4_;
                    auVar122 = vcvtps2pd_avx(auVar199);
                    local_100._0_8_ = (double)local_100._0_8_ + auVar122._0_8_;
                    local_100._8_8_ = (double)local_100._8_8_ + auVar122._8_8_;
                    lVar95 = lVar95 + 1;
                  } while (lVar95 < (int)uVar43);
                }
                auVar122 = vcvtpd2ps_avx(local_100);
                auVar212 = ZEXT1664(auVar122);
                uVar226 = vmovlpd_avx(auVar122);
                *(undefined8 *)((long)pvVar78 + lVar71 * 4) = uVar226;
                lVar71 = lVar71 + 2;
                pvVar97 = pvVar78;
              } while (lVar71 < lVar98);
            }
          }
          else if (0 < (int)uVar86) {
            pvVar49 = pgVar5->data;
            iVar52 = iVar68 * iVar42 + iVar51 * iVar94;
            lVar71 = (long)(iVar68 * (int)local_f0 + iVar45 * iVar72 + iVar51 * local_c0._0_4_) +
                     (long)pgVar7->data;
            pvVar66 = (void *)0x0;
            do {
              lVar95 = (long)iVar52 + (long)pvVar49;
              local_1a0._0_16_ = ZEXT816(0);
              local_1a0 = ZEXT1632(local_1a0._0_16_);
              _local_1c0 = ZEXT816(0);
              _local_1c0 = ZEXT1632(_local_1c0);
              _local_1e0 = ZEXT816(0);
              _local_1e0 = ZEXT1632(_local_1e0);
              _local_200 = ZEXT816(0);
              _local_200 = ZEXT1632(_local_200);
              if (0 < (int)uVar53) {
                uVar56 = 0;
                lVar47 = lVar71;
                lVar63 = lVar95;
                do {
                  lVar87 = 0;
                  do {
                    auVar131 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar63 + lVar87));
                    auVar211 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar47 + lVar87));
                    auVar108 = vfmadd213ps_fma(auVar211,auVar131,
                                               *(undefined1 (*) [32])(local_200 + lVar87 * 2));
                    *(undefined1 (*) [32])(local_200 + lVar87 * 2) = ZEXT1632(auVar108);
                    lVar87 = lVar87 + 0x10;
                  } while (lVar87 != 0x40);
                  uVar56 = uVar56 + 0x20;
                  lVar47 = lVar47 + 0x40;
                  lVar63 = lVar63 + 0x40;
                } while (uVar56 < uVar53);
              }
              lVar47 = 0;
              do {
                fVar102 = *(float *)(local_1e0 + lVar47 + 4);
                fVar3 = *(float *)(local_1e0 + lVar47 + 8);
                fVar214 = *(float *)(local_1e0 + lVar47 + 0xc);
                fVar25 = *(float *)(local_1e0 + lVar47 + 0x10);
                fVar26 = *(float *)(local_1e0 + lVar47 + 0x14);
                fVar27 = *(float *)(local_1e0 + lVar47 + 0x18);
                fVar28 = *(float *)(local_1e0 + lVar47 + 0x1c);
                *(float *)(local_200 + lVar47) =
                     *(float *)(local_200 + lVar47) + *(float *)(local_1e0 + lVar47);
                *(float *)(local_200 + lVar47 + 4) = *(float *)(local_200 + lVar47 + 4) + fVar102;
                *(float *)(local_200 + lVar47 + 8) = *(float *)(local_200 + lVar47 + 8) + fVar3;
                *(float *)(local_200 + lVar47 + 0xc) =
                     *(float *)(local_200 + lVar47 + 0xc) + fVar214;
                *(float *)(local_200 + lVar47 + 0x10) =
                     *(float *)(local_200 + lVar47 + 0x10) + fVar25;
                *(float *)(local_200 + lVar47 + 0x14) =
                     *(float *)(local_200 + lVar47 + 0x14) + fVar26;
                *(float *)(local_200 + lVar47 + 0x18) =
                     *(float *)(local_200 + lVar47 + 0x18) + fVar27;
                *(float *)(local_200 + lVar47 + 0x1c) =
                     *(float *)(local_200 + lVar47 + 0x1c) + fVar28;
                lVar47 = lVar47 + 0x40;
              } while (lVar47 == 0x40);
              auVar183._0_4_ = (float)local_200 + (float)local_1c0 + afStack_1fc[3] + afStack_1bc[3]
              ;
              auVar183._4_4_ = afStack_1fc[0] + afStack_1bc[0] + afStack_1fc[4] + afStack_1bc[4];
              auVar183._8_4_ = afStack_1fc[1] + afStack_1bc[1] + afStack_1fc[5] + afStack_1bc[5];
              auVar183._12_4_ = afStack_1fc[2] + afStack_1bc[2] + afStack_1fc[6] + afStack_1bc[6];
              auVar108 = vhaddps_avx(auVar183,auVar183);
              auVar184 = vhaddps_avx(auVar108,auVar108);
              if (uVar53 != uVar43) {
                dVar103 = (double)auVar184._0_4_;
                lVar47 = (long)(int)uVar53;
                do {
                  dVar103 = dVar103 + (double)(table_f32_f16[*(ushort *)(lVar95 + lVar47 * 2)] *
                                              table_f32_f16[*(ushort *)(lVar71 + lVar47 * 2)]);
                  lVar47 = lVar47 + 1;
                } while (lVar47 < (int)uVar43);
                auVar184._0_4_ = (float)dVar103;
                auVar184._4_4_ = (int)((ulong)dVar103 >> 0x20);
                auVar184._8_8_ = 0;
              }
              auVar212 = ZEXT1664(auVar184);
              *(int *)((long)pvVar78 + (long)pvVar66 * 4) = auVar184._0_4_;
              pvVar66 = (void *)((long)pvVar66 + 1);
              iVar52 = iVar52 + (int)local_368;
              pvVar97 = pvVar78;
            } while (pvVar66 != pvVar64);
          }
          if (0 < (int)uVar80) {
            uVar56 = 0;
            pvVar49 = pvVar78;
            do {
              lVar71 = 0;
              do {
                pfVar88 = (float *)((long)pvVar49 + lVar71);
                auVar191._0_4_ = auVar112._0_4_ * *pfVar88;
                auVar191._4_4_ = auVar112._0_4_ * pfVar88[1];
                auVar191._8_4_ = auVar112._0_4_ * pfVar88[2];
                auVar191._12_4_ = auVar112._0_4_ * pfVar88[3];
                auVar191._16_4_ = auVar112._0_4_ * pfVar88[4];
                auVar191._20_4_ = auVar112._0_4_ * pfVar88[5];
                auVar191._28_36_ = auVar212._28_36_;
                auVar191._24_4_ = auVar112._0_4_ * pfVar88[6];
                auVar212 = ZEXT3264(auVar191._0_32_);
                *(undefined1 (*) [32])((long)pvVar49 + lVar71) = auVar191._0_32_;
                lVar71 = lVar71 + 0x20;
              } while (lVar71 != 0x80);
              uVar56 = uVar56 + 0x20;
              pvVar49 = (void *)((long)pvVar49 + 0x80);
              pvVar97 = (void *)0x0;
            } while (uVar56 < uVar67);
          }
          if (uVar80 != uVar86) {
            uVar56 = 0;
            do {
              auVar189._8_8_ = uVar56;
              auVar189._0_8_ = uVar56;
              auVar189._16_8_ = uVar56;
              auVar189._24_8_ = uVar56;
              auVar211 = vpor_avx2(auVar189,auVar197);
              auVar131 = vpor_avx2(auVar207,auVar189);
              auVar229._8_8_ = 0x8000000000000000;
              auVar229._0_8_ = 0x8000000000000000;
              auVar229._16_8_ = 0x8000000000000000;
              auVar229._24_8_ = 0x8000000000000000;
              auVar131 = vpcmpgtq_avx2(auVar229 ^ auVar131,auVar229 ^ auVar174);
              auVar211 = vpcmpgtq_avx2(auVar229 ^ auVar211,auVar229 ^ auVar174);
              auVar131 = vpackssdw_avx2(auVar211,auVar131);
              auVar108 = vpackssdw_avx(SUB3216(auVar130 ^ auVar131,0),
                                       SUB3216(auVar130 ^ auVar131,0x10));
              auVar108 = vpshufd_avx(auVar108,0xd8);
              auVar131 = vpmovzxwd_avx2(auVar108);
              auVar211 = vpslld_avx2(auVar131,0x1f);
              auVar131 = vmaskmovps_avx(auVar211,*(undefined1 (*) [32])
                                                  ((long)pvVar79 + uVar56 * 4 + lVar57));
              auVar21._4_4_ = auVar131._4_4_ * auVar112._0_4_;
              auVar21._0_4_ = auVar131._0_4_ * auVar112._0_4_;
              auVar21._8_4_ = auVar131._8_4_ * auVar112._0_4_;
              auVar21._12_4_ = auVar131._12_4_ * auVar112._0_4_;
              auVar21._16_4_ = auVar131._16_4_ * auVar112._0_4_;
              auVar21._20_4_ = auVar131._20_4_ * auVar112._0_4_;
              auVar21._24_4_ = auVar131._24_4_ * auVar112._0_4_;
              auVar21._28_4_ = auVar131._28_4_;
              auVar131 = vmaskmovps_avx(auVar211,auVar21);
              *(undefined1 (*) [32])((long)pvVar79 + uVar56 * 4 + lVar57) = auVar131;
              uVar56 = uVar56 + 8;
            } while (uVar58 != uVar56);
          }
          if (0 < (int)uVar75 && uVar41 != 0) {
            iVar52 = (int)local_e8 + iVar45;
            auVar230._4_4_ = iVar52;
            auVar230._0_4_ = iVar52;
            auVar230._8_4_ = iVar52;
            auVar230._12_4_ = iVar52;
            auVar230._16_4_ = iVar52;
            auVar230._20_4_ = iVar52;
            auVar230._24_4_ = iVar52;
            auVar230._28_4_ = iVar52;
            uVar56 = 0;
            auVar131 = local_80;
            do {
              auVar203._8_8_ = uVar56;
              auVar203._0_8_ = uVar56;
              auVar203._16_8_ = uVar56;
              auVar203._24_8_ = uVar56;
              auVar221 = vpor_avx2(auVar203,auVar197);
              auVar211 = vpor_avx2(auVar207,auVar203);
              auVar162._8_8_ = 0x8000000000000000;
              auVar162._0_8_ = 0x8000000000000000;
              auVar162._16_8_ = 0x8000000000000000;
              auVar162._24_8_ = 0x8000000000000000;
              auVar16 = vpor_avx2(auVar195,auVar162);
              auVar211 = vpcmpgtq_avx2(auVar211 ^ auVar162,auVar16);
              auVar221 = vpcmpgtq_avx2(auVar221 ^ auVar162,auVar16);
              auVar211 = vpackssdw_avx2(auVar221,auVar211);
              auVar108 = vpackssdw_avx(SUB3216(auVar130 ^ auVar211,0),
                                       SUB3216(auVar130 ^ auVar211,0x10));
              auVar122 = vpshufd_avx(auVar108,0xd8);
              auVar211 = vpcmpgtd_avx2(auVar131,auVar230);
              auVar108 = vpackssdw_avx(auVar211._0_16_,auVar211._16_16_);
              auVar108 = vpand_avx(auVar122,auVar108);
              auVar211 = vpmovzxwd_avx2(auVar108);
              auVar211 = vpslld_avx2(auVar211,0x1f);
              auVar211 = vmaskmovps_avx(auVar211,auVar218);
              *(undefined1 (*) [32])((long)pvVar79 + uVar56 * 4 + local_d0) = auVar211;
              uVar56 = uVar56 + 8;
              auVar163._8_4_ = 8;
              auVar163._0_8_ = 0x800000008;
              auVar163._12_4_ = 8;
              auVar163._16_4_ = 8;
              auVar163._20_4_ = 8;
              auVar163._24_4_ = 8;
              auVar163._28_4_ = 8;
              auVar131 = vpaddd_avx2(auVar131,auVar163);
              pvVar97 = (void *)0x0;
            } while ((CONCAT44(0,uVar84) + 8 & 0xfffffffffffffff8) != uVar56);
          }
          fVar102 = -INFINITY;
          if (0 < (int)uVar86) {
            pvVar97 = (void *)0x0;
            auVar108 = ZEXT816(0xfff0000000000000);
            do {
              auVar152._0_8_ = (double)*(float *)((long)pvVar78 + (long)pvVar97 * 4);
              auVar152._8_8_ = auVar112._8_8_;
              auVar108 = vmaxsd_avx(auVar108,auVar152);
              pvVar97 = (void *)((long)pvVar97 + 1);
            } while (pvVar64 != pvVar97);
            fVar102 = (float)auVar108._0_8_;
            pvVar97 = pvVar78;
          }
          _local_200 = ZEXT816(0);
          _local_200 = ZEXT1632(_local_200);
          if (0 < (int)uVar60) {
            lVar71 = 0;
            pvVar49 = pvVar78;
            do {
              lVar95 = 0;
              do {
                fVar3 = *(float *)((long)pvVar49 + lVar95 * 4);
                fVar214 = 0.0;
                if (-INFINITY < fVar3) {
                  auVar108 = vcvtps2ph_f16c(ZEXT416((uint)(fVar3 - fVar102)),0);
                  uVar93 = vpextrw_avx(auVar108,0);
                  pvVar97 = (void *)(ulong)table_exp_f16
                                           [CONCAT44((int)((ulong)pvVar97 >> 0x20),uVar93)];
                  fVar214 = table_f32_f16[(long)pvVar97];
                  *(double *)(local_200 + lVar95 * 8) =
                       (double)fVar214 + *(double *)(local_200 + lVar95 * 8);
                }
                *(float *)((long)pvVar49 + lVar95 * 4) = fVar214;
                lVar95 = lVar95 + 1;
              } while (lVar95 != 4);
              lVar71 = lVar71 + 4;
              pvVar49 = (void *)((long)pvVar49 + 0x10);
            } while (lVar71 < lVar91);
          }
          auVar212 = ZEXT1664((undefined1  [16])0x0);
          lVar71 = 0;
          do {
            dVar103 = (double)auVar212._0_4_ + *(double *)(local_200 + lVar71 * 8);
            fVar102 = (float)dVar103;
            auVar212 = ZEXT864(CONCAT44((int)((ulong)dVar103 >> 0x20),fVar102));
            lVar71 = lVar71 + 1;
          } while (lVar71 != 4);
          fVar102 = 1.0 / fVar102;
          if (0 < (int)uVar80) {
            uVar56 = 0;
            pvVar97 = pvVar78;
            do {
              lVar71 = 0;
              do {
                pfVar88 = (float *)((long)pvVar97 + lVar71);
                fVar3 = pfVar88[1];
                fVar214 = pfVar88[2];
                fVar25 = pfVar88[3];
                fVar26 = pfVar88[4];
                fVar27 = pfVar88[5];
                fVar28 = pfVar88[6];
                pfVar1 = (float *)((long)pvVar97 + lVar71);
                *pfVar1 = fVar102 * *pfVar88;
                pfVar1[1] = fVar102 * fVar3;
                pfVar1[2] = fVar102 * fVar214;
                pfVar1[3] = fVar102 * fVar25;
                pfVar1[4] = fVar102 * fVar26;
                pfVar1[5] = fVar102 * fVar27;
                pfVar1[6] = fVar102 * fVar28;
                pfVar1[7] = 0.0;
                lVar71 = lVar71 + 0x20;
              } while (lVar71 != 0x80);
              uVar56 = uVar56 + 0x20;
              pvVar97 = (void *)((long)pvVar97 + 0x80);
            } while (uVar56 < uVar67);
          }
          if (uVar80 != uVar86) {
            uVar56 = 0;
            do {
              auVar164._8_8_ = uVar56;
              auVar164._0_8_ = uVar56;
              auVar164._16_8_ = uVar56;
              auVar164._24_8_ = uVar56;
              auVar211 = vpor_avx2(auVar164,auVar197);
              auVar131 = vpor_avx2(auVar207,auVar164);
              auVar204._8_8_ = 0x8000000000000000;
              auVar204._0_8_ = 0x8000000000000000;
              auVar204._16_8_ = 0x8000000000000000;
              auVar204._24_8_ = 0x8000000000000000;
              auVar131 = vpcmpgtq_avx2(auVar131 ^ auVar204,auVar174 ^ auVar204);
              auVar211 = vpcmpgtq_avx2(auVar211 ^ auVar204,auVar174 ^ auVar204);
              auVar131 = vpackssdw_avx2(auVar211,auVar131);
              auVar108 = vpackssdw_avx(SUB3216(auVar130 ^ auVar131,0),
                                       SUB3216(auVar130 ^ auVar131,0x10));
              auVar108 = vpshufd_avx(auVar108,0xd8);
              auVar131 = vpmovzxwd_avx2(auVar108);
              auVar211 = vpslld_avx2(auVar131,0x1f);
              auVar131 = vmaskmovps_avx(auVar211,*(undefined1 (*) [32])
                                                  ((long)pvVar79 + uVar56 * 4 + lVar57));
              auVar22._4_4_ = fVar102 * auVar131._4_4_;
              auVar22._0_4_ = fVar102 * auVar131._0_4_;
              auVar22._8_4_ = fVar102 * auVar131._8_4_;
              auVar22._12_4_ = fVar102 * auVar131._12_4_;
              auVar22._16_4_ = fVar102 * auVar131._16_4_;
              auVar22._20_4_ = fVar102 * auVar131._20_4_;
              auVar22._24_4_ = fVar102 * auVar131._24_4_;
              auVar22._28_4_ = auVar131._28_4_;
              auVar212 = ZEXT3264(auVar22);
              auVar131 = vmaskmovps_avx(auVar211,auVar22);
              *(undefined1 (*) [32])((long)pvVar79 + uVar56 * 4 + lVar57) = auVar131;
              uVar56 = uVar56 + 8;
            } while (uVar58 != uVar56);
          }
          pvVar79 = params->wdata;
          if (0 < (int)uVar86) {
            pvVar97 = (void *)0x0;
            do {
              auVar108 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pvVar78 + (long)pvVar97 * 4)),0);
              vpextrw_avx(auVar108,0);
              pvVar97 = (void *)((long)pvVar97 + 1);
            } while (pvVar64 != pvVar97);
          }
          if ((uVar100 & 1) == 0) {
            if (0 < (int)uVar90) {
              pvVar78 = tensor->data;
              auVar153._8_8_ = pgVar6->data;
              auVar153._0_8_ = pgVar6->data;
              auVar108 = vpaddq_avx(auVar153,local_a0);
              lVar71 = 0;
              do {
                lVar95 = (long)((int)local_380 * (int)lVar71 + iVar68 * iVar83 + iVar51 * iVar82);
                local_100 = (undefined1  [16])0x0;
                auVar154._8_8_ = lVar95;
                auVar154._0_8_ = lVar95;
                local_e0 = vpaddq_avx(auVar108,auVar154);
                local_120 = 0;
                uStack_118 = 0;
                uStack_110 = 0;
                uStack_108 = 0;
                local_140 = 0;
                uStack_138 = 0;
                uStack_130 = 0;
                uStack_128 = 0;
                local_160 = 0;
                uStack_158 = 0;
                uStack_150 = 0;
                uStack_148 = 0;
                local_180 = 0;
                uStack_178 = 0;
                uStack_170 = 0;
                uStack_168 = 0;
                local_1a0._0_16_ = ZEXT816(0);
                local_1a0 = ZEXT1632(local_1a0._0_16_);
                _local_1c0 = ZEXT816(0);
                _local_1c0 = ZEXT1632(_local_1c0);
                _local_1e0 = ZEXT816(0);
                _local_1e0 = ZEXT1632(_local_1e0);
                _local_200 = ZEXT816(0);
                _local_200 = ZEXT1632(_local_200);
                if (0 < (int)uVar80) {
                  uVar56 = 0;
                  do {
                    pauVar59 = (undefined1 (*) [32])local_200;
                    lVar95 = 0;
                    do {
                      auVar131 = vcvtph2ps_f16c(*(undefined1 (*) [16])
                                                 ((long)pvVar79 +
                                                 lVar95 * 0x10 +
                                                 uVar56 * 2 + lVar91 * 4 + lVar99 * 4));
                      lVar47 = 0;
                      pauVar89 = pauVar59;
                      do {
                        auVar211 = vcvtph2ps_f16c(*(undefined1 (*) [16])
                                                   (uVar56 * 2 + *(long *)(local_e0 + lVar47 * 8) +
                                                   lVar95 * 0x10));
                        auVar122 = vfmadd213ps_fma(auVar211,auVar131,*pauVar89);
                        *pauVar89 = ZEXT1632(auVar122);
                        lVar47 = lVar47 + 1;
                        pauVar89 = pauVar89 + 4;
                      } while (lVar47 == 1);
                      lVar95 = lVar95 + 1;
                      pauVar59 = pauVar59 + 1;
                    } while (lVar95 != 4);
                    uVar56 = uVar56 + 0x20;
                  } while (uVar56 < uVar67);
                }
                puVar65 = local_200;
                lVar95 = 0;
                do {
                  lVar47 = 0;
                  do {
                    pfVar88 = (float *)(puVar65 + lVar47);
                    fVar102 = pfVar88[1];
                    fVar3 = pfVar88[2];
                    fVar214 = pfVar88[3];
                    fVar25 = pfVar88[4];
                    fVar26 = pfVar88[5];
                    fVar27 = pfVar88[6];
                    fVar28 = pfVar88[7];
                    pfVar2 = (float *)(puVar65 + lVar47 + 0x20);
                    fVar29 = pfVar2[1];
                    fVar30 = pfVar2[2];
                    fVar31 = pfVar2[3];
                    fVar32 = pfVar2[4];
                    fVar33 = pfVar2[5];
                    fVar34 = pfVar2[6];
                    fVar35 = pfVar2[7];
                    pfVar1 = (float *)(puVar65 + lVar47);
                    *pfVar1 = *pfVar88 + *pfVar2;
                    pfVar1[1] = fVar102 + fVar29;
                    pfVar1[2] = fVar3 + fVar30;
                    pfVar1[3] = fVar214 + fVar31;
                    pfVar1[4] = fVar25 + fVar32;
                    pfVar1[5] = fVar26 + fVar33;
                    pfVar1[6] = fVar27 + fVar34;
                    pfVar1[7] = fVar28 + fVar35;
                    lVar47 = lVar47 + 0x40;
                  } while (lVar47 == 0x40);
                  lVar47 = lVar95 * 0x80;
                  auVar165._0_4_ = *(float *)(local_200 + lVar47) + *(float *)(local_1c0 + lVar47);
                  auVar165._4_4_ =
                       *(float *)(local_200 + lVar47 + 4) + *(float *)(local_1c0 + lVar47 + 4);
                  auVar165._8_4_ =
                       *(float *)(local_200 + lVar47 + 8) + *(float *)(local_1c0 + lVar47 + 8);
                  auVar165._12_4_ =
                       *(float *)(local_200 + lVar47 + 0xc) + *(float *)(local_1c0 + lVar47 + 0xc);
                  auVar165._16_4_ =
                       *(float *)(local_200 + lVar47 + 0x10) + *(float *)(local_1c0 + lVar47 + 0x10)
                  ;
                  auVar165._20_4_ =
                       *(float *)(local_1e0 + lVar47 + -0xc) + *(float *)(local_1a0 + lVar47 + -0xc)
                  ;
                  auVar165._24_4_ =
                       *(float *)(local_1e0 + lVar47 + -8) + *(float *)(local_1a0 + lVar47 + -8);
                  auVar165._28_4_ =
                       *(float *)(local_1e0 + lVar47 + -4) + *(float *)(local_1a0 + lVar47 + -4);
                  auVar185._0_4_ = auVar165._0_4_ + auVar165._16_4_;
                  auVar185._4_4_ = auVar165._4_4_ + auVar165._20_4_;
                  auVar185._8_4_ = auVar165._8_4_ + auVar165._24_4_;
                  auVar185._12_4_ = auVar165._12_4_ + auVar165._28_4_;
                  auVar122 = vhaddps_avx(auVar185,auVar185);
                  auVar122 = vhaddps_avx(auVar122,auVar122);
                  auVar212 = ZEXT1664(auVar122);
                  *(undefined1 (*) [32])(local_200 + lVar47) = auVar165;
                  *(double *)(local_100 + lVar95 * 8) = (double)auVar122._0_4_;
                  puVar65 = puVar65 + 0x80;
                  bVar101 = lVar95 == 0;
                  lVar95 = lVar95 + 1;
                } while (bVar101);
                if (uVar80 != uVar86) {
                  auVar212 = ZEXT1664(local_100);
                  lVar95 = lVar96;
                  do {
                    auVar122 = vinsertps_avx(ZEXT416((uint)table_f32_f16
                                                           [*(ushort *)(local_e0._0_8_ + lVar95 * 2)
                                                           ]),
                                             ZEXT416((uint)table_f32_f16
                                                           [*(ushort *)(local_e0._8_8_ + lVar95 * 2)
                                                           ]),0x10);
                    fVar102 = table_f32_f16[*(ushort *)((long)pvVar79 + lVar95 * 2 + lVar85)];
                    auVar155._0_4_ = fVar102 * auVar122._0_4_;
                    auVar155._4_4_ = fVar102 * auVar122._4_4_;
                    auVar155._8_4_ = fVar102 * auVar122._8_4_;
                    auVar155._12_4_ = fVar102 * auVar122._12_4_;
                    auVar122 = vcvtps2pd_avx(auVar155);
                    local_100._0_8_ = auVar212._0_8_ + auVar122._0_8_;
                    local_100._8_8_ = auVar212._8_8_ + auVar122._8_8_;
                    auVar212 = ZEXT1664(local_100);
                    lVar95 = lVar95 + 1;
                  } while (lVar95 < lVar98);
                }
                auVar122 = vcvtpd2ps_avx(local_100);
                uVar226 = vmovlpd_avx(auVar122);
                *(undefined8 *)
                 ((long)pvVar78 +
                 (long)(iVar68 * iVar50 + iVar51 * iVar76 + iVar45 * iVar44 + (int)lVar71 * 4)) =
                     uVar226;
                lVar71 = lVar71 + 2;
              } while (lVar71 < (long)uVar100);
            }
          }
          else if (0 < (int)uVar90) {
            pvVar78 = tensor->data;
            pvVar97 = pgVar6->data;
            iVar52 = iVar68 * iVar83 + iVar51 * iVar82;
            lVar71 = (long)pvVar79 + lVar85;
            uVar56 = 0;
            do {
              lVar95 = (long)iVar52 + (long)pvVar97;
              local_1a0._0_16_ = ZEXT816(0);
              local_1a0 = ZEXT1632(local_1a0._0_16_);
              _local_1c0 = ZEXT816(0);
              _local_1c0 = ZEXT1632(_local_1c0);
              _local_1e0 = ZEXT816(0);
              _local_1e0 = ZEXT1632(_local_1e0);
              _local_200 = ZEXT816(0);
              _local_200 = ZEXT1632(_local_200);
              if (0 < (int)uVar80) {
                uVar81 = 0;
                lVar47 = lVar95;
                lVar63 = lVar71;
                do {
                  lVar87 = 0;
                  do {
                    auVar131 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar47 + lVar87));
                    auVar211 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar63 + lVar87));
                    auVar108 = vfmadd213ps_fma(auVar211,auVar131,
                                               *(undefined1 (*) [32])(local_200 + lVar87 * 2));
                    *(undefined1 (*) [32])(local_200 + lVar87 * 2) = ZEXT1632(auVar108);
                    lVar87 = lVar87 + 0x10;
                  } while (lVar87 != 0x40);
                  uVar81 = uVar81 + 0x20;
                  lVar63 = lVar63 + 0x40;
                  lVar47 = lVar47 + 0x40;
                } while (uVar81 < uVar67);
              }
              lVar47 = 0;
              do {
                fVar102 = *(float *)(local_1e0 + lVar47 + 4);
                fVar3 = *(float *)(local_1e0 + lVar47 + 8);
                fVar214 = *(float *)(local_1e0 + lVar47 + 0xc);
                fVar25 = *(float *)(local_1e0 + lVar47 + 0x10);
                fVar26 = *(float *)(local_1e0 + lVar47 + 0x14);
                fVar27 = *(float *)(local_1e0 + lVar47 + 0x18);
                fVar28 = *(float *)(local_1e0 + lVar47 + 0x1c);
                *(float *)(local_200 + lVar47) =
                     *(float *)(local_200 + lVar47) + *(float *)(local_1e0 + lVar47);
                *(float *)(local_200 + lVar47 + 4) = *(float *)(local_200 + lVar47 + 4) + fVar102;
                *(float *)(local_200 + lVar47 + 8) = *(float *)(local_200 + lVar47 + 8) + fVar3;
                *(float *)(local_200 + lVar47 + 0xc) =
                     *(float *)(local_200 + lVar47 + 0xc) + fVar214;
                *(float *)(local_200 + lVar47 + 0x10) =
                     *(float *)(local_200 + lVar47 + 0x10) + fVar25;
                *(float *)(local_200 + lVar47 + 0x14) =
                     *(float *)(local_200 + lVar47 + 0x14) + fVar26;
                *(float *)(local_200 + lVar47 + 0x18) =
                     *(float *)(local_200 + lVar47 + 0x18) + fVar27;
                *(float *)(local_200 + lVar47 + 0x1c) =
                     *(float *)(local_200 + lVar47 + 0x1c) + fVar28;
                lVar47 = lVar47 + 0x40;
              } while (lVar47 == 0x40);
              auVar156._0_4_ = (float)local_200 + (float)local_1c0 + afStack_1fc[3] + afStack_1bc[3]
              ;
              auVar156._4_4_ = afStack_1fc[0] + afStack_1bc[0] + afStack_1fc[4] + afStack_1bc[4];
              auVar156._8_4_ = afStack_1fc[1] + afStack_1bc[1] + afStack_1fc[5] + afStack_1bc[5];
              auVar156._12_4_ = afStack_1fc[2] + afStack_1bc[2] + afStack_1fc[6] + afStack_1bc[6];
              auVar108 = vhaddps_avx(auVar156,auVar156);
              auVar186 = vhaddps_avx(auVar108,auVar108);
              if (uVar80 != uVar86) {
                dVar103 = (double)auVar186._0_4_;
                lVar47 = lVar96;
                do {
                  dVar103 = dVar103 + (double)(table_f32_f16[*(ushort *)(lVar95 + lVar47 * 2)] *
                                              table_f32_f16[*(ushort *)(lVar71 + lVar47 * 2)]);
                  lVar47 = lVar47 + 1;
                } while (lVar47 < lVar98);
                auVar186._0_4_ = (float)dVar103;
                auVar186._4_4_ = (int)((ulong)dVar103 >> 0x20);
                auVar186._8_8_ = 0;
              }
              auVar212 = ZEXT1664(auVar186);
              *(int *)((long)pvVar78 +
                      (long)(iVar68 * iVar50 + iVar51 * iVar76 + iVar45 * iVar44 + (int)uVar56 * 4))
                   = auVar186._0_4_;
              uVar56 = uVar56 + 1;
              iVar52 = iVar52 + (int)local_380;
            } while (uVar56 != uVar100);
          }
          iVar69 = iVar69 + 1;
        } while (iVar69 != iVar55);
        return;
      }
      goto LAB_0012f240;
    case GGML_TYPE_F32:
      uVar43 = pgVar7->ne[0];
      if (tensor->ne[0] != uVar43) goto LAB_0012f2a9;
      uVar75 = pgVar7->ne[1];
      tensor_00 = (size_t *)(ulong)uVar75;
      if (tensor->ne[1] != uVar75) goto LAB_0012f2ae;
      uVar86 = pgVar5->ne[1];
      lVar98 = (long)(int)uVar86;
      uVar90 = uVar86 - uVar75;
      if ((int)uVar90 < 0) goto LAB_0012f2b3;
      if ((int)pgVar7->nb[0] != 4) goto LAB_0012f2b8;
      if ((int)pgVar5->nb[0] != 4) goto LAB_0012f2bd;
      if ((int)pgVar6->nb[0] != 4) goto LAB_0012f2c2;
      if (pgVar5->ne[0] != uVar43) goto LAB_0012f2c7;
      uVar60 = pgVar6->ne[1];
      if (uVar60 != uVar43) goto LAB_0012f2cc;
      if ((int)tensor->nb[0] != 4) goto LAB_0012f2d1;
      iVar44 = (int)tensor->nb[1];
      if (iVar44 < 4) goto LAB_0012f2d6;
      iVar76 = (int)tensor->nb[2];
      if (iVar76 < iVar44) goto LAB_0012f2db;
      iVar50 = (int)tensor->nb[3];
      if (iVar76 <= iVar50) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        sVar12 = pgVar5->nb[1];
        sVar14 = pgVar5->nb[2];
        sVar9 = pgVar5->nb[3];
        sVar10 = pgVar7->nb[1];
        local_e8 = CONCAT44(local_e8._4_4_,(int)pgVar7->nb[2]);
        sVar11 = pgVar7->nb[3];
        sVar13 = pgVar6->nb[1];
        sVar38 = pgVar6->nb[2];
        iVar72 = pgVar7->ne[2] * uVar75;
        iVar82 = pgVar7->ne[3] * iVar72;
        sVar39 = pgVar6->nb[3];
        iVar94 = params->ith;
        iVar42 = (iVar82 + params->nth + -1) / params->nth;
        iVar83 = iVar42 * iVar94;
        iVar42 = iVar42 + iVar83;
        if (iVar82 <= iVar42) {
          iVar42 = iVar82;
        }
        auVar109._0_8_ = (double)(int)uVar43;
        auVar109._8_8_ = in_XMM0_Qa;
        if (auVar109._0_8_ < 0.0) {
          dVar103 = sqrt(auVar109._0_8_);
        }
        else {
          auVar108 = vsqrtsd_avx(auVar109,auVar109);
          dVar103 = auVar108._0_8_;
        }
        if (iVar42 <= iVar83) {
          return;
        }
        uVar53 = uVar86 + 3 & 0xfffffffc;
        auVar113._0_4_ = (float)(1.0 / dVar103);
        lVar91 = (long)(int)uVar53;
        lVar99 = (lVar91 + 0x10) * (long)iVar94;
        uVar80 = uVar43 & 0xffffffe0;
        uVar84 = uVar86 & 0xffffffe0;
        uVar100 = (ulong)uVar84;
        lVar96 = (long)(int)uVar84;
        lVar85 = lVar96 + 1;
        if (lVar96 + 1 <= lVar98) {
          lVar85 = lVar98;
        }
        auVar113._4_4_ = auVar113._0_4_;
        auVar113._8_4_ = auVar113._0_4_;
        auVar113._12_4_ = auVar113._0_4_;
        uVar54 = (uVar86 - uVar75) + 1;
        if ((int)uVar54 < (int)uVar86) {
          uVar54 = uVar86;
        }
        uVar54 = ~uVar86 + uVar75 + uVar54;
        lVar57 = (lVar91 - lVar98) + -1;
        auVar196._8_8_ = lVar57;
        auVar196._0_8_ = lVar57;
        auVar196._16_8_ = lVar57;
        auVar196._24_8_ = lVar57;
        lVar57 = (lVar85 - lVar96) + -1;
        auVar227._8_8_ = lVar57;
        auVar227._0_8_ = lVar57;
        auVar227._16_8_ = lVar57;
        auVar227._24_8_ = lVar57;
        auVar137._4_4_ = uVar90;
        auVar137._0_4_ = uVar90;
        auVar137._8_4_ = uVar90;
        auVar137._12_4_ = uVar90;
        auVar137._16_4_ = uVar90;
        auVar137._20_4_ = uVar90;
        auVar137._24_4_ = uVar90;
        auVar137._28_4_ = uVar90;
        local_c0 = vpaddd_avx2(auVar137,_DAT_00135260);
        auVar215._8_4_ = uVar54;
        auVar215._0_8_ = CONCAT44(0,uVar54);
        auVar215._12_4_ = 0;
        auVar215._16_4_ = uVar54;
        auVar215._20_4_ = 0;
        auVar215._24_4_ = uVar54;
        auVar215._28_4_ = 0;
        lVar57 = lVar96 * 4 + lVar99 * 4;
        uVar58 = (lVar85 - lVar96) + 7U & 0xfffffffffffffff8;
        local_f0 = (ulong)uVar90 * 4 + lVar99 * 4;
        auVar197 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar175._8_8_ = 0x8000000000000000;
        auVar175._0_8_ = 0x8000000000000000;
        auVar175._16_8_ = 0x8000000000000000;
        auVar175._24_8_ = 0x8000000000000000;
        auVar131 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar205._8_4_ = 0xff800000;
        auVar205._0_8_ = 0xff800000ff800000;
        auVar205._12_4_ = 0xff800000;
        auVar205._16_4_ = 0xff800000;
        auVar205._20_4_ = 0xff800000;
        auVar205._24_4_ = 0xff800000;
        auVar205._28_4_ = 0xff800000;
        auVar130 = vpcmpeqd_avx2(auVar207,auVar207);
        auVar207 = vpor_avx2(auVar215,auVar175);
        auVar227 = auVar227 ^ auVar175;
        uVar67 = uVar58;
        do {
          iVar82 = iVar83 / iVar72;
          uVar56 = (ulong)(uint)((int)((long)iVar83 % (long)iVar72) >> 0x1f) << 0x20 |
                   (long)iVar83 % (long)iVar72 & 0xffffffffU;
          iVar94 = (int)((long)uVar56 % (long)(int)uVar75);
          iVar51 = (int)((long)uVar56 / (long)(int)uVar75);
          pvVar79 = params->wdata;
          pvVar64 = (void *)((long)pvVar79 + lVar99 * 4);
          if ((int)uVar86 < (int)uVar53) {
            uVar56 = 0;
            do {
              auVar219._8_8_ = uVar56;
              auVar219._0_8_ = uVar56;
              auVar219._16_8_ = uVar56;
              auVar219._24_8_ = uVar56;
              auVar221 = vpor_avx2(auVar219,auVar197);
              auVar211 = vpor_avx2(auVar219,auVar131);
              auVar211 = vpcmpgtq_avx2(auVar211 ^ auVar175,auVar196 ^ auVar175);
              auVar221 = vpcmpgtq_avx2(auVar221 ^ auVar175,auVar196 ^ auVar175);
              auVar211 = vpackssdw_avx2(auVar221,auVar211);
              auVar108 = vpackssdw_avx(SUB3216(auVar211 ^ auVar130,0),
                                       SUB3216(auVar211 ^ auVar130,0x10));
              auVar108 = vpshufd_avx(auVar108,0xd8);
              auVar211 = vpmovzxwd_avx2(auVar108);
              auVar211 = vpslld_avx2(auVar211,0x1f);
              in_ZMM11 = ZEXT3264(auVar211);
              auVar211 = vmaskmovps_avx(auVar211,auVar205);
              *(undefined1 (*) [32])((long)pvVar64 + uVar56 * 4 + lVar98 * 4) = auVar211;
              uVar56 = uVar56 + 8;
            } while (((lVar91 - lVar98) + 7U & 0xfffffffffffffff8) != uVar56);
          }
          if (0 < (int)uVar86) {
            pvVar78 = pgVar5->data;
            iVar55 = iVar82 * (int)sVar9 + iVar51 * (int)sVar14;
            lVar85 = (long)(iVar82 * (int)sVar11 + iVar94 * (int)sVar10 + iVar51 * (int)local_e8) +
                     (long)pgVar7->data;
            uVar56 = 0;
            do {
              lVar71 = (long)iVar55 + (long)pvVar78;
              local_1a0._0_16_ = ZEXT816(0);
              local_1a0 = ZEXT1632(local_1a0._0_16_);
              _local_1c0 = ZEXT816(0);
              _local_1c0 = ZEXT1632(_local_1c0);
              _local_1e0 = ZEXT816(0);
              _local_1e0 = ZEXT1632(_local_1e0);
              _local_200 = ZEXT816(0);
              _local_200 = ZEXT1632(_local_200);
              if (0 < (int)uVar80) {
                uVar67 = 0;
                lVar95 = lVar71;
                lVar47 = lVar85;
                do {
                  lVar63 = 0;
                  do {
                    auVar108 = vfmadd213ps_fma(*(undefined1 (*) [32])(lVar47 + lVar63),
                                               *(undefined1 (*) [32])(lVar95 + lVar63),
                                               *(undefined1 (*) [32])(local_200 + lVar63));
                    *(undefined1 (*) [32])(local_200 + lVar63) = ZEXT1632(auVar108);
                    lVar63 = lVar63 + 0x20;
                  } while (lVar63 != 0x80);
                  uVar67 = uVar67 + 0x20;
                  lVar47 = lVar47 + 0x80;
                  lVar95 = lVar95 + 0x80;
                } while (uVar67 < uVar80);
              }
              uVar67 = 0;
              lVar95 = 0;
              do {
                fVar102 = *(float *)(local_1e0 + lVar95 + 4);
                fVar3 = *(float *)(local_1e0 + lVar95 + 8);
                fVar214 = *(float *)(local_1e0 + lVar95 + 0xc);
                fVar25 = *(float *)(local_1e0 + lVar95 + 0x10);
                fVar26 = *(float *)(local_1e0 + lVar95 + 0x14);
                fVar27 = *(float *)(local_1e0 + lVar95 + 0x18);
                fVar28 = *(float *)(local_1e0 + lVar95 + 0x1c);
                *(float *)(local_200 + lVar95) =
                     *(float *)(local_200 + lVar95) + *(float *)(local_1e0 + lVar95);
                *(float *)(local_200 + lVar95 + 4) = *(float *)(local_200 + lVar95 + 4) + fVar102;
                *(float *)(local_200 + lVar95 + 8) = *(float *)(local_200 + lVar95 + 8) + fVar3;
                *(float *)(local_200 + lVar95 + 0xc) =
                     *(float *)(local_200 + lVar95 + 0xc) + fVar214;
                *(float *)(local_200 + lVar95 + 0x10) =
                     *(float *)(local_200 + lVar95 + 0x10) + fVar25;
                *(float *)(local_200 + lVar95 + 0x14) =
                     *(float *)(local_200 + lVar95 + 0x14) + fVar26;
                *(float *)(local_200 + lVar95 + 0x18) =
                     *(float *)(local_200 + lVar95 + 0x18) + fVar27;
                *(float *)(local_200 + lVar95 + 0x1c) =
                     *(float *)(local_200 + lVar95 + 0x1c) + fVar28;
                lVar95 = lVar95 + 0x40;
              } while (lVar95 == 0x40);
              auVar138._0_4_ = (float)local_200 + (float)local_1c0;
              auVar138._4_4_ = afStack_1fc[0] + afStack_1bc[0];
              auVar138._8_4_ = afStack_1fc[1] + afStack_1bc[1];
              auVar138._12_4_ = afStack_1fc[2] + afStack_1bc[2];
              auVar138._16_4_ = afStack_1fc[3] + afStack_1bc[3];
              auVar138._20_4_ = afStack_1fc[4] + afStack_1bc[4];
              auVar138._24_4_ = afStack_1fc[5] + afStack_1bc[5];
              auVar138._28_4_ = afStack_1fc[6] + afStack_1bc[6];
              in_ZMM11 = ZEXT1664(auVar138._16_16_);
              auVar125._0_4_ = auVar138._16_4_ + auVar138._0_4_;
              auVar125._4_4_ = auVar138._20_4_ + auVar138._4_4_;
              auVar125._8_4_ = auVar138._24_4_ + auVar138._8_4_;
              auVar125._12_4_ = auVar138._28_4_ + auVar138._12_4_;
              auVar108 = vhaddps_avx(auVar125,auVar125);
              auVar108 = vhaddps_avx(auVar108,auVar108);
              fVar102 = auVar108._0_4_;
              lVar95 = (long)(int)uVar80;
              if (uVar80 != uVar43) {
                do {
                  fVar102 = fVar102 + *(float *)(lVar71 + lVar95 * 4) *
                                      *(float *)(lVar85 + lVar95 * 4);
                  lVar95 = lVar95 + 1;
                } while (lVar95 < (int)uVar43);
              }
              *(float *)((long)pvVar64 + uVar56 * 4) = fVar102;
              uVar56 = uVar56 + 1;
              local_360._0_4_ = (int)sVar12;
              iVar55 = iVar55 + (int)local_360;
            } while (uVar56 != uVar86);
          }
          if (0 < (int)uVar84) {
            uVar56 = 0;
            pvVar78 = pvVar64;
            do {
              lVar85 = 0;
              do {
                pfVar88 = (float *)((long)pvVar78 + lVar85);
                auVar224._0_4_ = auVar113._0_4_ * *pfVar88;
                auVar224._4_4_ = auVar113._0_4_ * pfVar88[1];
                auVar224._8_4_ = auVar113._0_4_ * pfVar88[2];
                auVar224._12_4_ = auVar113._0_4_ * pfVar88[3];
                auVar224._16_4_ = auVar113._0_4_ * pfVar88[4];
                auVar224._20_4_ = auVar113._0_4_ * pfVar88[5];
                auVar224._28_36_ = in_ZMM11._28_36_;
                auVar224._24_4_ = auVar113._0_4_ * pfVar88[6];
                in_ZMM11 = ZEXT3264(auVar224._0_32_);
                *(undefined1 (*) [32])((long)pvVar78 + lVar85) = auVar224._0_32_;
                lVar85 = lVar85 + 0x20;
              } while (lVar85 != 0x80);
              uVar56 = uVar56 + 0x20;
              pvVar78 = (void *)((long)pvVar78 + 0x80);
            } while (uVar56 < uVar100);
          }
          if (uVar84 != uVar86) {
            uVar56 = 0;
            do {
              auVar220._8_8_ = uVar56;
              auVar220._0_8_ = uVar56;
              auVar220._16_8_ = uVar56;
              auVar220._24_8_ = uVar56;
              auVar221 = vpor_avx2(auVar220,auVar197);
              auVar211 = vpor_avx2(auVar220,auVar131);
              auVar211 = vpcmpgtq_avx2(auVar211 ^ auVar175,auVar227);
              auVar221 = vpcmpgtq_avx2(auVar221 ^ auVar175,auVar227);
              auVar211 = vpackssdw_avx2(auVar221,auVar211);
              auVar108 = vpackssdw_avx(SUB3216(auVar211 ^ auVar130,0),
                                       SUB3216(auVar211 ^ auVar130,0x10));
              auVar108 = vpshufd_avx(auVar108,0xd8);
              auVar211 = vpmovzxwd_avx2(auVar108);
              auVar221 = vpslld_avx2(auVar211,0x1f);
              in_ZMM11 = ZEXT3264(auVar221);
              auVar211 = vmaskmovps_avx(auVar221,*(undefined1 (*) [32])
                                                  ((long)pvVar79 + uVar56 * 4 + lVar57));
              auVar23._4_4_ = auVar211._4_4_ * auVar113._0_4_;
              auVar23._0_4_ = auVar211._0_4_ * auVar113._0_4_;
              auVar23._8_4_ = auVar211._8_4_ * auVar113._0_4_;
              auVar23._12_4_ = auVar211._12_4_ * auVar113._0_4_;
              auVar23._16_4_ = auVar211._16_4_ * auVar113._0_4_;
              auVar23._20_4_ = auVar211._20_4_ * auVar113._0_4_;
              auVar23._24_4_ = auVar211._24_4_ * auVar113._0_4_;
              auVar23._28_4_ = auVar211._28_4_;
              auVar211 = vmaskmovps_avx(auVar221,auVar23);
              *(undefined1 (*) [32])((long)pvVar79 + uVar56 * 4 + lVar57) = auVar211;
              uVar56 = uVar56 + 8;
            } while (uVar58 != uVar56);
          }
          if (0 < (int)uVar75 && uVar41 != 0) {
            iVar55 = uVar90 + iVar94;
            auVar231._4_4_ = iVar55;
            auVar231._0_4_ = iVar55;
            auVar231._8_4_ = iVar55;
            auVar231._12_4_ = iVar55;
            auVar231._16_4_ = iVar55;
            auVar231._20_4_ = iVar55;
            auVar231._24_4_ = iVar55;
            auVar231._28_4_ = iVar55;
            uVar56 = 0;
            auVar211 = local_c0;
            do {
              auVar222._8_8_ = uVar56;
              auVar222._0_8_ = uVar56;
              auVar222._16_8_ = uVar56;
              auVar222._24_8_ = uVar56;
              auVar16 = vpor_avx2(auVar222,auVar197);
              auVar221 = vpor_avx2(auVar222,auVar131);
              auVar221 = vpcmpgtq_avx2(auVar221 ^ auVar175,auVar207);
              auVar16 = vpcmpgtq_avx2(auVar16 ^ auVar175,auVar207);
              auVar221 = vpackssdw_avx2(auVar16,auVar221);
              auVar108 = vpackssdw_avx(SUB3216(auVar221 ^ auVar130,0),
                                       SUB3216(auVar221 ^ auVar130,0x10));
              auVar122 = vpshufd_avx(auVar108,0xd8);
              auVar221 = vpcmpgtd_avx2(auVar211,auVar231);
              auVar108 = vpackssdw_avx(auVar221._0_16_,auVar221._16_16_);
              in_ZMM11 = ZEXT1664(auVar108);
              auVar108 = vpand_avx(auVar108,auVar122);
              auVar221 = vpmovzxwd_avx2(auVar108);
              auVar221 = vpslld_avx2(auVar221,0x1f);
              auVar221 = vmaskmovps_avx(auVar221,auVar205);
              *(undefined1 (*) [32])((long)pvVar79 + uVar56 * 4 + local_f0) = auVar221;
              uVar56 = uVar56 + 8;
              auVar139._8_4_ = 8;
              auVar139._0_8_ = 0x800000008;
              auVar139._12_4_ = 8;
              auVar139._16_4_ = 8;
              auVar139._20_4_ = 8;
              auVar139._24_4_ = 8;
              auVar139._28_4_ = 8;
              auVar211 = vpaddd_avx2(auVar211,auVar139);
            } while ((CONCAT44(0,uVar54) + 8 & 0xfffffffffffffff8) != uVar56);
          }
          fVar102 = -INFINITY;
          if (0 < (int)uVar86) {
            uVar56 = 0;
            auVar108 = ZEXT816(0xfff0000000000000);
            do {
              auVar126._0_8_ = (double)*(float *)((long)pvVar64 + uVar56 * 4);
              auVar126._8_8_ = auVar113._8_8_;
              auVar108 = vmaxsd_avx(auVar108,auVar126);
              uVar56 = uVar56 + 1;
            } while (uVar86 != uVar56);
            fVar102 = (float)auVar108._0_8_;
          }
          _local_200 = ZEXT816(0);
          _local_200 = ZEXT1632(_local_200);
          if (0 < (int)uVar53) {
            lVar85 = 0;
            pvVar78 = pvVar64;
            do {
              lVar71 = 0;
              do {
                fVar3 = *(float *)((long)pvVar78 + lVar71 * 4);
                in_ZMM11 = ZEXT464((uint)fVar3);
                fVar214 = 0.0;
                if (-INFINITY < fVar3) {
                  auVar108 = vcvtps2ph_f16c(ZEXT416((uint)(fVar3 - fVar102)),0);
                  uVar93 = vpextrw_avx(auVar108,0);
                  uVar67 = (ulong)table_exp_f16[CONCAT44((int)(uVar67 >> 0x20),uVar93)];
                  fVar214 = table_f32_f16[uVar67];
                  *(double *)(local_200 + lVar71 * 8) =
                       (double)fVar214 + *(double *)(local_200 + lVar71 * 8);
                }
                *(float *)((long)pvVar78 + lVar71 * 4) = fVar214;
                lVar71 = lVar71 + 1;
              } while (lVar71 != 4);
              lVar85 = lVar85 + 4;
              pvVar78 = (void *)((long)pvVar78 + 0x10);
            } while (lVar85 < lVar91);
          }
          fVar102 = 0.0;
          lVar85 = 0;
          do {
            fVar102 = (float)((double)fVar102 + *(double *)(local_200 + lVar85 * 8));
            lVar85 = lVar85 + 1;
          } while (lVar85 != 4);
          fVar102 = 1.0 / fVar102;
          auVar212 = ZEXT1664(CONCAT124(SUB6012((undefined1  [60])0x0,0),fVar102));
          if (0 < (int)uVar84) {
            uVar67 = 0;
            pvVar78 = pvVar64;
            do {
              lVar85 = 0;
              do {
                pfVar88 = (float *)((long)pvVar78 + lVar85);
                auVar144._0_4_ = fVar102 * *pfVar88;
                auVar144._4_4_ = fVar102 * pfVar88[1];
                auVar144._8_4_ = fVar102 * pfVar88[2];
                auVar144._12_4_ = fVar102 * pfVar88[3];
                auVar144._16_4_ = fVar102 * pfVar88[4];
                auVar144._20_4_ = fVar102 * pfVar88[5];
                auVar144._28_36_ = auVar212._28_36_;
                auVar144._24_4_ = fVar102 * pfVar88[6];
                auVar212 = ZEXT3264(auVar144._0_32_);
                *(undefined1 (*) [32])((long)pvVar78 + lVar85) = auVar144._0_32_;
                lVar85 = lVar85 + 0x20;
              } while (lVar85 != 0x80);
              uVar67 = uVar67 + 0x20;
              pvVar78 = (void *)((long)pvVar78 + 0x80);
            } while (uVar67 < uVar100);
          }
          if (uVar84 != uVar86) {
            uVar67 = 0;
            do {
              auVar140._8_8_ = uVar67;
              auVar140._0_8_ = uVar67;
              auVar140._16_8_ = uVar67;
              auVar140._24_8_ = uVar67;
              auVar221 = vpor_avx2(auVar140,auVar197);
              auVar211 = vpor_avx2(auVar140,auVar131);
              auVar211 = vpcmpgtq_avx2(auVar211 ^ auVar175,auVar227);
              auVar221 = vpcmpgtq_avx2(auVar221 ^ auVar175,auVar227);
              auVar211 = vpackssdw_avx2(auVar221,auVar211);
              auVar108 = vpackssdw_avx(SUB3216(auVar211 ^ auVar130,0),
                                       SUB3216(auVar211 ^ auVar130,0x10));
              auVar108 = vpshufd_avx(auVar108,0xd8);
              auVar211 = vpmovzxwd_avx2(auVar108);
              auVar221 = vpslld_avx2(auVar211,0x1f);
              auVar211 = vmaskmovps_avx(auVar221,*(undefined1 (*) [32])
                                                  ((long)pvVar79 + uVar67 * 4 + lVar57));
              auVar24._4_4_ = fVar102 * auVar211._4_4_;
              auVar24._0_4_ = fVar102 * auVar211._0_4_;
              auVar24._8_4_ = fVar102 * auVar211._8_4_;
              auVar24._12_4_ = fVar102 * auVar211._12_4_;
              auVar24._16_4_ = fVar102 * auVar211._16_4_;
              auVar24._20_4_ = fVar102 * auVar211._20_4_;
              auVar24._24_4_ = fVar102 * auVar211._24_4_;
              auVar24._28_4_ = auVar211._28_4_;
              in_ZMM11 = ZEXT3264(auVar24);
              auVar211 = vmaskmovps_avx(auVar221,auVar24);
              *(undefined1 (*) [32])((long)pvVar79 + uVar67 * 4 + lVar57) = auVar211;
              uVar67 = uVar67 + 8;
            } while (uVar58 != uVar67);
          }
          if (0 < (int)uVar60) {
            pvVar79 = tensor->data;
            pvVar78 = pgVar6->data;
            iVar55 = iVar82 * (int)sVar39 + iVar51 * (int)sVar38;
            uVar67 = 0;
            do {
              lVar85 = (long)iVar55 + (long)pvVar78;
              local_1a0._0_16_ = ZEXT816(0);
              local_1a0 = ZEXT1632(local_1a0._0_16_);
              _local_1c0 = ZEXT816(0);
              _local_1c0 = ZEXT1632(_local_1c0);
              _local_1e0 = ZEXT816(0);
              _local_1e0 = ZEXT1632(_local_1e0);
              _local_200 = ZEXT816(0);
              _local_200 = ZEXT1632(_local_200);
              if (0 < (int)uVar84) {
                uVar56 = 0;
                lVar71 = lVar85;
                pvVar97 = pvVar64;
                do {
                  lVar95 = 0;
                  do {
                    auVar108 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)pvVar97 + lVar95),
                                               *(undefined1 (*) [32])(lVar71 + lVar95),
                                               *(undefined1 (*) [32])(local_200 + lVar95));
                    *(undefined1 (*) [32])(local_200 + lVar95) = ZEXT1632(auVar108);
                    lVar95 = lVar95 + 0x20;
                  } while (lVar95 != 0x80);
                  uVar56 = uVar56 + 0x20;
                  pvVar97 = (void *)((long)pvVar97 + 0x80);
                  lVar71 = lVar71 + 0x80;
                } while (uVar56 < uVar100);
              }
              lVar71 = 0;
              do {
                fVar102 = *(float *)(local_1e0 + lVar71 + 4);
                fVar3 = *(float *)(local_1e0 + lVar71 + 8);
                fVar214 = *(float *)(local_1e0 + lVar71 + 0xc);
                fVar25 = *(float *)(local_1e0 + lVar71 + 0x10);
                fVar26 = *(float *)(local_1e0 + lVar71 + 0x14);
                fVar27 = *(float *)(local_1e0 + lVar71 + 0x18);
                fVar28 = *(float *)(local_1e0 + lVar71 + 0x1c);
                *(float *)(local_200 + lVar71) =
                     *(float *)(local_200 + lVar71) + *(float *)(local_1e0 + lVar71);
                *(float *)(local_200 + lVar71 + 4) = *(float *)(local_200 + lVar71 + 4) + fVar102;
                *(float *)(local_200 + lVar71 + 8) = *(float *)(local_200 + lVar71 + 8) + fVar3;
                *(float *)(local_200 + lVar71 + 0xc) =
                     *(float *)(local_200 + lVar71 + 0xc) + fVar214;
                *(float *)(local_200 + lVar71 + 0x10) =
                     *(float *)(local_200 + lVar71 + 0x10) + fVar25;
                *(float *)(local_200 + lVar71 + 0x14) =
                     *(float *)(local_200 + lVar71 + 0x14) + fVar26;
                *(float *)(local_200 + lVar71 + 0x18) =
                     *(float *)(local_200 + lVar71 + 0x18) + fVar27;
                *(float *)(local_200 + lVar71 + 0x1c) =
                     *(float *)(local_200 + lVar71 + 0x1c) + fVar28;
                lVar71 = lVar71 + 0x40;
              } while (lVar71 == 0x40);
              auVar141._0_4_ = (float)local_200 + (float)local_1c0;
              auVar141._4_4_ = afStack_1fc[0] + afStack_1bc[0];
              auVar141._8_4_ = afStack_1fc[1] + afStack_1bc[1];
              auVar141._12_4_ = afStack_1fc[2] + afStack_1bc[2];
              auVar141._16_4_ = afStack_1fc[3] + afStack_1bc[3];
              auVar141._20_4_ = afStack_1fc[4] + afStack_1bc[4];
              auVar141._24_4_ = afStack_1fc[5] + afStack_1bc[5];
              auVar141._28_4_ = afStack_1fc[6] + afStack_1bc[6];
              in_ZMM11 = ZEXT1664(auVar141._16_16_);
              auVar127._0_4_ = auVar141._16_4_ + auVar141._0_4_;
              auVar127._4_4_ = auVar141._20_4_ + auVar141._4_4_;
              auVar127._8_4_ = auVar141._24_4_ + auVar141._8_4_;
              auVar127._12_4_ = auVar141._28_4_ + auVar141._12_4_;
              auVar108 = vhaddps_avx(auVar127,auVar127);
              auVar108 = vhaddps_avx(auVar108,auVar108);
              fVar102 = auVar108._0_4_;
              lVar71 = lVar96;
              if (uVar84 != uVar86) {
                do {
                  fVar102 = fVar102 + *(float *)(lVar85 + lVar71 * 4) *
                                      *(float *)((long)pvVar64 + lVar71 * 4);
                  lVar71 = lVar71 + 1;
                } while (lVar71 < lVar98);
              }
              *(float *)((long)pvVar79 +
                        (long)(iVar82 * iVar50 + iVar51 * iVar76 + iVar94 * iVar44 + (int)uVar67 * 4
                              )) = fVar102;
              uVar67 = uVar67 + 1;
              local_350._0_4_ = (int)sVar13;
              iVar55 = iVar55 + (int)local_350;
            } while (uVar67 != uVar60);
          }
          uVar67 = 0;
          iVar83 = iVar83 + 1;
        } while (iVar83 != iVar42);
        return;
      }
    }
    goto LAB_0012f2e0;
  case GGML_OP_SOFT_MAX:
    goto switchD_001270fa_caseD_1d;
  case GGML_OP_CONV_1D_1S:
    tensor_00 = (size_t *)tensor->src0;
    if (GGML_TYPE_COUNT < ((ggml_tensor *)tensor_00)->type) {
      return;
    }
    pgVar7 = tensor->src1;
    switch(((ggml_tensor *)tensor_00)->type) {
    default:
      goto switchD_001284f7_caseD_0;
    case GGML_TYPE_F16:
      if (pgVar7->type != GGML_TYPE_F32) goto LAB_0012f25e;
      if (tensor->type != GGML_TYPE_F32) goto LAB_0012f263;
      uVar41 = ((ggml_tensor *)tensor_00)->ne[0];
      if ((uVar41 & 0x80000001) != 1) goto LAB_0012f268;
      if ((int)((ggml_tensor *)tensor_00)->nb[0] != 2) goto LAB_0012f26d;
      if ((int)pgVar7->nb[0] == 4) {
        if (params->type == GGML_TASK_FINALIZE) {
          return;
        }
        uVar43 = ((ggml_tensor *)tensor_00)->ne[1];
        uVar75 = ((ggml_tensor *)tensor_00)->ne[2];
        uVar86 = pgVar7->ne[0];
        uVar53 = (int)uVar41 / 2;
        uVar60 = uVar43 + 0x1f;
        uVar90 = uVar60 & 0xffffffe0;
        if (params->type == GGML_TASK_INIT) {
          uVar90 = pgVar7->ne[1];
          sVar12 = ((ggml_tensor *)tensor_00)->nb[1];
          sVar13 = ((ggml_tensor *)tensor_00)->nb[2];
          sVar14 = pgVar7->nb[1];
          iVar44 = 0;
          memset(params->wdata,0,params->wsize);
          pvVar64 = params->wdata;
          if (0 < (int)uVar75) {
            local_370._0_4_ = (int)sVar12;
            local_380._0_4_ = (int)sVar13;
            lVar98 = 0;
            uVar100 = 0;
            do {
              if (0 < (int)uVar43) {
                puVar61 = (undefined2 *)((long)pvVar64 + (long)iVar44 * 2);
                lVar85 = (long)((ggml_tensor *)tensor_00)->data + lVar98;
                uVar67 = 0;
                do {
                  if (0 < (int)uVar41) {
                    uVar58 = 0;
                    puVar77 = puVar61;
                    do {
                      *puVar77 = *(undefined2 *)(lVar85 + uVar58 * 2);
                      uVar58 = uVar58 + 1;
                      puVar77 = puVar77 + (uVar60 & 0xffffffe0);
                    } while (uVar41 != uVar58);
                  }
                  uVar67 = uVar67 + 1;
                  puVar61 = puVar61 + 1;
                  lVar85 = lVar85 + (int)local_370;
                } while (uVar67 != uVar43);
              }
              uVar100 = uVar100 + 1;
              iVar44 = iVar44 + (uVar60 >> 5) * uVar41 * 0x20;
              lVar98 = lVar98 + (int)local_380;
            } while (uVar100 != uVar75);
          }
          if ((int)uVar90 < 1) {
            return;
          }
          pvVar64 = pgVar7->data;
          local_348._0_4_ = (int)sVar14;
          uVar100 = 0;
          do {
            if (0 < (int)uVar86) {
              uVar67 = 0;
              do {
                auVar108 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pvVar64 + uVar67 * 4)),0);
                vpextrw_avx(auVar108,0);
                uVar67 = uVar67 + 1;
              } while (uVar86 != uVar67);
            }
            uVar100 = uVar100 + 1;
            pvVar64 = (void *)((long)pvVar64 + (long)(int)local_348);
          } while (uVar100 != uVar90);
          return;
        }
        iVar44 = (int)(uVar75 + params->nth + -1) / params->nth;
        iVar76 = iVar44 * params->ith;
        uVar43 = iVar76 + iVar44;
        if ((int)uVar75 <= iVar76 + iVar44) {
          uVar43 = uVar75;
        }
        if ((int)uVar43 <= iVar76) {
          return;
        }
        sVar12 = tensor->nb[1];
        pvVar64 = tensor->data;
        local_380 = (long)iVar76;
        lVar85 = ((ulong)uVar53 - (long)(int)uVar53) * (long)(int)uVar90;
        lVar98 = (long)(int)uVar90 * 2;
        iVar44 = params->ith * uVar41 * (uVar60 >> 5) * iVar44 * 0x20;
        do {
          if (0 < (int)uVar86) {
            lVar91 = local_380 * (int)sVar12;
            pvVar79 = params->wdata;
            lVar96 = (long)pvVar79 + (long)(int)(uVar75 * uVar41 * uVar90) * 2 + lVar85 * 2;
            uVar100 = 0;
            do {
              *(undefined4 *)((long)pvVar64 + uVar100 * 4 + lVar91) = 0;
              auVar212 = ZEXT1664(ZEXT816(0) << 0x40);
              lVar99 = (long)iVar44 * 2 + lVar85 * 2 + (long)pvVar79;
              lVar57 = lVar96;
              iVar76 = -uVar53;
              do {
                local_1a0._0_16_ = ZEXT816(0);
                local_1a0 = ZEXT1632(local_1a0._0_16_);
                _local_1c0 = ZEXT816(0);
                _local_1c0 = ZEXT1632(_local_1c0);
                _local_1e0 = ZEXT816(0);
                _local_1e0 = ZEXT1632(_local_1e0);
                _local_200 = ZEXT816(0);
                _local_200 = ZEXT1632(_local_200);
                if (0 < (int)uVar90) {
                  uVar67 = 0;
                  lVar71 = lVar57;
                  lVar95 = lVar99;
                  do {
                    lVar47 = 0;
                    do {
                      auVar130 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar95 + lVar47));
                      auVar197 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar71 + lVar47));
                      auVar108 = vfmadd213ps_fma(auVar197,auVar130,
                                                 *(undefined1 (*) [32])(local_200 + lVar47 * 2));
                      *(undefined1 (*) [32])(local_200 + lVar47 * 2) = ZEXT1632(auVar108);
                      lVar47 = lVar47 + 0x10;
                    } while (lVar47 != 0x40);
                    uVar67 = uVar67 + 0x20;
                    lVar71 = lVar71 + 0x40;
                    lVar95 = lVar95 + 0x40;
                  } while (uVar67 < uVar90);
                }
                lVar71 = 0;
                do {
                  fVar102 = *(float *)(local_1e0 + lVar71 + 4);
                  fVar3 = *(float *)(local_1e0 + lVar71 + 8);
                  fVar214 = *(float *)(local_1e0 + lVar71 + 0xc);
                  fVar25 = *(float *)(local_1e0 + lVar71 + 0x10);
                  fVar26 = *(float *)(local_1e0 + lVar71 + 0x14);
                  fVar27 = *(float *)(local_1e0 + lVar71 + 0x18);
                  fVar28 = *(float *)(local_1e0 + lVar71 + 0x1c);
                  *(float *)(local_200 + lVar71) =
                       *(float *)(local_200 + lVar71) + *(float *)(local_1e0 + lVar71);
                  *(float *)(local_200 + lVar71 + 4) = *(float *)(local_200 + lVar71 + 4) + fVar102;
                  *(float *)(local_200 + lVar71 + 8) = *(float *)(local_200 + lVar71 + 8) + fVar3;
                  *(float *)(local_200 + lVar71 + 0xc) =
                       *(float *)(local_200 + lVar71 + 0xc) + fVar214;
                  *(float *)(local_200 + lVar71 + 0x10) =
                       *(float *)(local_200 + lVar71 + 0x10) + fVar25;
                  *(float *)(local_200 + lVar71 + 0x14) =
                       *(float *)(local_200 + lVar71 + 0x14) + fVar26;
                  *(float *)(local_200 + lVar71 + 0x18) =
                       *(float *)(local_200 + lVar71 + 0x18) + fVar27;
                  *(float *)(local_200 + lVar71 + 0x1c) =
                       *(float *)(local_200 + lVar71 + 0x1c) + fVar28;
                  lVar71 = lVar71 + 0x40;
                } while (lVar71 == 0x40);
                auVar157._0_4_ =
                     (float)local_200 + (float)local_1c0 + afStack_1fc[3] + afStack_1bc[3];
                auVar157._4_4_ = afStack_1fc[0] + afStack_1bc[0] + afStack_1fc[0] + afStack_1bc[0];
                auVar157._8_4_ = afStack_1fc[1] + afStack_1bc[1] + afStack_1fc[5] + afStack_1bc[5];
                auVar157._12_4_ = afStack_1fc[2] + afStack_1bc[2] + afStack_1fc[6] + afStack_1bc[6];
                auVar108 = vhaddps_avx(auVar157,auVar157);
                auVar108 = vhaddps_avx(auVar108,auVar108);
                fVar102 = auVar212._0_4_ + auVar108._0_4_;
                auVar212 = ZEXT464((uint)fVar102);
                *(float *)((long)pvVar64 + uVar100 * 4 + lVar91) = fVar102;
                iVar76 = iVar76 + 1;
                lVar57 = lVar57 + lVar98;
                lVar99 = lVar99 + lVar98;
              } while (uVar53 + 1 != iVar76);
              uVar100 = uVar100 + 1;
              lVar96 = lVar96 + lVar98;
            } while (uVar100 != uVar86);
          }
          local_380 = local_380 + 1;
          iVar44 = iVar44 + (uVar60 >> 5) * uVar41 * 0x20;
        } while (local_380 != (int)uVar43);
        return;
      }
      goto LAB_0012f272;
    case GGML_TYPE_F32:
      if (pgVar7->type != GGML_TYPE_F32) goto LAB_0012f290;
      if (tensor->type != GGML_TYPE_F32) goto LAB_0012f295;
      uVar41 = ((ggml_tensor *)tensor_00)->ne[0];
      if ((uVar41 & 0x80000001) != 1) goto LAB_0012f29a;
      if ((int)((ggml_tensor *)tensor_00)->nb[0] != 4) goto LAB_0012f29f;
      if ((int)pgVar7->nb[0] == 4) {
        if (params->type == GGML_TASK_FINALIZE) {
          return;
        }
        uVar43 = ((ggml_tensor *)tensor_00)->ne[1];
        uVar75 = ((ggml_tensor *)tensor_00)->ne[2];
        uVar86 = pgVar7->ne[0];
        uVar53 = (int)uVar41 / 2;
        uVar90 = uVar43 + 0x1f;
        uVar60 = uVar90 & 0xffffffe0;
        if (params->type == GGML_TASK_INIT) {
          uVar80 = pgVar7->ne[1];
          sVar12 = ((ggml_tensor *)tensor_00)->nb[1];
          sVar13 = ((ggml_tensor *)tensor_00)->nb[2];
          sVar14 = pgVar7->nb[1];
          iVar44 = 0;
          memset(params->wdata,0,params->wsize);
          pvVar64 = params->wdata;
          if (0 < (int)uVar75) {
            local_370._0_4_ = (int)sVar12;
            local_380._0_4_ = (int)sVar13;
            lVar98 = 0;
            uVar100 = 0;
            do {
              if (0 < (int)uVar43) {
                puVar48 = (undefined4 *)((long)pvVar64 + (long)iVar44 * 4);
                lVar85 = (long)((ggml_tensor *)tensor_00)->data + lVar98;
                uVar67 = 0;
                do {
                  if (0 < (int)uVar41) {
                    uVar58 = 0;
                    puVar73 = puVar48;
                    do {
                      *puVar73 = *(undefined4 *)(lVar85 + uVar58 * 4);
                      uVar58 = uVar58 + 1;
                      puVar73 = puVar73 + (uVar90 & 0xffffffe0);
                    } while (uVar41 != uVar58);
                  }
                  uVar67 = uVar67 + 1;
                  puVar48 = puVar48 + 1;
                  lVar85 = lVar85 + (int)local_370;
                } while (uVar67 != uVar43);
              }
              uVar100 = uVar100 + 1;
              iVar44 = iVar44 + (uVar90 >> 5) * uVar41 * 0x20;
              lVar98 = lVar98 + (int)local_380;
            } while (uVar100 != uVar75);
          }
          if ((int)uVar80 < 1) {
            return;
          }
          pvVar79 = pgVar7->data;
          local_348._0_4_ = (int)sVar14;
          puVar48 = (undefined4 *)
                    ((long)pvVar64 +
                    (long)(int)(uVar75 * uVar41 * uVar60) * 4 +
                    (ulong)uVar53 * (long)(int)uVar60 * 4);
          uVar100 = 0;
          do {
            if (0 < (int)uVar86) {
              uVar67 = 0;
              puVar73 = puVar48;
              do {
                *puVar73 = *(undefined4 *)((long)pvVar79 + uVar67 * 4);
                uVar67 = uVar67 + 1;
                puVar73 = puVar73 + (int)uVar60;
              } while (uVar86 != uVar67);
            }
            uVar100 = uVar100 + 1;
            puVar48 = puVar48 + 1;
            pvVar79 = (void *)((long)pvVar79 + (long)(int)local_348);
          } while (uVar100 != uVar80);
          return;
        }
        iVar44 = (int)(uVar75 + params->nth + -1) / params->nth;
        iVar76 = iVar44 * params->ith;
        uVar43 = iVar76 + iVar44;
        if ((int)uVar75 <= iVar76 + iVar44) {
          uVar43 = uVar75;
        }
        if ((int)uVar43 <= iVar76) {
          return;
        }
        sVar12 = tensor->nb[1];
        pvVar64 = tensor->data;
        local_370 = (long)iVar76;
        lVar85 = ((ulong)uVar53 - (long)(int)uVar53) * (long)(int)uVar60;
        lVar98 = (long)(int)uVar60 * 4;
        iVar44 = params->ith * uVar41 * (uVar90 >> 5) * iVar44 * 0x20;
        do {
          if (0 < (int)uVar86) {
            lVar91 = local_370 * (int)sVar12;
            pvVar79 = params->wdata;
            lVar96 = (long)(int)(uVar75 * uVar41 * uVar60) * 4 + lVar85 * 4 + (long)pvVar79;
            uVar100 = 0;
            do {
              *(undefined4 *)((long)pvVar64 + uVar100 * 4 + lVar91) = 0;
              auVar212 = ZEXT1664(ZEXT816(0) << 0x40);
              lVar99 = lVar96;
              lVar57 = (long)iVar44 * 4 + lVar85 * 4 + (long)pvVar79;
              iVar76 = -uVar53;
              do {
                local_1a0._0_16_ = ZEXT816(0);
                local_1a0 = ZEXT1632(local_1a0._0_16_);
                _local_1c0 = ZEXT816(0);
                _local_1c0 = ZEXT1632(_local_1c0);
                _local_1e0 = ZEXT816(0);
                _local_1e0 = ZEXT1632(_local_1e0);
                _local_200 = ZEXT816(0);
                _local_200 = ZEXT1632(_local_200);
                if (0 < (int)uVar60) {
                  uVar67 = 0;
                  lVar71 = lVar57;
                  lVar95 = lVar99;
                  do {
                    lVar47 = 0;
                    do {
                      auVar108 = vfmadd213ps_fma(*(undefined1 (*) [32])(lVar95 + lVar47),
                                                 *(undefined1 (*) [32])(lVar71 + lVar47),
                                                 *(undefined1 (*) [32])(local_200 + lVar47));
                      *(undefined1 (*) [32])(local_200 + lVar47) = ZEXT1632(auVar108);
                      lVar47 = lVar47 + 0x20;
                    } while (lVar47 != 0x80);
                    uVar67 = uVar67 + 0x20;
                    lVar95 = lVar95 + 0x80;
                    lVar71 = lVar71 + 0x80;
                  } while (uVar67 < uVar60);
                }
                lVar71 = 0;
                do {
                  fVar102 = *(float *)(local_1e0 + lVar71 + 4);
                  fVar3 = *(float *)(local_1e0 + lVar71 + 8);
                  fVar214 = *(float *)(local_1e0 + lVar71 + 0xc);
                  fVar25 = *(float *)(local_1e0 + lVar71 + 0x10);
                  fVar26 = *(float *)(local_1e0 + lVar71 + 0x14);
                  fVar27 = *(float *)(local_1e0 + lVar71 + 0x18);
                  fVar28 = *(float *)(local_1e0 + lVar71 + 0x1c);
                  *(float *)(local_200 + lVar71) =
                       *(float *)(local_200 + lVar71) + *(float *)(local_1e0 + lVar71);
                  *(float *)(local_200 + lVar71 + 4) = *(float *)(local_200 + lVar71 + 4) + fVar102;
                  *(float *)(local_200 + lVar71 + 8) = *(float *)(local_200 + lVar71 + 8) + fVar3;
                  *(float *)(local_200 + lVar71 + 0xc) =
                       *(float *)(local_200 + lVar71 + 0xc) + fVar214;
                  *(float *)(local_200 + lVar71 + 0x10) =
                       *(float *)(local_200 + lVar71 + 0x10) + fVar25;
                  *(float *)(local_200 + lVar71 + 0x14) =
                       *(float *)(local_200 + lVar71 + 0x14) + fVar26;
                  *(float *)(local_200 + lVar71 + 0x18) =
                       *(float *)(local_200 + lVar71 + 0x18) + fVar27;
                  *(float *)(local_200 + lVar71 + 0x1c) =
                       *(float *)(local_200 + lVar71 + 0x1c) + fVar28;
                  lVar71 = lVar71 + 0x40;
                } while (lVar71 == 0x40);
                auVar150._0_4_ =
                     (float)local_200 + (float)local_1c0 + afStack_1fc[3] + afStack_1bc[3];
                auVar150._4_4_ = afStack_1fc[0] + afStack_1bc[0] + afStack_1fc[0] + afStack_1bc[0];
                auVar150._8_4_ = afStack_1fc[1] + afStack_1bc[1] + afStack_1fc[5] + afStack_1bc[5];
                auVar150._12_4_ = afStack_1fc[2] + afStack_1bc[2] + afStack_1fc[6] + afStack_1bc[6];
                auVar108 = vhaddps_avx(auVar150,auVar150);
                auVar108 = vhaddps_avx(auVar108,auVar108);
                fVar102 = auVar212._0_4_ + auVar108._0_4_;
                auVar212 = ZEXT464((uint)fVar102);
                *(float *)((long)pvVar64 + uVar100 * 4 + lVar91) = fVar102;
                iVar76 = iVar76 + 1;
                lVar99 = lVar99 + lVar98;
                lVar57 = lVar57 + lVar98;
              } while (uVar53 + 1 != iVar76);
              uVar100 = uVar100 + 1;
              lVar96 = lVar96 + lVar98;
            } while (uVar100 != uVar86);
          }
          local_370 = local_370 + 1;
          iVar44 = iVar44 + (uVar90 >> 5) * uVar41 * 0x20;
        } while (local_370 != (int)uVar43);
        return;
      }
    }
    goto LAB_0012f2a4;
  case GGML_OP_CONV_1D_2S:
    tensor_00 = (size_t *)tensor->src0;
    if (GGML_TYPE_COUNT < ((ggml_tensor *)tensor_00)->type) {
      return;
    }
    pgVar7 = tensor->src1;
    switch(((ggml_tensor *)tensor_00)->type) {
    default:
      goto switchD_00128299_caseD_0;
    case GGML_TYPE_F16:
      if (pgVar7->type != GGML_TYPE_F32) goto LAB_0012f245;
      if (tensor->type != GGML_TYPE_F32) goto LAB_0012f24a;
      uVar41 = ((ggml_tensor *)tensor_00)->ne[0];
      if ((uVar41 & 0x80000001) != 1) goto LAB_0012f24f;
      if ((int)((ggml_tensor *)tensor_00)->nb[0] != 2) goto LAB_0012f254;
      if ((int)pgVar7->nb[0] == 4) {
        if (params->type == GGML_TASK_FINALIZE) {
          return;
        }
        uVar43 = ((ggml_tensor *)tensor_00)->ne[1];
        uVar75 = ((ggml_tensor *)tensor_00)->ne[2];
        uVar86 = pgVar7->ne[0];
        uVar53 = (int)uVar41 / 2;
        uVar90 = uVar43 + 0x1f;
        uVar60 = uVar90 & 0xffffffe0;
        if (params->type == GGML_TASK_INIT) {
          uVar60 = pgVar7->ne[1];
          sVar12 = ((ggml_tensor *)tensor_00)->nb[1];
          sVar13 = ((ggml_tensor *)tensor_00)->nb[2];
          sVar14 = pgVar7->nb[1];
          iVar44 = 0;
          memset(params->wdata,0,params->wsize);
          pvVar64 = params->wdata;
          if (0 < (int)uVar75) {
            local_380._0_4_ = (int)sVar12;
            local_368._0_4_ = (int)sVar13;
            lVar98 = 0;
            uVar100 = 0;
            do {
              if (0 < (int)uVar43) {
                puVar61 = (undefined2 *)((long)pvVar64 + (long)iVar44 * 2);
                lVar85 = (long)((ggml_tensor *)tensor_00)->data + lVar98;
                uVar67 = 0;
                do {
                  if (0 < (int)uVar41) {
                    uVar58 = 0;
                    puVar77 = puVar61;
                    do {
                      *puVar77 = *(undefined2 *)(lVar85 + uVar58 * 2);
                      uVar58 = uVar58 + 1;
                      puVar77 = puVar77 + (uVar90 & 0xffffffe0);
                    } while (uVar41 != uVar58);
                  }
                  uVar67 = uVar67 + 1;
                  puVar61 = puVar61 + 1;
                  lVar85 = lVar85 + (int)local_380;
                } while (uVar67 != uVar43);
              }
              uVar100 = uVar100 + 1;
              iVar44 = iVar44 + (uVar90 >> 5) * uVar41 * 0x20;
              lVar98 = lVar98 + (int)local_368;
            } while (uVar100 != uVar75);
          }
          if ((int)uVar60 < 1) {
            return;
          }
          pvVar64 = pgVar7->data;
          local_280._0_4_ = (undefined4)sVar14;
          uVar100 = 0;
          do {
            if (0 < (int)uVar86) {
              uVar67 = 0;
              do {
                auVar108 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pvVar64 + uVar67 * 4)),0);
                vpextrw_avx(auVar108,0);
                uVar67 = uVar67 + 1;
              } while (uVar86 != uVar67);
            }
            uVar100 = uVar100 + 1;
            pvVar64 = (void *)((long)pvVar64 + (long)(int)local_280._0_4_);
          } while (uVar100 != uVar60);
          return;
        }
        iVar44 = (int)(uVar75 + params->nth + -1) / params->nth;
        iVar76 = iVar44 * params->ith;
        uVar43 = iVar76 + iVar44;
        if ((int)uVar75 <= iVar76 + iVar44) {
          uVar43 = uVar75;
        }
        if ((int)uVar43 <= iVar76) {
          return;
        }
        sVar12 = tensor->nb[1];
        pvVar64 = tensor->data;
        lVar98 = (long)(int)uVar60;
        local_360 = (ulong)iVar76;
        lVar85 = ((ulong)uVar53 - (long)(int)uVar53) * lVar98;
        iVar44 = params->ith * uVar41 * (uVar90 >> 5) * iVar44 * 0x20;
        do {
          if (0 < (int)uVar86) {
            lVar91 = local_360 * (long)(int)sVar12;
            pvVar79 = params->wdata;
            lVar96 = (long)(int)(uVar75 * uVar41 * uVar60) * 2 + lVar85 * 2 + (long)pvVar79;
            uVar100 = 0;
            do {
              *(undefined4 *)((long)pvVar64 + uVar100 * 2 + lVar91) = 0;
              auVar212 = ZEXT1664(ZEXT816(0) << 0x40);
              lVar99 = lVar96;
              lVar57 = (long)iVar44 * 2 + lVar85 * 2 + (long)pvVar79;
              iVar76 = -uVar53;
              do {
                local_1a0._0_16_ = ZEXT816(0);
                local_1a0 = ZEXT1632(local_1a0._0_16_);
                _local_1c0 = ZEXT816(0);
                _local_1c0 = ZEXT1632(_local_1c0);
                _local_1e0 = ZEXT816(0);
                _local_1e0 = ZEXT1632(_local_1e0);
                _local_200 = ZEXT816(0);
                _local_200 = ZEXT1632(_local_200);
                if (0 < (int)uVar60) {
                  uVar67 = 0;
                  lVar71 = lVar99;
                  lVar95 = lVar57;
                  do {
                    lVar47 = 0;
                    do {
                      auVar130 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar95 + lVar47));
                      auVar197 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar71 + lVar47));
                      auVar108 = vfmadd213ps_fma(auVar197,auVar130,
                                                 *(undefined1 (*) [32])(local_200 + lVar47 * 2));
                      *(undefined1 (*) [32])(local_200 + lVar47 * 2) = ZEXT1632(auVar108);
                      lVar47 = lVar47 + 0x10;
                    } while (lVar47 != 0x40);
                    uVar67 = uVar67 + 0x20;
                    lVar71 = lVar71 + 0x40;
                    lVar95 = lVar95 + 0x40;
                  } while (uVar67 < uVar60);
                }
                lVar71 = 0;
                do {
                  fVar102 = *(float *)(local_1e0 + lVar71 + 4);
                  fVar3 = *(float *)(local_1e0 + lVar71 + 8);
                  fVar214 = *(float *)(local_1e0 + lVar71 + 0xc);
                  fVar25 = *(float *)(local_1e0 + lVar71 + 0x10);
                  fVar26 = *(float *)(local_1e0 + lVar71 + 0x14);
                  fVar27 = *(float *)(local_1e0 + lVar71 + 0x18);
                  fVar28 = *(float *)(local_1e0 + lVar71 + 0x1c);
                  *(float *)(local_200 + lVar71) =
                       *(float *)(local_200 + lVar71) + *(float *)(local_1e0 + lVar71);
                  *(float *)(local_200 + lVar71 + 4) = *(float *)(local_200 + lVar71 + 4) + fVar102;
                  *(float *)(local_200 + lVar71 + 8) = *(float *)(local_200 + lVar71 + 8) + fVar3;
                  *(float *)(local_200 + lVar71 + 0xc) =
                       *(float *)(local_200 + lVar71 + 0xc) + fVar214;
                  *(float *)(local_200 + lVar71 + 0x10) =
                       *(float *)(local_200 + lVar71 + 0x10) + fVar25;
                  *(float *)(local_200 + lVar71 + 0x14) =
                       *(float *)(local_200 + lVar71 + 0x14) + fVar26;
                  *(float *)(local_200 + lVar71 + 0x18) =
                       *(float *)(local_200 + lVar71 + 0x18) + fVar27;
                  *(float *)(local_200 + lVar71 + 0x1c) =
                       *(float *)(local_200 + lVar71 + 0x1c) + fVar28;
                  lVar71 = lVar71 + 0x40;
                } while (lVar71 == 0x40);
                auVar122._0_4_ =
                     (float)local_200 + (float)local_1c0 + afStack_1fc[3] + afStack_1bc[3];
                auVar122._4_4_ = afStack_1fc[0] + afStack_1bc[0] + afStack_1fc[0] + afStack_1bc[0];
                auVar122._8_4_ = afStack_1fc[1] + afStack_1bc[1] + afStack_1fc[5] + afStack_1bc[5];
                auVar122._12_4_ = afStack_1fc[2] + afStack_1bc[2] + afStack_1fc[6] + afStack_1bc[6];
                auVar108 = vhaddps_avx(auVar122,auVar122);
                auVar108 = vhaddps_avx(auVar108,auVar108);
                fVar102 = auVar212._0_4_ + auVar108._0_4_;
                auVar212 = ZEXT464((uint)fVar102);
                *(float *)((long)pvVar64 + (uVar100 >> 1) * 4 + lVar91) = fVar102;
                iVar76 = iVar76 + 1;
                lVar99 = lVar99 + lVar98 * 2;
                lVar57 = lVar57 + lVar98 * 2;
              } while (uVar53 + 1 != iVar76);
              uVar100 = uVar100 + 2;
              lVar96 = lVar96 + lVar98 * 4;
            } while ((long)uVar100 < (long)(int)uVar86);
          }
          local_360 = local_360 + 1;
          iVar44 = iVar44 + (uVar90 >> 5) * uVar41 * 0x20;
        } while (local_360 != (long)(int)uVar43);
        return;
      }
      goto LAB_0012f259;
    case GGML_TYPE_F32:
      if (pgVar7->type != GGML_TYPE_F32) goto LAB_0012f277;
      if (tensor->type != GGML_TYPE_F32) goto LAB_0012f27c;
      uVar41 = ((ggml_tensor *)tensor_00)->ne[0];
      if ((uVar41 & 0x80000001) != 1) goto LAB_0012f281;
      if ((int)((ggml_tensor *)tensor_00)->nb[0] != 4) goto LAB_0012f286;
      if ((int)pgVar7->nb[0] == 4) {
        if (params->type == GGML_TASK_FINALIZE) {
          return;
        }
        uVar43 = ((ggml_tensor *)tensor_00)->ne[1];
        uVar75 = ((ggml_tensor *)tensor_00)->ne[2];
        uVar86 = pgVar7->ne[0];
        uVar53 = (int)uVar41 / 2;
        uVar90 = uVar43 + 0x1f;
        uVar60 = uVar90 & 0xffffffe0;
        if (params->type == GGML_TASK_INIT) {
          uVar80 = pgVar7->ne[1];
          sVar12 = ((ggml_tensor *)tensor_00)->nb[1];
          sVar13 = ((ggml_tensor *)tensor_00)->nb[2];
          sVar14 = pgVar7->nb[1];
          iVar44 = 0;
          memset(params->wdata,0,params->wsize);
          pvVar64 = params->wdata;
          if (0 < (int)uVar75) {
            local_380._0_4_ = (int)sVar12;
            local_368._0_4_ = (int)sVar13;
            lVar98 = 0;
            uVar100 = 0;
            do {
              if (0 < (int)uVar43) {
                puVar48 = (undefined4 *)((long)pvVar64 + (long)iVar44 * 4);
                lVar85 = (long)((ggml_tensor *)tensor_00)->data + lVar98;
                uVar67 = 0;
                do {
                  if (0 < (int)uVar41) {
                    uVar58 = 0;
                    puVar73 = puVar48;
                    do {
                      *puVar73 = *(undefined4 *)(lVar85 + uVar58 * 4);
                      uVar58 = uVar58 + 1;
                      puVar73 = puVar73 + (uVar90 & 0xffffffe0);
                    } while (uVar41 != uVar58);
                  }
                  uVar67 = uVar67 + 1;
                  puVar48 = puVar48 + 1;
                  lVar85 = lVar85 + (int)local_380;
                } while (uVar67 != uVar43);
              }
              uVar100 = uVar100 + 1;
              iVar44 = iVar44 + (uVar90 >> 5) * uVar41 * 0x20;
              lVar98 = lVar98 + (int)local_368;
            } while (uVar100 != uVar75);
          }
          if ((int)uVar80 < 1) {
            return;
          }
          pvVar79 = pgVar7->data;
          local_350._0_4_ = (int)sVar14;
          puVar48 = (undefined4 *)
                    ((long)pvVar64 +
                    (long)(int)(uVar75 * uVar41 * uVar60) * 4 +
                    (ulong)uVar53 * (long)(int)uVar60 * 4);
          uVar100 = 0;
          do {
            if (0 < (int)uVar86) {
              uVar67 = 0;
              puVar73 = puVar48;
              do {
                *puVar73 = *(undefined4 *)((long)pvVar79 + uVar67 * 4);
                uVar67 = uVar67 + 1;
                puVar73 = puVar73 + (int)uVar60;
              } while (uVar86 != uVar67);
            }
            uVar100 = uVar100 + 1;
            puVar48 = puVar48 + 1;
            pvVar79 = (void *)((long)pvVar79 + (long)(int)local_350);
          } while (uVar100 != uVar80);
          return;
        }
        iVar44 = (int)(uVar75 + params->nth + -1) / params->nth;
        iVar76 = iVar44 * params->ith;
        uVar43 = iVar76 + iVar44;
        if ((int)uVar75 <= iVar76 + iVar44) {
          uVar43 = uVar75;
        }
        if ((int)uVar43 <= iVar76) {
          return;
        }
        sVar12 = tensor->nb[1];
        pvVar64 = tensor->data;
        lVar85 = (long)(int)uVar60;
        local_350 = (long)iVar76;
        lVar98 = ((ulong)uVar53 - (long)(int)uVar53) * lVar85;
        iVar44 = params->ith * uVar41 * (uVar90 >> 5) * iVar44 * 0x20;
        do {
          if (0 < (int)uVar86) {
            lVar91 = local_350 * (int)sVar12;
            pvVar79 = params->wdata;
            lVar96 = (long)pvVar79 + (long)(int)(uVar75 * uVar41 * uVar60) * 4 + lVar98 * 4;
            uVar100 = 0;
            do {
              *(undefined4 *)((long)pvVar64 + uVar100 * 2 + lVar91) = 0;
              auVar212 = ZEXT1664(ZEXT816(0) << 0x40);
              lVar99 = (long)iVar44 * 4 + lVar98 * 4 + (long)pvVar79;
              lVar57 = lVar96;
              iVar76 = -uVar53;
              do {
                local_1a0._0_16_ = ZEXT816(0);
                local_1a0 = ZEXT1632(local_1a0._0_16_);
                _local_1c0 = ZEXT816(0);
                _local_1c0 = ZEXT1632(_local_1c0);
                _local_1e0 = ZEXT816(0);
                _local_1e0 = ZEXT1632(_local_1e0);
                _local_200 = ZEXT816(0);
                _local_200 = ZEXT1632(_local_200);
                if (0 < (int)uVar60) {
                  uVar67 = 0;
                  lVar71 = lVar99;
                  lVar95 = lVar57;
                  do {
                    lVar47 = 0;
                    do {
                      auVar108 = vfmadd213ps_fma(*(undefined1 (*) [32])(lVar95 + lVar47),
                                                 *(undefined1 (*) [32])(lVar71 + lVar47),
                                                 *(undefined1 (*) [32])(local_200 + lVar47));
                      *(undefined1 (*) [32])(local_200 + lVar47) = ZEXT1632(auVar108);
                      lVar47 = lVar47 + 0x20;
                    } while (lVar47 != 0x80);
                    uVar67 = uVar67 + 0x20;
                    lVar95 = lVar95 + 0x80;
                    lVar71 = lVar71 + 0x80;
                  } while (uVar67 < uVar60);
                }
                lVar71 = 0;
                do {
                  fVar102 = *(float *)(local_1e0 + lVar71 + 4);
                  fVar3 = *(float *)(local_1e0 + lVar71 + 8);
                  fVar214 = *(float *)(local_1e0 + lVar71 + 0xc);
                  fVar25 = *(float *)(local_1e0 + lVar71 + 0x10);
                  fVar26 = *(float *)(local_1e0 + lVar71 + 0x14);
                  fVar27 = *(float *)(local_1e0 + lVar71 + 0x18);
                  fVar28 = *(float *)(local_1e0 + lVar71 + 0x1c);
                  *(float *)(local_200 + lVar71) =
                       *(float *)(local_200 + lVar71) + *(float *)(local_1e0 + lVar71);
                  *(float *)(local_200 + lVar71 + 4) = *(float *)(local_200 + lVar71 + 4) + fVar102;
                  *(float *)(local_200 + lVar71 + 8) = *(float *)(local_200 + lVar71 + 8) + fVar3;
                  *(float *)(local_200 + lVar71 + 0xc) =
                       *(float *)(local_200 + lVar71 + 0xc) + fVar214;
                  *(float *)(local_200 + lVar71 + 0x10) =
                       *(float *)(local_200 + lVar71 + 0x10) + fVar25;
                  *(float *)(local_200 + lVar71 + 0x14) =
                       *(float *)(local_200 + lVar71 + 0x14) + fVar26;
                  *(float *)(local_200 + lVar71 + 0x18) =
                       *(float *)(local_200 + lVar71 + 0x18) + fVar27;
                  *(float *)(local_200 + lVar71 + 0x1c) =
                       *(float *)(local_200 + lVar71 + 0x1c) + fVar28;
                  lVar71 = lVar71 + 0x40;
                } while (lVar71 == 0x40);
                auVar108._0_4_ =
                     (float)local_200 + (float)local_1c0 + afStack_1fc[3] + afStack_1bc[3];
                auVar108._4_4_ = afStack_1fc[0] + afStack_1bc[0] + afStack_1fc[0] + afStack_1bc[0];
                auVar108._8_4_ = afStack_1fc[1] + afStack_1bc[1] + afStack_1fc[5] + afStack_1bc[5];
                auVar108._12_4_ = afStack_1fc[2] + afStack_1bc[2] + afStack_1fc[6] + afStack_1bc[6];
                auVar108 = vhaddps_avx(auVar108,auVar108);
                auVar108 = vhaddps_avx(auVar108,auVar108);
                fVar102 = auVar212._0_4_ + auVar108._0_4_;
                auVar212 = ZEXT464((uint)fVar102);
                *(float *)((long)pvVar64 + (uVar100 >> 1) * 4 + lVar91) = fVar102;
                iVar76 = iVar76 + 1;
                lVar57 = lVar57 + lVar85 * 4;
                lVar99 = lVar99 + lVar85 * 4;
              } while (uVar53 + 1 != iVar76);
              uVar100 = uVar100 + 2;
              lVar96 = lVar96 + lVar85 * 8;
            } while ((long)uVar100 < (long)(int)uVar86);
          }
          local_350 = local_350 + 1;
          iVar44 = iVar44 + (uVar90 >> 5) * uVar41 * 0x20;
        } while (local_350 != (int)uVar43);
        return;
      }
    }
    goto LAB_0012f28b;
  case GGML_OP_FLASH_ATTN:
    goto switchD_001270fa_caseD_21;
  case GGML_OP_FLASH_FF:
    goto switchD_001270fa_caseD_22;
  case GGML_OP_COUNT:
    goto switchD_001270fa_caseD_23;
  }
switchD_001270fa_caseD_17:
  return;
switchD_001280eb_caseD_1:
  uVar41 = pgVar7->ne[2];
  uVar43 = pgVar5->ne[2];
  local_318 = (ulong)uVar43;
  if (uVar41 != uVar43) goto LAB_0012f367;
  uVar75 = pgVar7->ne[3];
  uVar86 = pgVar5->ne[3];
  local_2b0 = (ulong)uVar86;
  if (uVar75 != uVar86) goto LAB_0012f36c;
  uVar90 = tensor->ne[2];
  if (uVar90 != uVar43) goto LAB_0012f371;
  uVar60 = tensor->ne[3];
  if (uVar60 != uVar86) goto LAB_0012f376;
  iVar44 = (int)pgVar7->nb[1];
  iVar76 = (int)pgVar7->nb[0];
  if (iVar44 != 0x18 && iVar76 != 0x18) goto LAB_0012f37b;
  if ((int)tensor->nb[0] != 4) goto LAB_0012f380;
  iVar50 = (int)tensor->nb[1];
  if (iVar50 < 4) goto LAB_0012f385;
  iVar94 = (int)tensor->nb[2];
  if (iVar94 < iVar50) goto LAB_0012f38a;
  iVar50 = (int)tensor->nb[3];
  if (iVar50 < iVar94) goto LAB_0012f38f;
  iVar42 = pgVar7->ne[1];
  iVar72 = tensor->ne[0];
  if (iVar72 != iVar42) goto LAB_0012f394;
  uVar53 = pgVar5->ne[1];
  local_348 = (ulong)uVar53;
  uVar80 = tensor->ne[1];
  if (uVar80 != uVar53) goto LAB_0012f399;
  if (uVar90 != uVar41) goto LAB_0012f39e;
  if (uVar60 == uVar75) {
    iVar51 = uVar80 * iVar72 * uVar90;
    iVar83 = uVar60 * iVar51;
    iVar82 = params->ith;
    uVar90 = params->nth;
    if (params->type == GGML_TASK_FINALIZE) {
      if (iVar76 <= iVar44) {
        return;
      }
      pvVar64 = params->wdata;
      iVar44 = (int)(uVar90 + iVar83 + -1) / (int)uVar90;
      iVar82 = iVar82 * iVar44;
      iVar44 = iVar44 + iVar82;
      if (iVar83 <= iVar44) {
        iVar44 = iVar83;
      }
      lVar98 = (long)iVar82 * 4;
      pvVar79 = tensor->data;
      uVar41 = iVar44 - iVar82;
      if (uVar41 != 0 && iVar82 <= iVar44) {
        uVar100 = 0;
        do {
          *(undefined4 *)((long)pvVar79 + uVar100 * 4 + lVar98) =
               *(undefined4 *)((long)pvVar64 + uVar100 * 4 + (long)iVar82 * 4);
          uVar100 = uVar100 + 1;
        } while (uVar41 != uVar100);
      }
      if ((int)uVar90 < 2) {
        return;
      }
      lVar85 = (long)pvVar64 + lVar98 + (long)iVar83 * 4 + 0x40;
      uVar100 = 1;
      do {
        if (0 < (int)uVar41) {
          uVar67 = 0;
          do {
            *(float *)((long)pvVar79 + uVar67 * 4 + lVar98) =
                 *(float *)(lVar85 + uVar67 * 4) + *(float *)((long)pvVar79 + uVar67 * 4 + lVar98);
            uVar67 = uVar67 + 1;
          } while (uVar41 != uVar67);
        }
        uVar100 = uVar100 + 1;
        lVar85 = lVar85 + (long)iVar83 * 4 + 0x40;
      } while (uVar100 != uVar90);
      return;
    }
    iVar55 = pgVar5->ne[0];
    local_370 = (long)iVar55;
    local_328 = (int)pgVar5->nb[1];
    local_2a8._0_4_ = (int)pgVar5->nb[2];
    local_260 = (int)pgVar5->nb[3];
    if (params->type != GGML_TASK_INIT) {
      local_2f8._0_4_ = (int)pgVar7->nb[2];
      local_298._0_4_ = (int)pgVar7->nb[3];
      if (iVar44 < iVar76) {
        if ((int)uVar86 < 1) {
          return;
        }
        sVar12 = pgVar5->nb[0];
        iVar44 = (int)(uVar90 + iVar55 + -1) / (int)uVar90;
        iVar50 = iVar44 * iVar82;
        iVar44 = iVar44 + iVar50;
        if (iVar55 <= iVar44) {
          iVar44 = iVar55;
        }
        iVar94 = iVar42 + 0x1f;
        if (-1 < iVar42) {
          iVar94 = iVar42;
        }
        uVar41 = iVar94 >> 5;
        iVar94 = iVar50 * iVar76;
        pvVar64 = params->wdata;
        iVar55 = 0;
        auVar111[8] = 0xf;
        auVar111._0_8_ = 0xf0f0f0f0f0f0f0f;
        auVar111[9] = 0xf;
        auVar111[10] = 0xf;
        auVar111[0xb] = 0xf;
        auVar111[0xc] = 0xf;
        auVar111[0xd] = 0xf;
        auVar111[0xe] = 0xf;
        auVar111[0xf] = 0xf;
        local_2a0 = 0;
        do {
          if (0 < (int)uVar43) {
            auVar37._24_8_ = 0;
            auVar37._0_24_ = local_240._8_24_;
            local_240._0_32_ = auVar37 << 0x40;
            iVar70 = iVar94;
            do {
              local_2e0 = (int)params;
              if (0 < (int)uVar53) {
                lVar98 = (long)pvVar64 +
                         (long)local_2e0 * 4 +
                         (long)iVar55 * 4 + (long)((iVar83 + 0x10) * iVar82) * 4;
                local_370._0_4_ = local_240._0_4_ * (int)local_2f8 + (int)local_2a0 * (int)local_298
                ;
                local_358 = 0;
                do {
                  if (iVar50 < iVar44) {
                    pvVar79 = pgVar7->data;
                    pvVar78 = pgVar5->data;
                    lVar85 = (long)iVar50;
                    iVar68 = iVar70;
                    do {
                      if (0x1f < iVar42) {
                        lVar91 = (long)pvVar79 + (long)iVar68 + (long)(int)uVar41 * 8;
                        iVar69 = (int)lVar85 * iVar76 + (int)local_370;
                        local_360._0_4_ = (int)sVar12;
                        uVar93 = *(undefined4 *)
                                  ((long)pvVar78 +
                                  (long)((int)lVar85 * (int)local_360 +
                                        (int)local_358 * local_328 +
                                        local_240._0_4_ * (int)local_2a8 +
                                        (int)local_2a0 * local_260));
                        auVar135._4_4_ = uVar93;
                        auVar135._0_4_ = uVar93;
                        auVar135._8_4_ = uVar93;
                        auVar135._12_4_ = uVar93;
                        auVar135._16_4_ = uVar93;
                        auVar135._20_4_ = uVar93;
                        auVar135._24_4_ = uVar93;
                        auVar135._28_4_ = uVar93;
                        uVar100 = 0;
                        lVar96 = lVar98;
                        do {
                          uVar93 = *(undefined4 *)
                                    ((long)pvVar79 +
                                    uVar100 * 4 + (long)(int)uVar41 * 4 + (long)iVar69);
                          auVar160._4_4_ = uVar93;
                          auVar160._0_4_ = uVar93;
                          auVar160._8_4_ = uVar93;
                          auVar160._12_4_ = uVar93;
                          auVar160._16_4_ = uVar93;
                          auVar160._20_4_ = uVar93;
                          auVar160._24_4_ = uVar93;
                          auVar160._28_4_ = uVar93;
                          uVar93 = *(undefined4 *)((long)pvVar79 + uVar100 * 4 + (long)iVar69);
                          auVar173._4_4_ = uVar93;
                          auVar173._0_4_ = uVar93;
                          auVar173._8_4_ = uVar93;
                          auVar173._12_4_ = uVar93;
                          auVar173._16_4_ = uVar93;
                          auVar173._20_4_ = uVar93;
                          auVar173._24_4_ = uVar93;
                          auVar173._28_4_ = uVar93;
                          lVar99 = 0;
                          do {
                            auVar179._8_8_ = 0;
                            auVar179._0_8_ = *(ulong *)(lVar91 + lVar99);
                            auVar108 = vpand_avx(auVar179,auVar111);
                            auVar122 = vpsrlw_avx(auVar179,4);
                            auVar122 = vpand_avx(auVar122,auVar111);
                            auVar130 = vpmovzxbd_avx2(auVar108);
                            auVar130 = vcvtdq2ps_avx(auVar130);
                            auVar108 = vfmadd213ps_fma(auVar130,auVar160,auVar173);
                            auVar130 = vpmovzxbd_avx2(auVar122);
                            auVar130 = vcvtdq2ps_avx(auVar130);
                            auVar122 = vfmadd213ps_fma(auVar130,auVar160,auVar173);
                            auVar130 = *(undefined1 (*) [32])(lVar96 + lVar99 * 8);
                            auVar197 = *(undefined1 (*) [32])(lVar96 + lVar99 * 8 + 0x20);
                            auVar207 = vshufps_avx(auVar130,auVar197,0x88);
                            auVar207 = vpermpd_avx2(auVar207,0xd8);
                            auVar130 = vshufps_avx(auVar130,auVar197,0xdd);
                            auVar130 = vpermpd_avx2(auVar130,0xd8);
                            auVar108 = vfmadd231ps_fma(auVar207,auVar135,ZEXT1632(auVar108));
                            auVar122 = vfmadd231ps_fma(auVar130,auVar135,ZEXT1632(auVar122));
                            auVar130 = vunpckhps_avx(ZEXT1632(auVar108),ZEXT1632(auVar122));
                            auVar197 = vunpcklps_avx(ZEXT1632(auVar108),ZEXT1632(auVar122));
                            auVar207 = vperm2f128_avx(auVar197,auVar130,0x31);
                            auVar130 = vperm2f128_avx(auVar197,auVar130,0x20);
                            *(undefined1 (*) [32])(lVar96 + lVar99 * 8) = auVar130;
                            *(undefined1 (*) [32])(lVar96 + lVar99 * 8 + 0x20) = auVar207;
                            lVar99 = lVar99 + 8;
                          } while (lVar99 != 0x10);
                          uVar100 = uVar100 + 1;
                          lVar91 = lVar91 + 0x10;
                          lVar96 = lVar96 + 0x80;
                        } while (uVar100 != uVar41);
                      }
                      lVar85 = lVar85 + 1;
                      iVar68 = iVar68 + iVar76;
                    } while (lVar85 != iVar44);
                  }
                  local_358 = local_358 + 1;
                  lVar98 = lVar98 + (long)iVar72 * 4;
                } while (local_358 != local_348);
              }
              uVar100 = local_240._0_8_ + 1;
              iVar70 = iVar70 + (int)local_2f8;
              params = (ggml_compute_params *)(ulong)(local_2e0 + uVar80 * iVar72);
              local_240._0_8_ = uVar100;
            } while (uVar100 != local_318);
          }
          local_2a0 = local_2a0 + 1;
          iVar94 = iVar94 + (int)local_298;
          iVar55 = iVar55 + iVar51;
        } while (local_2a0 != local_2b0);
        return;
      }
      iVar83 = uVar41 * iVar42;
      iVar51 = uVar75 * iVar83;
      iVar76 = (int)(iVar51 + uVar90 + -1) / (int)uVar90;
      iVar82 = iVar82 * iVar76;
      iVar76 = iVar76 + iVar82;
      if (iVar51 <= iVar76) {
        iVar76 = iVar51;
      }
      if (iVar76 <= iVar82) {
        return;
      }
      iVar51 = pgVar7->ne[0];
      pvVar64 = params->wdata;
      pvVar79 = pgVar7->data;
      pvVar78 = tensor->data;
      iVar55 = iVar51 + 0x1f;
      if (-1 < iVar51) {
        iVar55 = iVar51;
      }
      lVar98 = (long)(iVar55 >> 5);
      do {
        iVar70 = iVar82 / iVar83;
        uVar100 = (ulong)(uint)((int)((long)iVar82 % (long)iVar83) >> 0x1f) << 0x20 |
                  (long)iVar82 % (long)iVar83 & 0xffffffffU;
        if (0 < (int)uVar53) {
          iVar69 = (int)((long)uVar100 % (long)iVar42);
          iVar68 = (int)((long)uVar100 / (long)iVar42);
          lVar85 = (long)(iVar70 * (int)local_298 + iVar69 * iVar44 + iVar68 * (int)local_2f8);
          uVar67 = (ulong)((long)(int)((uVar43 * iVar70 + iVar68) * uVar53 * iVar51) * 0x18) >> 5;
          uVar100 = 0;
          uVar58 = 0;
          do {
            auVar212 = ZEXT1664(ZEXT816(0) << 0x40);
            fVar102 = 0.0;
            if (0x1f < iVar51) {
              lVar99 = (long)pvVar64 + (uVar100 >> 5) + uVar67 + lVar98 * 8;
              lVar96 = ((long)iVar51 * 0x18 * uVar58 >> 5) + uVar67;
              uVar56 = 0;
              lVar91 = (long)pvVar79 + lVar85 + lVar98 * 8;
              do {
                lVar57 = 0;
                do {
                  auVar192._0_4_ = (float)(*(byte *)(lVar91 + lVar57) & 0xf);
                  auVar216 = in_ZMM9._4_12_;
                  auVar192._4_12_ = auVar216;
                  auVar122 = ZEXT416(*(uint *)((long)pvVar79 + uVar56 * 4 + lVar85));
                  auVar150 = ZEXT416(*(uint *)((long)pvVar79 + uVar56 * 4 + lVar98 * 4 + lVar85));
                  auVar108 = vfmadd213ss_fma(auVar192,auVar150,auVar122);
                  auVar200._0_4_ = (float)(*(byte *)(lVar91 + lVar57) >> 4);
                  auVar200._4_12_ = auVar216;
                  auVar206._0_4_ = (float)(*(byte *)(lVar99 + lVar57) & 0xf);
                  auVar206._4_12_ = auVar216;
                  auVar209._0_4_ = (float)(*(byte *)(lVar99 + lVar57) >> 4);
                  auVar209._4_12_ = auVar216;
                  auVar122 = vfmadd213ss_fma(auVar200,auVar150,auVar122);
                  auVar157 = ZEXT416(*(uint *)((long)pvVar64 + uVar56 * 4 + lVar96));
                  auVar147 = ZEXT416(*(uint *)((long)pvVar64 + uVar56 * 4 + lVar98 * 4 + lVar96));
                  auVar150 = vfmadd213ss_fma(auVar206,auVar147,auVar157);
                  auVar157 = vfmadd213ss_fma(auVar209,auVar147,auVar157);
                  auVar108 = vfmadd231ss_fma(ZEXT416((uint)(auVar157._0_4_ * auVar122._0_4_)),
                                             auVar108,auVar150);
                  fVar102 = auVar212._0_4_ + auVar108._0_4_;
                  auVar212 = ZEXT464((uint)fVar102);
                  lVar57 = lVar57 + 1;
                } while (lVar57 != 0x10);
                uVar56 = uVar56 + 1;
                lVar99 = lVar99 + 0x10;
                lVar91 = lVar91 + 0x10;
              } while (uVar56 != (uint)(iVar55 >> 5));
            }
            *(float *)((long)pvVar78 +
                      uVar58 * (long)iVar72 * 4 +
                      (long)(iVar70 * iVar50 + iVar69 * 4 + iVar68 * iVar94)) = fVar102;
            uVar58 = uVar58 + 1;
            uVar100 = uVar100 + (long)iVar51 * 0x18;
          } while (uVar58 != local_348);
        }
        iVar82 = iVar82 + 1;
      } while (iVar82 != iVar76);
      return;
    }
    if (iVar76 <= iVar44) {
LAB_0012e8c2:
      if ((int)local_2b0 < 1) {
        return;
      }
      pvVar64 = params->wdata;
      local_350 = 0;
      local_358 = 0;
      do {
        if (0 < (int)local_318) {
          uVar100 = 0;
          lVar98 = local_350;
          do {
            lVar85 = lVar98;
            uVar67 = local_348;
            if (0 < (int)local_348) {
              do {
                quantize_row_q4_1((float *)((long)pgVar5->data + lVar85),pvVar64,(int)local_370);
                pvVar64 = (void *)((long)pvVar64 + ((ulong)(local_370 * 0x18) >> 5));
                lVar85 = lVar85 + local_328;
                uVar67 = uVar67 - 1;
              } while (uVar67 != 0);
            }
            uVar100 = uVar100 + 1;
            lVar98 = lVar98 + (int)local_2a8;
          } while (uVar100 != local_318);
        }
        local_358 = local_358 + 1;
        local_350 = local_350 + local_260;
      } while (local_358 != local_2b0);
      return;
    }
    __n = params->wsize;
    pvVar64 = params->wdata;
    goto LAB_0012b121;
  }
LAB_0012f3a3:
  ggml_compute_forward_cold_108();
LAB_0012f3a8:
  ggml_compute_forward_cold_130();
LAB_0012f3ad:
  ggml_compute_forward_cold_127();
LAB_0012f3b2:
  ggml_compute_forward_cold_154();
LAB_0012f3b7:
  ggml_compute_forward_cold_155();
  if (0 < (int)((ggml_tensor *)tensor_00)->type) {
    lVar98 = 0;
    do {
      puVar92 = *(uint **)(((ggml_tensor *)((long)tensor_00 + 0x8020))->ne + lVar98 * 2 + -2);
      if (puVar92 != (uint *)0x0) {
        memset(*(void **)(puVar92 + 0x24),0,
               ((long)(int)puVar92[5] * (long)(int)puVar92[4] *
                (long)(int)puVar92[3] * (long)(int)puVar92[2] * GGML_TYPE_SIZE[*puVar92]) /
               (ulong)(long)GGML_BLCK_SIZE[*puVar92]);
      }
      lVar98 = lVar98 + 1;
    } while (lVar98 < (int)((ggml_tensor *)tensor_00)->type);
  }
  return;
}

Assistant:

static void ggml_compute_forward(struct ggml_compute_params * params, struct ggml_tensor * tensor) {
    GGML_ASSERT(params);

    switch (tensor->op) {
        case GGML_OP_DUP:
            {
                ggml_compute_forward_dup(params, tensor->src0, tensor);
            } break;
        case GGML_OP_ADD:
            {
                ggml_compute_forward_add(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_SUB:
            {
                ggml_compute_forward_sub(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_MUL:
            {
                ggml_compute_forward_mul(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_DIV:
            {
                ggml_compute_forward_div(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_SQR:
            {
                ggml_compute_forward_sqr(params, tensor->src0, tensor);
            } break;
        case GGML_OP_SQRT:
            {
                ggml_compute_forward_sqrt(params, tensor->src0, tensor);
            } break;
        case GGML_OP_SUM:
            {
                ggml_compute_forward_sum(params, tensor->src0, tensor);
            } break;
        case GGML_OP_MEAN:
            {
                ggml_compute_forward_mean(params, tensor->src0, tensor);
            } break;
        case GGML_OP_REPEAT:
            {
                ggml_compute_forward_repeat(params, tensor->src0, tensor);
            } break;
        case GGML_OP_ABS:
            {
                ggml_compute_forward_abs(params, tensor->src0, tensor);
            } break;
        case GGML_OP_SGN:
            {
                ggml_compute_forward_sgn(params, tensor->src0, tensor);
            } break;
        case GGML_OP_NEG:
            {
                ggml_compute_forward_neg(params, tensor->src0, tensor);
            } break;
        case GGML_OP_STEP:
            {
                ggml_compute_forward_step(params, tensor->src0, tensor);
            } break;
        case GGML_OP_RELU:
            {
                ggml_compute_forward_relu(params, tensor->src0, tensor);
            } break;
        case GGML_OP_GELU:
            {
                ggml_compute_forward_gelu(params, tensor->src0, tensor);
            } break;
        case GGML_OP_SILU:
            {
                ggml_compute_forward_silu(params, tensor->src0, tensor);
            } break;
        case GGML_OP_NORM:
            {
                ggml_compute_forward_norm(params, tensor->src0, tensor);
            } break;
        case GGML_OP_RMS_NORM:
            {
                ggml_compute_forward_rms_norm(params, tensor->src0, tensor);
            } break;
        case GGML_OP_MUL_MAT:
            {
                ggml_compute_forward_mul_mat(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_SCALE:
            {
                ggml_compute_forward_scale(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_CPY:
            {
                ggml_compute_forward_cpy(params, tensor->src0, tensor);
            } break;
        case GGML_OP_RESHAPE:
            {
                ggml_compute_forward_reshape(params, tensor->src0, tensor);
            } break;
        case GGML_OP_VIEW:
            {
                ggml_compute_forward_view(params, tensor->src0);
            } break;
        case GGML_OP_PERMUTE:
            {
                ggml_compute_forward_permute(params, tensor->src0);
            } break;
        case GGML_OP_TRANSPOSE:
            {
                ggml_compute_forward_transpose(params, tensor->src0);
            } break;
        case GGML_OP_GET_ROWS:
            {
                ggml_compute_forward_get_rows(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_DIAG_MASK_INF:
            {
                ggml_compute_forward_diag_mask_inf(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_SOFT_MAX:
            {
                ggml_compute_forward_soft_max(params, tensor->src0, tensor);
            } break;
        case GGML_OP_ROPE:
            {
                ggml_compute_forward_rope(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_CONV_1D_1S:
            {
                ggml_compute_forward_conv_1d_1s(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_CONV_1D_2S:
            {
                ggml_compute_forward_conv_1d_2s(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_FLASH_ATTN:
            {
                int32_t t = ggml_get_i32_1d(tensor->opt[1], 0);
                GGML_ASSERT(t == 0 || t == 1);
                bool masked = t != 0;
                ggml_compute_forward_flash_attn(params, tensor->src0, tensor->src1, tensor->opt[0], masked, tensor);
            } break;
        case GGML_OP_FLASH_FF:
            {
                ggml_compute_forward_flash_ff(params, tensor->src0, tensor->src1, tensor->opt[0], tensor->opt[1], tensor->opt[2], tensor);
            } break;
        case GGML_OP_NONE:
            {
                // nop
            } break;
        case GGML_OP_COUNT:
            {
                GGML_ASSERT(false);
            } break;
    }
}